

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx512::CurveNvIntersectorK<8,16>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  int iVar9;
  undefined4 uVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined8 uVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  byte bVar86;
  ulong uVar87;
  ulong uVar88;
  uint uVar89;
  uint uVar90;
  ulong uVar91;
  long lVar92;
  Geometry *pGVar93;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar100;
  undefined1 auVar109 [16];
  undefined8 in_R10;
  ulong uVar94;
  long lVar95;
  long lVar96;
  byte bVar97;
  ulong uVar98;
  float fVar99;
  float fVar152;
  float fVar154;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar106 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar107 [16];
  float fVar153;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar108 [16];
  float fVar158;
  float fVar159;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar160;
  undefined4 uVar161;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar174 [64];
  undefined8 uVar181;
  undefined1 auVar182 [32];
  float fVar183;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar192;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar193;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar204;
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar209 [64];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  RTCFilterFunctionNArguments local_840;
  undefined1 local_810 [16];
  RayHitK<16> *local_7f8;
  undefined1 (*local_7f0) [32];
  long local_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined4 local_760;
  undefined4 uStack_75c;
  undefined4 uStack_758;
  undefined4 uStack_754;
  undefined4 uStack_750;
  undefined4 uStack_74c;
  undefined4 uStack_748;
  undefined4 uStack_744;
  undefined1 local_740 [64];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined4 uStack_6c4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined4 local_580;
  int local_57c;
  undefined1 local_570 [16];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  float local_520 [4];
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  uVar87 = (ulong)(byte)prim[1];
  fVar183 = *(float *)(prim + uVar87 * 0x19 + 0x12);
  auVar101 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar101 = vinsertps_avx(auVar101,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar26 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar184 = vinsertps_avx(auVar26,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar185 = vsubps_avx(auVar101,*(undefined1 (*) [16])(prim + uVar87 * 0x19 + 6));
  fVar192 = fVar183 * auVar185._0_4_;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar87 * 4 + 6);
  auVar118 = vpmovsxbd_avx2(auVar101);
  fVar160 = fVar183 * auVar184._0_4_;
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar87 * 5 + 6);
  auVar116 = vpmovsxbd_avx2(auVar26);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar87 * 6 + 6);
  auVar125 = vpmovsxbd_avx2(auVar6);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + uVar87 * 0xb + 6);
  auVar124 = vpmovsxbd_avx2(auVar109);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar87 * 0xc + 6);
  auVar119 = vpmovsxbd_avx2(auVar104);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + uVar87 * 0xd + 6);
  auVar117 = vpmovsxbd_avx2(auVar105);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar87 * 0x12 + 6);
  auVar123 = vpmovsxbd_avx2(auVar103);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar87 * 0x13 + 6);
  auVar122 = vpmovsxbd_avx2(auVar102);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar87 * 0x14 + 6);
  auVar114 = vpmovsxbd_avx2(auVar7);
  auVar120 = vcvtdq2ps_avx(auVar114);
  auVar110 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar230 = ZEXT3264(auVar110);
  auVar226._4_4_ = fVar160;
  auVar226._0_4_ = fVar160;
  auVar226._8_4_ = fVar160;
  auVar226._12_4_ = fVar160;
  auVar226._16_4_ = fVar160;
  auVar226._20_4_ = fVar160;
  auVar226._24_4_ = fVar160;
  auVar226._28_4_ = fVar160;
  auVar115 = ZEXT1632(CONCAT412(fVar183 * auVar184._12_4_,
                                CONCAT48(fVar183 * auVar184._8_4_,
                                         CONCAT44(fVar183 * auVar184._4_4_,fVar160))));
  auVar111 = vpermps_avx512vl(auVar110,auVar115);
  auVar112 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar231 = ZEXT3264(auVar112);
  auVar113 = vpermps_avx512vl(auVar112,auVar115);
  fVar160 = auVar113._0_4_;
  auVar174._0_4_ = fVar160 * auVar125._0_4_;
  fVar175 = auVar113._4_4_;
  auVar174._4_4_ = fVar175 * auVar125._4_4_;
  fVar176 = auVar113._8_4_;
  auVar174._8_4_ = fVar176 * auVar125._8_4_;
  fVar177 = auVar113._12_4_;
  auVar174._12_4_ = fVar177 * auVar125._12_4_;
  fVar178 = auVar113._16_4_;
  auVar174._16_4_ = fVar178 * auVar125._16_4_;
  fVar179 = auVar113._20_4_;
  auVar174._20_4_ = fVar179 * auVar125._20_4_;
  fVar180 = auVar113._24_4_;
  auVar174._28_36_ = in_ZMM4._28_36_;
  auVar174._24_4_ = fVar180 * auVar125._24_4_;
  auVar115._4_4_ = auVar117._4_4_ * fVar175;
  auVar115._0_4_ = auVar117._0_4_ * fVar160;
  auVar115._8_4_ = auVar117._8_4_ * fVar176;
  auVar115._12_4_ = auVar117._12_4_ * fVar177;
  auVar115._16_4_ = auVar117._16_4_ * fVar178;
  auVar115._20_4_ = auVar117._20_4_ * fVar179;
  auVar115._24_4_ = auVar117._24_4_ * fVar180;
  auVar115._28_4_ = auVar114._28_4_;
  auVar114._4_4_ = fVar175 * auVar120._4_4_;
  auVar114._0_4_ = fVar160 * auVar120._0_4_;
  auVar114._8_4_ = fVar176 * auVar120._8_4_;
  auVar114._12_4_ = fVar177 * auVar120._12_4_;
  auVar114._16_4_ = fVar178 * auVar120._16_4_;
  auVar114._20_4_ = fVar179 * auVar120._20_4_;
  auVar114._24_4_ = fVar180 * auVar120._24_4_;
  auVar114._28_4_ = auVar113._28_4_;
  auVar101 = vfmadd231ps_fma(auVar174._0_32_,auVar111,auVar116);
  auVar26 = vfmadd231ps_fma(auVar115,auVar111,auVar119);
  auVar6 = vfmadd231ps_fma(auVar114,auVar122,auVar111);
  auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar226,auVar118);
  auVar26 = vfmadd231ps_fma(ZEXT1632(auVar26),auVar226,auVar124);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar123,auVar226);
  auVar227._4_4_ = fVar192;
  auVar227._0_4_ = fVar192;
  auVar227._8_4_ = fVar192;
  auVar227._12_4_ = fVar192;
  auVar227._16_4_ = fVar192;
  auVar227._20_4_ = fVar192;
  auVar227._24_4_ = fVar192;
  auVar227._28_4_ = fVar192;
  auVar115 = ZEXT1632(CONCAT412(fVar183 * auVar185._12_4_,
                                CONCAT48(fVar183 * auVar185._8_4_,
                                         CONCAT44(fVar183 * auVar185._4_4_,fVar192))));
  auVar114 = vpermps_avx512vl(auVar110,auVar115);
  auVar115 = vpermps_avx512vl(auVar112,auVar115);
  fVar183 = auVar115._0_4_;
  fVar160 = auVar115._4_4_;
  auVar110._4_4_ = fVar160 * auVar125._4_4_;
  auVar110._0_4_ = fVar183 * auVar125._0_4_;
  fVar175 = auVar115._8_4_;
  auVar110._8_4_ = fVar175 * auVar125._8_4_;
  fVar176 = auVar115._12_4_;
  auVar110._12_4_ = fVar176 * auVar125._12_4_;
  fVar177 = auVar115._16_4_;
  auVar110._16_4_ = fVar177 * auVar125._16_4_;
  fVar178 = auVar115._20_4_;
  auVar110._20_4_ = fVar178 * auVar125._20_4_;
  fVar179 = auVar115._24_4_;
  auVar110._24_4_ = fVar179 * auVar125._24_4_;
  auVar110._28_4_ = auVar125._28_4_;
  auVar200._0_4_ = fVar183 * auVar117._0_4_;
  auVar200._4_4_ = fVar160 * auVar117._4_4_;
  auVar200._8_4_ = fVar175 * auVar117._8_4_;
  auVar200._12_4_ = fVar176 * auVar117._12_4_;
  auVar200._16_4_ = fVar177 * auVar117._16_4_;
  auVar200._20_4_ = fVar178 * auVar117._20_4_;
  auVar200._24_4_ = fVar179 * auVar117._24_4_;
  auVar200._28_4_ = 0;
  auVar117._4_4_ = fVar160 * auVar120._4_4_;
  auVar117._0_4_ = fVar183 * auVar120._0_4_;
  auVar117._8_4_ = fVar175 * auVar120._8_4_;
  auVar117._12_4_ = fVar176 * auVar120._12_4_;
  auVar117._16_4_ = fVar177 * auVar120._16_4_;
  auVar117._20_4_ = fVar178 * auVar120._20_4_;
  auVar117._24_4_ = fVar179 * auVar120._24_4_;
  auVar117._28_4_ = auVar120._28_4_;
  auVar109 = vfmadd231ps_fma(auVar110,auVar114,auVar116);
  auVar104 = vfmadd231ps_fma(auVar200,auVar114,auVar119);
  auVar105 = vfmadd231ps_fma(auVar117,auVar114,auVar122);
  auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar227,auVar118);
  auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar227,auVar124);
  auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar227,auVar123);
  auVar219._8_4_ = 0x7fffffff;
  auVar219._0_8_ = 0x7fffffff7fffffff;
  auVar219._12_4_ = 0x7fffffff;
  auVar219._16_4_ = 0x7fffffff;
  auVar219._20_4_ = 0x7fffffff;
  auVar219._24_4_ = 0x7fffffff;
  auVar219._28_4_ = 0x7fffffff;
  auVar214._8_4_ = 0x219392ef;
  auVar214._0_8_ = 0x219392ef219392ef;
  auVar214._12_4_ = 0x219392ef;
  auVar214._16_4_ = 0x219392ef;
  auVar214._20_4_ = 0x219392ef;
  auVar214._24_4_ = 0x219392ef;
  auVar214._28_4_ = 0x219392ef;
  auVar118 = vandps_avx(auVar219,ZEXT1632(auVar101));
  uVar94 = vcmpps_avx512vl(auVar118,auVar214,1);
  bVar12 = (bool)((byte)uVar94 & 1);
  auVar111._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar101._0_4_;
  bVar12 = (bool)((byte)(uVar94 >> 1) & 1);
  auVar111._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar101._4_4_;
  bVar12 = (bool)((byte)(uVar94 >> 2) & 1);
  auVar111._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar101._8_4_;
  bVar12 = (bool)((byte)(uVar94 >> 3) & 1);
  auVar111._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar101._12_4_;
  auVar111._16_4_ = (uint)((byte)(uVar94 >> 4) & 1) * 0x219392ef;
  auVar111._20_4_ = (uint)((byte)(uVar94 >> 5) & 1) * 0x219392ef;
  auVar111._24_4_ = (uint)((byte)(uVar94 >> 6) & 1) * 0x219392ef;
  auVar111._28_4_ = (uint)(byte)(uVar94 >> 7) * 0x219392ef;
  auVar118 = vandps_avx(auVar219,ZEXT1632(auVar26));
  uVar94 = vcmpps_avx512vl(auVar118,auVar214,1);
  bVar12 = (bool)((byte)uVar94 & 1);
  auVar112._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar26._0_4_;
  bVar12 = (bool)((byte)(uVar94 >> 1) & 1);
  auVar112._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar26._4_4_;
  bVar12 = (bool)((byte)(uVar94 >> 2) & 1);
  auVar112._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar26._8_4_;
  bVar12 = (bool)((byte)(uVar94 >> 3) & 1);
  auVar112._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar26._12_4_;
  auVar112._16_4_ = (uint)((byte)(uVar94 >> 4) & 1) * 0x219392ef;
  auVar112._20_4_ = (uint)((byte)(uVar94 >> 5) & 1) * 0x219392ef;
  auVar112._24_4_ = (uint)((byte)(uVar94 >> 6) & 1) * 0x219392ef;
  auVar112._28_4_ = (uint)(byte)(uVar94 >> 7) * 0x219392ef;
  auVar118 = vandps_avx(auVar219,ZEXT1632(auVar6));
  uVar94 = vcmpps_avx512vl(auVar118,auVar214,1);
  bVar12 = (bool)((byte)uVar94 & 1);
  auVar118._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar6._0_4_;
  bVar12 = (bool)((byte)(uVar94 >> 1) & 1);
  auVar118._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar6._4_4_;
  bVar12 = (bool)((byte)(uVar94 >> 2) & 1);
  auVar118._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar6._8_4_;
  bVar12 = (bool)((byte)(uVar94 >> 3) & 1);
  auVar118._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar6._12_4_;
  auVar118._16_4_ = (uint)((byte)(uVar94 >> 4) & 1) * 0x219392ef;
  auVar118._20_4_ = (uint)((byte)(uVar94 >> 5) & 1) * 0x219392ef;
  auVar118._24_4_ = (uint)((byte)(uVar94 >> 6) & 1) * 0x219392ef;
  auVar118._28_4_ = (uint)(byte)(uVar94 >> 7) * 0x219392ef;
  auVar116 = vrcp14ps_avx512vl(auVar111);
  auVar216._8_4_ = 0x3f800000;
  auVar216._0_8_ = 0x3f8000003f800000;
  auVar216._12_4_ = 0x3f800000;
  auVar216._16_4_ = 0x3f800000;
  auVar216._20_4_ = 0x3f800000;
  auVar216._24_4_ = 0x3f800000;
  auVar216._28_4_ = 0x3f800000;
  auVar101 = vfnmadd213ps_fma(auVar111,auVar116,auVar216);
  auVar101 = vfmadd132ps_fma(ZEXT1632(auVar101),auVar116,auVar116);
  auVar116 = vrcp14ps_avx512vl(auVar112);
  auVar26 = vfnmadd213ps_fma(auVar112,auVar116,auVar216);
  auVar26 = vfmadd132ps_fma(ZEXT1632(auVar26),auVar116,auVar116);
  auVar116 = vrcp14ps_avx512vl(auVar118);
  auVar6 = vfnmadd213ps_fma(auVar118,auVar116,auVar216);
  auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar116,auVar116);
  auVar118 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar87 * 7 + 6));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,ZEXT1632(auVar109));
  auVar123._4_4_ = auVar101._4_4_ * auVar118._4_4_;
  auVar123._0_4_ = auVar101._0_4_ * auVar118._0_4_;
  auVar123._8_4_ = auVar101._8_4_ * auVar118._8_4_;
  auVar123._12_4_ = auVar101._12_4_ * auVar118._12_4_;
  auVar123._16_4_ = auVar118._16_4_ * 0.0;
  auVar123._20_4_ = auVar118._20_4_ * 0.0;
  auVar123._24_4_ = auVar118._24_4_ * 0.0;
  auVar123._28_4_ = auVar118._28_4_;
  auVar118 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar87 * 9 + 6));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,ZEXT1632(auVar109));
  auVar126._0_4_ = auVar101._0_4_ * auVar118._0_4_;
  auVar126._4_4_ = auVar101._4_4_ * auVar118._4_4_;
  auVar126._8_4_ = auVar101._8_4_ * auVar118._8_4_;
  auVar126._12_4_ = auVar101._12_4_ * auVar118._12_4_;
  auVar126._16_4_ = auVar118._16_4_ * 0.0;
  auVar126._20_4_ = auVar118._20_4_ * 0.0;
  auVar126._24_4_ = auVar118._24_4_ * 0.0;
  auVar126._28_4_ = 0;
  auVar118 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar87 * 0xe + 6));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,ZEXT1632(auVar104));
  auVar122._4_4_ = auVar26._4_4_ * auVar118._4_4_;
  auVar122._0_4_ = auVar26._0_4_ * auVar118._0_4_;
  auVar122._8_4_ = auVar26._8_4_ * auVar118._8_4_;
  auVar122._12_4_ = auVar26._12_4_ * auVar118._12_4_;
  auVar122._16_4_ = auVar118._16_4_ * 0.0;
  auVar122._20_4_ = auVar118._20_4_ * 0.0;
  auVar122._24_4_ = auVar118._24_4_ * 0.0;
  auVar122._28_4_ = auVar118._28_4_;
  auVar117 = vpbroadcastd_avx512vl();
  auVar118 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,ZEXT1632(auVar104));
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar87 * 0x15 + 6));
  auVar121._0_4_ = auVar26._0_4_ * auVar118._0_4_;
  auVar121._4_4_ = auVar26._4_4_ * auVar118._4_4_;
  auVar121._8_4_ = auVar26._8_4_ * auVar118._8_4_;
  auVar121._12_4_ = auVar26._12_4_ * auVar118._12_4_;
  auVar121._16_4_ = auVar118._16_4_ * 0.0;
  auVar121._20_4_ = auVar118._20_4_ * 0.0;
  auVar121._24_4_ = auVar118._24_4_ * 0.0;
  auVar121._28_4_ = 0;
  auVar118 = vcvtdq2ps_avx(auVar116);
  auVar118 = vsubps_avx(auVar118,ZEXT1632(auVar105));
  auVar120._4_4_ = auVar118._4_4_ * auVar6._4_4_;
  auVar120._0_4_ = auVar118._0_4_ * auVar6._0_4_;
  auVar120._8_4_ = auVar118._8_4_ * auVar6._8_4_;
  auVar120._12_4_ = auVar118._12_4_ * auVar6._12_4_;
  auVar120._16_4_ = auVar118._16_4_ * 0.0;
  auVar120._20_4_ = auVar118._20_4_ * 0.0;
  auVar120._24_4_ = auVar118._24_4_ * 0.0;
  auVar120._28_4_ = auVar118._28_4_;
  auVar118 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar87 * 0x17 + 6));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,ZEXT1632(auVar105));
  auVar113._0_4_ = auVar6._0_4_ * auVar118._0_4_;
  auVar113._4_4_ = auVar6._4_4_ * auVar118._4_4_;
  auVar113._8_4_ = auVar6._8_4_ * auVar118._8_4_;
  auVar113._12_4_ = auVar6._12_4_ * auVar118._12_4_;
  auVar113._16_4_ = auVar118._16_4_ * 0.0;
  auVar113._20_4_ = auVar118._20_4_ * 0.0;
  auVar113._24_4_ = auVar118._24_4_ * 0.0;
  auVar113._28_4_ = 0;
  auVar118 = vpminsd_avx2(auVar123,auVar126);
  auVar116 = vpminsd_avx2(auVar122,auVar121);
  auVar118 = vmaxps_avx(auVar118,auVar116);
  auVar116 = vpminsd_avx2(auVar120,auVar113);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar125._4_4_ = uVar3;
  auVar125._0_4_ = uVar3;
  auVar125._8_4_ = uVar3;
  auVar125._12_4_ = uVar3;
  auVar125._16_4_ = uVar3;
  auVar125._20_4_ = uVar3;
  auVar125._24_4_ = uVar3;
  auVar125._28_4_ = uVar3;
  auVar116 = vmaxps_avx512vl(auVar116,auVar125);
  auVar118 = vmaxps_avx(auVar118,auVar116);
  auVar116._8_4_ = 0x3f7ffffa;
  auVar116._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar116._12_4_ = 0x3f7ffffa;
  auVar116._16_4_ = 0x3f7ffffa;
  auVar116._20_4_ = 0x3f7ffffa;
  auVar116._24_4_ = 0x3f7ffffa;
  auVar116._28_4_ = 0x3f7ffffa;
  local_3a0 = vmulps_avx512vl(auVar118,auVar116);
  auVar118 = vpmaxsd_avx2(auVar123,auVar126);
  auVar116 = vpmaxsd_avx2(auVar122,auVar121);
  auVar118 = vminps_avx(auVar118,auVar116);
  auVar116 = vpmaxsd_avx2(auVar120,auVar113);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar124._4_4_ = uVar3;
  auVar124._0_4_ = uVar3;
  auVar124._8_4_ = uVar3;
  auVar124._12_4_ = uVar3;
  auVar124._16_4_ = uVar3;
  auVar124._20_4_ = uVar3;
  auVar124._24_4_ = uVar3;
  auVar124._28_4_ = uVar3;
  auVar116 = vminps_avx512vl(auVar116,auVar124);
  auVar118 = vminps_avx(auVar118,auVar116);
  auVar119._8_4_ = 0x3f800003;
  auVar119._0_8_ = 0x3f8000033f800003;
  auVar119._12_4_ = 0x3f800003;
  auVar119._16_4_ = 0x3f800003;
  auVar119._20_4_ = 0x3f800003;
  auVar119._24_4_ = 0x3f800003;
  auVar119._28_4_ = 0x3f800003;
  auVar118 = vmulps_avx512vl(auVar118,auVar119);
  uVar181 = vcmpps_avx512vl(local_3a0,auVar118,2);
  uVar27 = vpcmpgtd_avx512vl(auVar117,_DAT_01fb4ba0);
  uVar94 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar181 & (byte)uVar27));
  local_7f0 = (undefined1 (*) [32])local_100;
  auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar232 = ZEXT1664(auVar101);
  auVar174 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar174);
  local_7f8 = ray;
  do {
    if (uVar94 == 0) {
      return;
    }
    lVar92 = 0;
    for (uVar88 = uVar94; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000) {
      lVar92 = lVar92 + 1;
    }
    uVar94 = uVar94 - 1 & uVar94;
    uVar3 = *(undefined4 *)(prim + lVar92 * 4 + 6);
    uVar88 = (ulong)(uint)((int)lVar92 << 6);
    uVar8 = *(uint *)(prim + 2);
    pGVar93 = (context->scene->geometries).items[uVar8].ptr;
    auVar101 = *(undefined1 (*) [16])(prim + uVar88 + uVar87 * 0x19 + 0x16);
    if (uVar94 != 0) {
      uVar91 = uVar94 - 1 & uVar94;
      for (uVar98 = uVar94; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
      }
      if (uVar91 != 0) {
        for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar26 = *(undefined1 (*) [16])(prim + uVar88 + uVar87 * 0x19 + 0x26);
    auVar6 = *(undefined1 (*) [16])(prim + uVar88 + uVar87 * 0x19 + 0x36);
    auVar109 = *(undefined1 (*) [16])(prim + uVar88 + uVar87 * 0x19 + 0x46);
    iVar9 = (int)pGVar93[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar104 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                             0x1c);
    auVar104 = vinsertps_avx(auVar104,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
    auVar103 = vsubps_avx(auVar101,auVar104);
    uVar161 = auVar103._0_4_;
    auVar184._4_4_ = uVar161;
    auVar184._0_4_ = uVar161;
    auVar184._8_4_ = uVar161;
    auVar184._12_4_ = uVar161;
    auVar105 = vshufps_avx(auVar103,auVar103,0x55);
    aVar4 = pre->ray_space[k].vx.field_0;
    aVar5 = pre->ray_space[k].vy.field_0;
    auVar103 = vshufps_avx(auVar103,auVar103,0xaa);
    fVar183 = pre->ray_space[k].vz.field_0.m128[0];
    fVar160 = pre->ray_space[k].vz.field_0.m128[1];
    fVar175 = pre->ray_space[k].vz.field_0.m128[2];
    fVar176 = pre->ray_space[k].vz.field_0.m128[3];
    auVar106._0_4_ = fVar183 * auVar103._0_4_;
    auVar106._4_4_ = fVar160 * auVar103._4_4_;
    auVar106._8_4_ = fVar175 * auVar103._8_4_;
    auVar106._12_4_ = fVar176 * auVar103._12_4_;
    auVar105 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar5,auVar105);
    auVar7 = vfmadd231ps_fma(auVar105,(undefined1  [16])aVar4,auVar184);
    auVar105 = vshufps_avx(auVar101,auVar101,0xff);
    auVar102 = vsubps_avx(auVar26,auVar104);
    uVar161 = auVar102._0_4_;
    auVar194._4_4_ = uVar161;
    auVar194._0_4_ = uVar161;
    auVar194._8_4_ = uVar161;
    auVar194._12_4_ = uVar161;
    auVar103 = vshufps_avx(auVar102,auVar102,0x55);
    auVar102 = vshufps_avx(auVar102,auVar102,0xaa);
    auVar221._0_4_ = fVar183 * auVar102._0_4_;
    auVar221._4_4_ = fVar160 * auVar102._4_4_;
    auVar221._8_4_ = fVar175 * auVar102._8_4_;
    auVar221._12_4_ = fVar176 * auVar102._12_4_;
    auVar103 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar5,auVar103);
    auVar184 = vfmadd231ps_fma(auVar103,(undefined1  [16])aVar4,auVar194);
    auVar102 = vsubps_avx512vl(auVar6,auVar104);
    uVar161 = auVar102._0_4_;
    auVar195._4_4_ = uVar161;
    auVar195._0_4_ = uVar161;
    auVar195._8_4_ = uVar161;
    auVar195._12_4_ = uVar161;
    auVar103 = vshufps_avx(auVar102,auVar102,0x55);
    auVar102 = vshufps_avx(auVar102,auVar102,0xaa);
    auVar107._0_4_ = fVar183 * auVar102._0_4_;
    auVar107._4_4_ = fVar160 * auVar102._4_4_;
    auVar107._8_4_ = fVar175 * auVar102._8_4_;
    auVar107._12_4_ = fVar176 * auVar102._12_4_;
    auVar103 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar5,auVar103);
    auVar102 = vfmadd231ps_fma(auVar103,(undefined1  [16])aVar4,auVar195);
    auVar103 = vsubps_avx512vl(auVar109,auVar104);
    uVar161 = auVar103._0_4_;
    auVar185._4_4_ = uVar161;
    auVar185._0_4_ = uVar161;
    auVar185._8_4_ = uVar161;
    auVar185._12_4_ = uVar161;
    auVar104 = vshufps_avx(auVar103,auVar103,0x55);
    auVar103 = vshufps_avx(auVar103,auVar103,0xaa);
    auVar108._0_4_ = fVar183 * auVar103._0_4_;
    auVar108._4_4_ = fVar160 * auVar103._4_4_;
    auVar108._8_4_ = fVar175 * auVar103._8_4_;
    auVar108._12_4_ = fVar176 * auVar103._12_4_;
    auVar104 = vfmadd231ps_fma(auVar108,(undefined1  [16])aVar5,auVar104);
    auVar103 = vfmadd231ps_fma(auVar104,(undefined1  [16])aVar4,auVar185);
    lVar92 = (long)iVar9;
    lVar95 = lVar92 * 0x44;
    auVar118 = *(undefined1 (*) [32])(bezier_basis0 + lVar95);
    uVar161 = auVar7._0_4_;
    local_600._4_4_ = uVar161;
    local_600._0_4_ = uVar161;
    local_600._8_4_ = uVar161;
    local_600._12_4_ = uVar161;
    local_600._16_4_ = uVar161;
    local_600._20_4_ = uVar161;
    local_600._24_4_ = uVar161;
    local_600._28_4_ = uVar161;
    auVar200 = auVar230._0_32_;
    local_620 = vpermps_avx512vl(auVar200,ZEXT1632(auVar7));
    auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar95 + 0x484);
    local_640 = vbroadcastss_avx512vl(auVar184);
    local_660 = vpermps_avx512vl(auVar200,ZEXT1632(auVar184));
    auVar125 = *(undefined1 (*) [32])(bezier_basis0 + lVar95 + 0x908);
    local_680 = vbroadcastss_avx512vl(auVar102);
    local_6a0 = vpermps_avx512vl(auVar200,ZEXT1632(auVar102));
    auVar124 = *(undefined1 (*) [32])(bezier_basis0 + lVar95 + 0xd8c);
    fVar178 = auVar103._0_4_;
    local_6c0._4_4_ = fVar178;
    local_6c0._0_4_ = fVar178;
    fStack_6b8 = fVar178;
    fStack_6b4 = fVar178;
    fStack_6b0 = fVar178;
    fStack_6ac = fVar178;
    fStack_6a8 = fVar178;
    register0x0000139c = fVar178;
    _local_6e0 = vpermps_avx512vl(auVar200,ZEXT1632(auVar103));
    auVar119 = vmulps_avx512vl(_local_6c0,auVar124);
    auVar117 = vmulps_avx512vl(_local_6e0,auVar124);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar125,local_680);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar125,local_6a0);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar116,local_640);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar116,local_660);
    auVar120 = vfmadd231ps_avx512vl(auVar119,auVar118,local_600);
    auVar215 = ZEXT3264(auVar120);
    auVar114 = vfmadd231ps_avx512vl(auVar117,auVar118,local_620);
    auVar209 = ZEXT3264(auVar114);
    auVar119 = *(undefined1 (*) [32])(bezier_basis1 + lVar95);
    auVar117 = *(undefined1 (*) [32])(bezier_basis1 + lVar95 + 0x484);
    auVar123 = *(undefined1 (*) [32])(bezier_basis1 + lVar95 + 0x908);
    auVar122 = *(undefined1 (*) [32])(bezier_basis1 + lVar95 + 0xd8c);
    auVar115 = vmulps_avx512vl(_local_6c0,auVar122);
    auVar110 = vmulps_avx512vl(_local_6e0,auVar122);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar123,local_680);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar123,local_6a0);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar117,local_640);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar117,local_660);
    auVar185 = vfmadd231ps_fma(auVar115,auVar119,local_600);
    auVar217 = ZEXT1664(auVar185);
    auVar194 = vfmadd231ps_fma(auVar110,auVar119,local_620);
    auVar115 = vsubps_avx512vl(ZEXT1632(auVar185),auVar120);
    auVar110 = vsubps_avx512vl(ZEXT1632(auVar194),auVar114);
    auVar111 = vmulps_avx512vl(auVar114,auVar115);
    auVar112 = vmulps_avx512vl(auVar120,auVar110);
    auVar111 = vsubps_avx512vl(auVar111,auVar112);
    auVar104 = vshufps_avx(auVar26,auVar26,0xff);
    uVar181 = auVar105._0_8_;
    local_3c0._8_8_ = uVar181;
    local_3c0._0_8_ = uVar181;
    local_3c0._16_8_ = uVar181;
    local_3c0._24_8_ = uVar181;
    local_3e0 = vbroadcastsd_avx512vl(auVar104);
    auVar104 = vshufps_avx512vl(auVar6,auVar6,0xff);
    local_400 = vbroadcastsd_avx512vl(auVar104);
    auVar104 = vshufps_avx512vl(auVar109,auVar109,0xff);
    uVar181 = auVar104._0_8_;
    local_420._8_8_ = uVar181;
    local_420._0_8_ = uVar181;
    local_420._16_8_ = uVar181;
    local_420._24_8_ = uVar181;
    auVar112 = vmulps_avx512vl(local_420,auVar124);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar125,local_400);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar116,local_3e0);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar118,local_3c0);
    auVar113 = vmulps_avx512vl(local_420,auVar122);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar123,local_400);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar117,local_3e0);
    auVar195 = vfmadd231ps_fma(auVar113,auVar119,local_3c0);
    auVar113 = vmulps_avx512vl(auVar110,auVar110);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar115,auVar115);
    auVar121 = vmaxps_avx512vl(auVar112,ZEXT1632(auVar195));
    auVar121 = vmulps_avx512vl(auVar121,auVar121);
    auVar113 = vmulps_avx512vl(auVar121,auVar113);
    auVar111 = vmulps_avx512vl(auVar111,auVar111);
    uVar181 = vcmpps_avx512vl(auVar111,auVar113,2);
    auVar104 = vblendps_avx(auVar7,auVar101,8);
    auVar221 = auVar232._0_16_;
    auVar105 = vandps_avx512vl(auVar104,auVar221);
    auVar104 = vblendps_avx(auVar184,auVar26,8);
    auVar104 = vandps_avx512vl(auVar104,auVar221);
    auVar105 = vmaxps_avx(auVar105,auVar104);
    auVar104 = vblendps_avx(auVar102,auVar6,8);
    auVar106 = vandps_avx512vl(auVar104,auVar221);
    auVar104 = vblendps_avx(auVar103,auVar109,8);
    auVar104 = vandps_avx512vl(auVar104,auVar221);
    auVar104 = vmaxps_avx(auVar106,auVar104);
    auVar104 = vmaxps_avx(auVar105,auVar104);
    auVar105 = vmovshdup_avx(auVar104);
    auVar105 = vmaxss_avx(auVar105,auVar104);
    auVar104 = vshufpd_avx(auVar104,auVar104,1);
    auVar104 = vmaxss_avx(auVar104,auVar105);
    auVar105 = vcvtsi2ss_avx512f(auVar230._0_16_,iVar9);
    local_7a0._0_16_ = auVar105;
    auVar224._0_4_ = auVar105._0_4_;
    auVar224._4_4_ = auVar224._0_4_;
    auVar224._8_4_ = auVar224._0_4_;
    auVar224._12_4_ = auVar224._0_4_;
    auVar224._16_4_ = auVar224._0_4_;
    auVar224._20_4_ = auVar224._0_4_;
    auVar224._24_4_ = auVar224._0_4_;
    auVar224._28_4_ = auVar224._0_4_;
    uVar27 = vcmpps_avx512vl(auVar224,_DAT_01f7b060,0xe);
    bVar97 = (byte)uVar181 & (byte)uVar27;
    fVar183 = auVar104._0_4_ * 4.7683716e-07;
    local_810 = ZEXT416((uint)fVar183);
    auVar113 = auVar231._0_32_;
    auVar111 = vpermps_avx512vl(auVar113,ZEXT1632(auVar7));
    local_480 = vpermps_avx512vl(auVar113,ZEXT1632(auVar184));
    local_4a0 = vpermps_avx512vl(auVar113,ZEXT1632(auVar102));
    local_4c0 = vpermps_avx512vl(auVar113,ZEXT1632(auVar103));
    local_760 = *(undefined4 *)(ray + k * 4 + 0xc0);
    uStack_75c = 0;
    uStack_758 = 0;
    uStack_754 = 0;
    auVar174 = vpbroadcastd_avx512f();
    local_300 = vmovdqa64_avx512f(auVar174);
    auVar174 = vpbroadcastd_avx512f();
    local_340 = vmovdqa64_avx512f(auVar174);
    local_850 = auVar26._0_8_;
    uStack_848 = auVar26._8_8_;
    local_860 = auVar6._0_8_;
    uStack_858 = auVar6._8_8_;
    local_870._0_4_ = auVar109._0_4_;
    fVar160 = (float)local_870;
    local_870._4_4_ = auVar109._4_4_;
    fVar175 = local_870._4_4_;
    uStack_868._0_4_ = auVar109._8_4_;
    fVar176 = (float)uStack_868;
    uStack_868._4_4_ = auVar109._12_4_;
    fVar177 = uStack_868._4_4_;
    local_870 = auVar109._0_8_;
    uStack_868 = auVar109._8_8_;
    if (bVar97 != 0) {
      auVar122 = vmulps_avx512vl(local_4c0,auVar122);
      auVar123 = vfmadd213ps_avx512vl(auVar123,local_4a0,auVar122);
      auVar117 = vfmadd213ps_avx512vl(auVar117,local_480,auVar123);
      auVar117 = vfmadd213ps_avx512vl(auVar119,auVar111,auVar117);
      auVar124 = vmulps_avx512vl(local_4c0,auVar124);
      auVar125 = vfmadd213ps_avx512vl(auVar125,local_4a0,auVar124);
      auVar123 = vfmadd213ps_avx512vl(auVar116,local_480,auVar125);
      auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar95 + 0x1210);
      auVar125 = *(undefined1 (*) [32])(bezier_basis0 + lVar95 + 0x1694);
      auVar124 = *(undefined1 (*) [32])(bezier_basis0 + lVar95 + 0x1b18);
      auVar119 = *(undefined1 (*) [32])(bezier_basis0 + lVar95 + 0x1f9c);
      auVar123 = vfmadd213ps_avx512vl(auVar118,auVar111,auVar123);
      auVar222._0_4_ = fVar178 * auVar119._0_4_;
      auVar222._4_4_ = fVar178 * auVar119._4_4_;
      auVar222._8_4_ = fVar178 * auVar119._8_4_;
      auVar222._12_4_ = fVar178 * auVar119._12_4_;
      auVar222._16_4_ = fVar178 * auVar119._16_4_;
      auVar222._20_4_ = fVar178 * auVar119._20_4_;
      auVar222._24_4_ = fVar178 * auVar119._24_4_;
      auVar222._28_4_ = 0;
      auVar118 = vmulps_avx512vl(_local_6e0,auVar119);
      auVar119 = vmulps_avx512vl(local_4c0,auVar119);
      auVar122 = vfmadd231ps_avx512vl(auVar222,auVar124,local_680);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar124,local_6a0);
      auVar124 = vfmadd231ps_avx512vl(auVar119,local_4a0,auVar124);
      auVar119 = vfmadd231ps_avx512vl(auVar122,auVar125,local_640);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar125,local_660);
      auVar122 = vfmadd231ps_avx512vl(auVar124,local_480,auVar125);
      auVar109 = vfmadd231ps_fma(auVar119,auVar116,local_600);
      auVar119 = vfmadd231ps_avx512vl(auVar118,auVar116,local_620);
      auVar118 = *(undefined1 (*) [32])(bezier_basis1 + lVar95 + 0x1210);
      auVar125 = *(undefined1 (*) [32])(bezier_basis1 + lVar95 + 0x1b18);
      auVar124 = *(undefined1 (*) [32])(bezier_basis1 + lVar95 + 0x1f9c);
      auVar122 = vfmadd231ps_avx512vl(auVar122,auVar111,auVar116);
      auVar37._4_4_ = fVar178 * auVar124._4_4_;
      auVar37._0_4_ = fVar178 * auVar124._0_4_;
      auVar37._8_4_ = fVar178 * auVar124._8_4_;
      auVar37._12_4_ = fVar178 * auVar124._12_4_;
      auVar37._16_4_ = fVar178 * auVar124._16_4_;
      auVar37._20_4_ = fVar178 * auVar124._20_4_;
      auVar37._24_4_ = fVar178 * auVar124._24_4_;
      auVar37._28_4_ = auVar116._28_4_;
      auVar116 = vmulps_avx512vl(_local_6e0,auVar124);
      auVar124 = vmulps_avx512vl(local_4c0,auVar124);
      auVar121 = vfmadd231ps_avx512vl(auVar37,auVar125,local_680);
      auVar126 = vfmadd231ps_avx512vl(auVar116,auVar125,local_6a0);
      auVar174 = ZEXT3264(auVar111);
      auVar125 = vfmadd231ps_avx512vl(auVar124,local_4a0,auVar125);
      auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar95 + 0x1694);
      auVar124 = vfmadd231ps_avx512vl(auVar121,auVar116,local_640);
      auVar121 = vfmadd231ps_avx512vl(auVar126,auVar116,local_660);
      auVar116 = vfmadd231ps_avx512vl(auVar125,local_480,auVar116);
      auVar230 = ZEXT3264(auVar200);
      auVar231 = ZEXT3264(auVar113);
      auVar232 = ZEXT1664(auVar221);
      auVar104 = vfmadd231ps_fma(auVar124,auVar118,local_600);
      auVar125 = vfmadd231ps_avx512vl(auVar121,auVar118,local_620);
      auVar124 = vfmadd231ps_avx512vl(auVar116,auVar111,auVar118);
      auVar228._8_4_ = 0x7fffffff;
      auVar228._0_8_ = 0x7fffffff7fffffff;
      auVar228._12_4_ = 0x7fffffff;
      auVar228._16_4_ = 0x7fffffff;
      auVar228._20_4_ = 0x7fffffff;
      auVar228._24_4_ = 0x7fffffff;
      auVar228._28_4_ = 0x7fffffff;
      auVar118 = vandps_avx(ZEXT1632(auVar109),auVar228);
      auVar116 = vandps_avx(auVar119,auVar228);
      auVar116 = vmaxps_avx(auVar118,auVar116);
      auVar118 = vandps_avx(auVar122,auVar228);
      auVar118 = vmaxps_avx(auVar116,auVar118);
      auVar225._4_4_ = fVar183;
      auVar225._0_4_ = fVar183;
      auVar225._8_4_ = fVar183;
      auVar225._12_4_ = fVar183;
      auVar225._16_4_ = fVar183;
      auVar225._20_4_ = fVar183;
      auVar225._24_4_ = fVar183;
      auVar225._28_4_ = fVar183;
      uVar88 = vcmpps_avx512vl(auVar118,auVar225,1);
      bVar12 = (bool)((byte)uVar88 & 1);
      auVar127._0_4_ = (float)((uint)bVar12 * auVar115._0_4_ | (uint)!bVar12 * auVar109._0_4_);
      bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
      auVar127._4_4_ = (float)((uint)bVar12 * auVar115._4_4_ | (uint)!bVar12 * auVar109._4_4_);
      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
      auVar127._8_4_ = (float)((uint)bVar12 * auVar115._8_4_ | (uint)!bVar12 * auVar109._8_4_);
      bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
      auVar127._12_4_ = (float)((uint)bVar12 * auVar115._12_4_ | (uint)!bVar12 * auVar109._12_4_);
      fVar180 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar115._16_4_);
      auVar127._16_4_ = fVar180;
      fVar179 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar115._20_4_);
      auVar127._20_4_ = fVar179;
      fVar178 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar115._24_4_);
      auVar127._24_4_ = fVar178;
      uVar89 = (uint)(byte)(uVar88 >> 7) * auVar115._28_4_;
      auVar127._28_4_ = uVar89;
      bVar12 = (bool)((byte)uVar88 & 1);
      auVar128._0_4_ = (float)((uint)bVar12 * auVar110._0_4_ | (uint)!bVar12 * auVar119._0_4_);
      bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
      auVar128._4_4_ = (float)((uint)bVar12 * auVar110._4_4_ | (uint)!bVar12 * auVar119._4_4_);
      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
      auVar128._8_4_ = (float)((uint)bVar12 * auVar110._8_4_ | (uint)!bVar12 * auVar119._8_4_);
      bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
      auVar128._12_4_ = (float)((uint)bVar12 * auVar110._12_4_ | (uint)!bVar12 * auVar119._12_4_);
      bVar12 = (bool)((byte)(uVar88 >> 4) & 1);
      auVar128._16_4_ = (float)((uint)bVar12 * auVar110._16_4_ | (uint)!bVar12 * auVar119._16_4_);
      bVar12 = (bool)((byte)(uVar88 >> 5) & 1);
      auVar128._20_4_ = (float)((uint)bVar12 * auVar110._20_4_ | (uint)!bVar12 * auVar119._20_4_);
      bVar12 = (bool)((byte)(uVar88 >> 6) & 1);
      auVar128._24_4_ = (float)((uint)bVar12 * auVar110._24_4_ | (uint)!bVar12 * auVar119._24_4_);
      bVar12 = SUB81(uVar88 >> 7,0);
      auVar128._28_4_ = (uint)bVar12 * auVar110._28_4_ | (uint)!bVar12 * auVar119._28_4_;
      auVar118 = vandps_avx(auVar228,ZEXT1632(auVar104));
      auVar116 = vandps_avx(auVar125,auVar228);
      auVar116 = vmaxps_avx(auVar118,auVar116);
      auVar118 = vandps_avx(auVar124,auVar228);
      auVar118 = vmaxps_avx(auVar116,auVar118);
      uVar88 = vcmpps_avx512vl(auVar118,auVar225,1);
      bVar12 = (bool)((byte)uVar88 & 1);
      auVar129._0_4_ = (float)((uint)bVar12 * auVar115._0_4_ | (uint)!bVar12 * auVar104._0_4_);
      bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
      auVar129._4_4_ = (float)((uint)bVar12 * auVar115._4_4_ | (uint)!bVar12 * auVar104._4_4_);
      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
      auVar129._8_4_ = (float)((uint)bVar12 * auVar115._8_4_ | (uint)!bVar12 * auVar104._8_4_);
      bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
      auVar129._12_4_ = (float)((uint)bVar12 * auVar115._12_4_ | (uint)!bVar12 * auVar104._12_4_);
      fVar204 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar115._16_4_);
      auVar129._16_4_ = fVar204;
      fVar193 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar115._20_4_);
      auVar129._20_4_ = fVar193;
      fVar192 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar115._24_4_);
      auVar129._24_4_ = fVar192;
      auVar129._28_4_ = (uint)(byte)(uVar88 >> 7) * auVar115._28_4_;
      bVar12 = (bool)((byte)uVar88 & 1);
      auVar130._0_4_ = (float)((uint)bVar12 * auVar110._0_4_ | (uint)!bVar12 * auVar125._0_4_);
      bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
      auVar130._4_4_ = (float)((uint)bVar12 * auVar110._4_4_ | (uint)!bVar12 * auVar125._4_4_);
      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
      auVar130._8_4_ = (float)((uint)bVar12 * auVar110._8_4_ | (uint)!bVar12 * auVar125._8_4_);
      bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
      auVar130._12_4_ = (float)((uint)bVar12 * auVar110._12_4_ | (uint)!bVar12 * auVar125._12_4_);
      bVar12 = (bool)((byte)(uVar88 >> 4) & 1);
      auVar130._16_4_ = (float)((uint)bVar12 * auVar110._16_4_ | (uint)!bVar12 * auVar125._16_4_);
      bVar12 = (bool)((byte)(uVar88 >> 5) & 1);
      auVar130._20_4_ = (float)((uint)bVar12 * auVar110._20_4_ | (uint)!bVar12 * auVar125._20_4_);
      bVar12 = (bool)((byte)(uVar88 >> 6) & 1);
      auVar130._24_4_ = (float)((uint)bVar12 * auVar110._24_4_ | (uint)!bVar12 * auVar125._24_4_);
      bVar12 = SUB81(uVar88 >> 7,0);
      auVar130._28_4_ = (uint)bVar12 * auVar110._28_4_ | (uint)!bVar12 * auVar125._28_4_;
      auVar107 = vxorps_avx512vl(local_640._0_16_,local_640._0_16_);
      auVar118 = vfmadd213ps_avx512vl(auVar127,auVar127,ZEXT1632(auVar107));
      auVar109 = vfmadd231ps_fma(auVar118,auVar128,auVar128);
      auVar118 = vrsqrt14ps_avx512vl(ZEXT1632(auVar109));
      fVar99 = auVar118._0_4_;
      fVar100 = auVar118._4_4_;
      fVar152 = auVar118._8_4_;
      fVar153 = auVar118._12_4_;
      fVar154 = auVar118._16_4_;
      fVar155 = auVar118._20_4_;
      fVar156 = auVar118._24_4_;
      auVar38._4_4_ = fVar100 * fVar100 * fVar100 * auVar109._4_4_ * -0.5;
      auVar38._0_4_ = fVar99 * fVar99 * fVar99 * auVar109._0_4_ * -0.5;
      auVar38._8_4_ = fVar152 * fVar152 * fVar152 * auVar109._8_4_ * -0.5;
      auVar38._12_4_ = fVar153 * fVar153 * fVar153 * auVar109._12_4_ * -0.5;
      auVar38._16_4_ = fVar154 * fVar154 * fVar154 * -0.0;
      auVar38._20_4_ = fVar155 * fVar155 * fVar155 * -0.0;
      auVar38._24_4_ = fVar156 * fVar156 * fVar156 * -0.0;
      auVar38._28_4_ = 0;
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar125 = vfmadd231ps_avx512vl(auVar38,auVar116,auVar118);
      auVar39._4_4_ = auVar128._4_4_ * auVar125._4_4_;
      auVar39._0_4_ = auVar128._0_4_ * auVar125._0_4_;
      auVar39._8_4_ = auVar128._8_4_ * auVar125._8_4_;
      auVar39._12_4_ = auVar128._12_4_ * auVar125._12_4_;
      auVar39._16_4_ = auVar128._16_4_ * auVar125._16_4_;
      auVar39._20_4_ = auVar128._20_4_ * auVar125._20_4_;
      auVar39._24_4_ = auVar128._24_4_ * auVar125._24_4_;
      auVar39._28_4_ = auVar118._28_4_;
      auVar40._4_4_ = auVar125._4_4_ * -auVar127._4_4_;
      auVar40._0_4_ = auVar125._0_4_ * -auVar127._0_4_;
      auVar40._8_4_ = auVar125._8_4_ * -auVar127._8_4_;
      auVar40._12_4_ = auVar125._12_4_ * -auVar127._12_4_;
      auVar40._16_4_ = auVar125._16_4_ * -fVar180;
      auVar40._20_4_ = auVar125._20_4_ * -fVar179;
      auVar40._24_4_ = auVar125._24_4_ * -fVar178;
      auVar40._28_4_ = uVar89 ^ 0x80000000;
      auVar118 = vmulps_avx512vl(auVar125,ZEXT1632(auVar107));
      auVar115 = ZEXT1632(auVar107);
      auVar124 = vfmadd213ps_avx512vl(auVar129,auVar129,auVar115);
      auVar109 = vfmadd231ps_fma(auVar124,auVar130,auVar130);
      auVar124 = vrsqrt14ps_avx512vl(ZEXT1632(auVar109));
      fVar178 = auVar124._0_4_;
      fVar179 = auVar124._4_4_;
      fVar180 = auVar124._8_4_;
      fVar99 = auVar124._12_4_;
      fVar100 = auVar124._16_4_;
      fVar152 = auVar124._20_4_;
      fVar153 = auVar124._24_4_;
      auVar41._4_4_ = fVar179 * fVar179 * fVar179 * auVar109._4_4_ * -0.5;
      auVar41._0_4_ = fVar178 * fVar178 * fVar178 * auVar109._0_4_ * -0.5;
      auVar41._8_4_ = fVar180 * fVar180 * fVar180 * auVar109._8_4_ * -0.5;
      auVar41._12_4_ = fVar99 * fVar99 * fVar99 * auVar109._12_4_ * -0.5;
      auVar41._16_4_ = fVar100 * fVar100 * fVar100 * -0.0;
      auVar41._20_4_ = fVar152 * fVar152 * fVar152 * -0.0;
      auVar41._24_4_ = fVar153 * fVar153 * fVar153 * -0.0;
      auVar41._28_4_ = 0;
      auVar116 = vfmadd231ps_avx512vl(auVar41,auVar116,auVar124);
      auVar42._4_4_ = auVar130._4_4_ * auVar116._4_4_;
      auVar42._0_4_ = auVar130._0_4_ * auVar116._0_4_;
      auVar42._8_4_ = auVar130._8_4_ * auVar116._8_4_;
      auVar42._12_4_ = auVar130._12_4_ * auVar116._12_4_;
      auVar42._16_4_ = auVar130._16_4_ * auVar116._16_4_;
      auVar42._20_4_ = auVar130._20_4_ * auVar116._20_4_;
      auVar42._24_4_ = auVar130._24_4_ * auVar116._24_4_;
      auVar42._28_4_ = auVar124._28_4_;
      auVar43._4_4_ = -auVar129._4_4_ * auVar116._4_4_;
      auVar43._0_4_ = -auVar129._0_4_ * auVar116._0_4_;
      auVar43._8_4_ = -auVar129._8_4_ * auVar116._8_4_;
      auVar43._12_4_ = -auVar129._12_4_ * auVar116._12_4_;
      auVar43._16_4_ = -fVar204 * auVar116._16_4_;
      auVar43._20_4_ = -fVar193 * auVar116._20_4_;
      auVar43._24_4_ = -fVar192 * auVar116._24_4_;
      auVar43._28_4_ = auVar125._28_4_;
      auVar116 = vmulps_avx512vl(auVar116,auVar115);
      auVar109 = vfmadd213ps_fma(auVar39,auVar112,auVar120);
      auVar104 = vfmadd213ps_fma(auVar40,auVar112,auVar114);
      auVar125 = vfmadd213ps_avx512vl(auVar118,auVar112,auVar123);
      auVar124 = vfmadd213ps_avx512vl(auVar42,ZEXT1632(auVar195),ZEXT1632(auVar185));
      auVar184 = vfnmadd213ps_fma(auVar39,auVar112,auVar120);
      auVar122 = ZEXT1632(auVar195);
      auVar105 = vfmadd213ps_fma(auVar43,auVar122,ZEXT1632(auVar194));
      auVar106 = vfnmadd213ps_fma(auVar40,auVar112,auVar114);
      auVar103 = vfmadd213ps_fma(auVar116,auVar122,auVar117);
      auVar119 = vfnmadd231ps_avx512vl(auVar123,auVar112,auVar118);
      auVar185 = vfnmadd213ps_fma(auVar42,auVar122,ZEXT1632(auVar185));
      auVar194 = vfnmadd213ps_fma(auVar43,auVar122,ZEXT1632(auVar194));
      auVar221 = vfnmadd231ps_fma(auVar117,ZEXT1632(auVar195),auVar116);
      auVar116 = vsubps_avx512vl(auVar124,ZEXT1632(auVar184));
      auVar118 = vsubps_avx(ZEXT1632(auVar105),ZEXT1632(auVar106));
      auVar117 = vsubps_avx512vl(ZEXT1632(auVar103),auVar119);
      auVar123 = vmulps_avx512vl(auVar118,auVar119);
      auVar102 = vfmsub231ps_fma(auVar123,ZEXT1632(auVar106),auVar117);
      auVar44._4_4_ = auVar184._4_4_ * auVar117._4_4_;
      auVar44._0_4_ = auVar184._0_4_ * auVar117._0_4_;
      auVar44._8_4_ = auVar184._8_4_ * auVar117._8_4_;
      auVar44._12_4_ = auVar184._12_4_ * auVar117._12_4_;
      auVar44._16_4_ = auVar117._16_4_ * 0.0;
      auVar44._20_4_ = auVar117._20_4_ * 0.0;
      auVar44._24_4_ = auVar117._24_4_ * 0.0;
      auVar44._28_4_ = auVar117._28_4_;
      auVar117 = vfmsub231ps_avx512vl(auVar44,auVar119,auVar116);
      auVar45._4_4_ = auVar106._4_4_ * auVar116._4_4_;
      auVar45._0_4_ = auVar106._0_4_ * auVar116._0_4_;
      auVar45._8_4_ = auVar106._8_4_ * auVar116._8_4_;
      auVar45._12_4_ = auVar106._12_4_ * auVar116._12_4_;
      auVar45._16_4_ = auVar116._16_4_ * 0.0;
      auVar45._20_4_ = auVar116._20_4_ * 0.0;
      auVar45._24_4_ = auVar116._24_4_ * 0.0;
      auVar45._28_4_ = auVar116._28_4_;
      auVar7 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar184),auVar118);
      auVar118 = vfmadd231ps_avx512vl(ZEXT1632(auVar7),auVar115,auVar117);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar115,ZEXT1632(auVar102));
      auVar110 = ZEXT1632(auVar107);
      uVar88 = vcmpps_avx512vl(auVar118,auVar110,2);
      bVar86 = (byte)uVar88;
      fVar99 = (float)((uint)(bVar86 & 1) * auVar109._0_4_ |
                      (uint)!(bool)(bVar86 & 1) * auVar185._0_4_);
      bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
      fVar152 = (float)((uint)bVar12 * auVar109._4_4_ | (uint)!bVar12 * auVar185._4_4_);
      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
      fVar154 = (float)((uint)bVar12 * auVar109._8_4_ | (uint)!bVar12 * auVar185._8_4_);
      bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
      fVar156 = (float)((uint)bVar12 * auVar109._12_4_ | (uint)!bVar12 * auVar185._12_4_);
      auVar123 = ZEXT1632(CONCAT412(fVar156,CONCAT48(fVar154,CONCAT44(fVar152,fVar99))));
      fVar100 = (float)((uint)(bVar86 & 1) * auVar104._0_4_ |
                       (uint)!(bool)(bVar86 & 1) * auVar194._0_4_);
      bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
      fVar153 = (float)((uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * auVar194._4_4_);
      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
      fVar155 = (float)((uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * auVar194._8_4_);
      bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
      fVar157 = (float)((uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * auVar194._12_4_);
      auVar122 = ZEXT1632(CONCAT412(fVar157,CONCAT48(fVar155,CONCAT44(fVar153,fVar100))));
      auVar131._0_4_ =
           (float)((uint)(bVar86 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar86 & 1) * auVar221._0_4_)
      ;
      bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
      auVar131._4_4_ = (float)((uint)bVar12 * auVar125._4_4_ | (uint)!bVar12 * auVar221._4_4_);
      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
      auVar131._8_4_ = (float)((uint)bVar12 * auVar125._8_4_ | (uint)!bVar12 * auVar221._8_4_);
      bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
      auVar131._12_4_ = (float)((uint)bVar12 * auVar125._12_4_ | (uint)!bVar12 * auVar221._12_4_);
      fVar180 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar125._16_4_);
      auVar131._16_4_ = fVar180;
      fVar179 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar125._20_4_);
      auVar131._20_4_ = fVar179;
      fVar178 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar125._24_4_);
      auVar131._24_4_ = fVar178;
      iVar1 = (uint)(byte)(uVar88 >> 7) * auVar125._28_4_;
      auVar131._28_4_ = iVar1;
      auVar116 = vblendmps_avx512vl(ZEXT1632(auVar184),auVar124);
      auVar132._0_4_ =
           (uint)(bVar86 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar86 & 1) * auVar104._0_4_;
      bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
      auVar132._4_4_ = (uint)bVar12 * auVar116._4_4_ | (uint)!bVar12 * auVar104._4_4_;
      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
      auVar132._8_4_ = (uint)bVar12 * auVar116._8_4_ | (uint)!bVar12 * auVar104._8_4_;
      bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
      auVar132._12_4_ = (uint)bVar12 * auVar116._12_4_ | (uint)!bVar12 * auVar104._12_4_;
      auVar132._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * auVar116._16_4_;
      auVar132._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * auVar116._20_4_;
      auVar132._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * auVar116._24_4_;
      auVar132._28_4_ = (uint)(byte)(uVar88 >> 7) * auVar116._28_4_;
      auVar116 = vblendmps_avx512vl(ZEXT1632(auVar106),ZEXT1632(auVar105));
      auVar133._0_4_ =
           (float)((uint)(bVar86 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar86 & 1) * auVar102._0_4_)
      ;
      bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
      auVar133._4_4_ = (float)((uint)bVar12 * auVar116._4_4_ | (uint)!bVar12 * auVar102._4_4_);
      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
      auVar133._8_4_ = (float)((uint)bVar12 * auVar116._8_4_ | (uint)!bVar12 * auVar102._8_4_);
      bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
      auVar133._12_4_ = (float)((uint)bVar12 * auVar116._12_4_ | (uint)!bVar12 * auVar102._12_4_);
      fVar192 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar116._16_4_);
      auVar133._16_4_ = fVar192;
      fVar193 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar116._20_4_);
      auVar133._20_4_ = fVar193;
      fVar204 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar116._24_4_);
      auVar133._24_4_ = fVar204;
      auVar133._28_4_ = (uint)(byte)(uVar88 >> 7) * auVar116._28_4_;
      auVar116 = vblendmps_avx512vl(auVar119,ZEXT1632(auVar103));
      auVar134._0_4_ =
           (float)((uint)(bVar86 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar86 & 1) * auVar125._0_4_)
      ;
      bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
      auVar134._4_4_ = (float)((uint)bVar12 * auVar116._4_4_ | (uint)!bVar12 * auVar125._4_4_);
      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
      auVar134._8_4_ = (float)((uint)bVar12 * auVar116._8_4_ | (uint)!bVar12 * auVar125._8_4_);
      bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
      auVar134._12_4_ = (float)((uint)bVar12 * auVar116._12_4_ | (uint)!bVar12 * auVar125._12_4_);
      bVar12 = (bool)((byte)(uVar88 >> 4) & 1);
      auVar134._16_4_ = (float)((uint)bVar12 * auVar116._16_4_ | (uint)!bVar12 * auVar125._16_4_);
      bVar12 = (bool)((byte)(uVar88 >> 5) & 1);
      auVar134._20_4_ = (float)((uint)bVar12 * auVar116._20_4_ | (uint)!bVar12 * auVar125._20_4_);
      bVar12 = (bool)((byte)(uVar88 >> 6) & 1);
      auVar134._24_4_ = (float)((uint)bVar12 * auVar116._24_4_ | (uint)!bVar12 * auVar125._24_4_);
      bVar12 = SUB81(uVar88 >> 7,0);
      auVar134._28_4_ = (uint)bVar12 * auVar116._28_4_ | (uint)!bVar12 * auVar125._28_4_;
      auVar135._0_4_ =
           (uint)(bVar86 & 1) * (int)auVar184._0_4_ | (uint)!(bool)(bVar86 & 1) * auVar124._0_4_;
      bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
      auVar135._4_4_ = (uint)bVar12 * (int)auVar184._4_4_ | (uint)!bVar12 * auVar124._4_4_;
      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
      auVar135._8_4_ = (uint)bVar12 * (int)auVar184._8_4_ | (uint)!bVar12 * auVar124._8_4_;
      bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
      auVar135._12_4_ = (uint)bVar12 * (int)auVar184._12_4_ | (uint)!bVar12 * auVar124._12_4_;
      auVar135._16_4_ = (uint)!(bool)((byte)(uVar88 >> 4) & 1) * auVar124._16_4_;
      auVar135._20_4_ = (uint)!(bool)((byte)(uVar88 >> 5) & 1) * auVar124._20_4_;
      auVar135._24_4_ = (uint)!(bool)((byte)(uVar88 >> 6) & 1) * auVar124._24_4_;
      auVar135._28_4_ = (uint)!SUB81(uVar88 >> 7,0) * auVar124._28_4_;
      bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
      bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
      bVar15 = (bool)((byte)(uVar88 >> 3) & 1);
      auVar136._0_4_ =
           (uint)(bVar86 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar86 & 1) * auVar103._0_4_;
      bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
      auVar136._4_4_ = (uint)bVar13 * auVar119._4_4_ | (uint)!bVar13 * auVar103._4_4_;
      bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
      auVar136._8_4_ = (uint)bVar13 * auVar119._8_4_ | (uint)!bVar13 * auVar103._8_4_;
      bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
      auVar136._12_4_ = (uint)bVar13 * auVar119._12_4_ | (uint)!bVar13 * auVar103._12_4_;
      auVar136._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * auVar119._16_4_;
      auVar136._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * auVar119._20_4_;
      auVar136._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * auVar119._24_4_;
      iVar2 = (uint)(byte)(uVar88 >> 7) * auVar119._28_4_;
      auVar136._28_4_ = iVar2;
      auVar120 = vsubps_avx512vl(auVar135,auVar123);
      auVar116 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar106._12_4_ |
                                               (uint)!bVar15 * auVar105._12_4_,
                                               CONCAT48((uint)bVar14 * (int)auVar106._8_4_ |
                                                        (uint)!bVar14 * auVar105._8_4_,
                                                        CONCAT44((uint)bVar12 * (int)auVar106._4_4_
                                                                 | (uint)!bVar12 * auVar105._4_4_,
                                                                 (uint)(bVar86 & 1) *
                                                                 (int)auVar106._0_4_ |
                                                                 (uint)!(bool)(bVar86 & 1) *
                                                                 auVar105._0_4_)))),auVar122);
      auVar215 = ZEXT3264(auVar116);
      auVar125 = vsubps_avx(auVar136,auVar131);
      auVar124 = vsubps_avx(auVar123,auVar132);
      auVar217 = ZEXT3264(auVar124);
      auVar119 = vsubps_avx(auVar122,auVar133);
      auVar117 = vsubps_avx(auVar131,auVar134);
      auVar46._4_4_ = auVar125._4_4_ * fVar152;
      auVar46._0_4_ = auVar125._0_4_ * fVar99;
      auVar46._8_4_ = auVar125._8_4_ * fVar154;
      auVar46._12_4_ = auVar125._12_4_ * fVar156;
      auVar46._16_4_ = auVar125._16_4_ * 0.0;
      auVar46._20_4_ = auVar125._20_4_ * 0.0;
      auVar46._24_4_ = auVar125._24_4_ * 0.0;
      auVar46._28_4_ = iVar2;
      auVar109 = vfmsub231ps_fma(auVar46,auVar131,auVar120);
      auVar47._4_4_ = fVar153 * auVar120._4_4_;
      auVar47._0_4_ = fVar100 * auVar120._0_4_;
      auVar47._8_4_ = fVar155 * auVar120._8_4_;
      auVar47._12_4_ = fVar157 * auVar120._12_4_;
      auVar47._16_4_ = auVar120._16_4_ * 0.0;
      auVar47._20_4_ = auVar120._20_4_ * 0.0;
      auVar47._24_4_ = auVar120._24_4_ * 0.0;
      auVar47._28_4_ = auVar118._28_4_;
      auVar104 = vfmsub231ps_fma(auVar47,auVar123,auVar116);
      auVar118 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar110,ZEXT1632(auVar109));
      auVar205._0_4_ = auVar116._0_4_ * auVar131._0_4_;
      auVar205._4_4_ = auVar116._4_4_ * auVar131._4_4_;
      auVar205._8_4_ = auVar116._8_4_ * auVar131._8_4_;
      auVar205._12_4_ = auVar116._12_4_ * auVar131._12_4_;
      auVar205._16_4_ = auVar116._16_4_ * fVar180;
      auVar205._20_4_ = auVar116._20_4_ * fVar179;
      auVar205._24_4_ = auVar116._24_4_ * fVar178;
      auVar205._28_4_ = 0;
      auVar109 = vfmsub231ps_fma(auVar205,auVar122,auVar125);
      auVar114 = vfmadd231ps_avx512vl(auVar118,auVar110,ZEXT1632(auVar109));
      auVar118 = vmulps_avx512vl(auVar117,auVar132);
      auVar118 = vfmsub231ps_avx512vl(auVar118,auVar124,auVar134);
      auVar48._4_4_ = auVar119._4_4_ * auVar134._4_4_;
      auVar48._0_4_ = auVar119._0_4_ * auVar134._0_4_;
      auVar48._8_4_ = auVar119._8_4_ * auVar134._8_4_;
      auVar48._12_4_ = auVar119._12_4_ * auVar134._12_4_;
      auVar48._16_4_ = auVar119._16_4_ * auVar134._16_4_;
      auVar48._20_4_ = auVar119._20_4_ * auVar134._20_4_;
      auVar48._24_4_ = auVar119._24_4_ * auVar134._24_4_;
      auVar48._28_4_ = auVar134._28_4_;
      auVar109 = vfmsub231ps_fma(auVar48,auVar133,auVar117);
      auVar206._0_4_ = auVar133._0_4_ * auVar124._0_4_;
      auVar206._4_4_ = auVar133._4_4_ * auVar124._4_4_;
      auVar206._8_4_ = auVar133._8_4_ * auVar124._8_4_;
      auVar206._12_4_ = auVar133._12_4_ * auVar124._12_4_;
      auVar206._16_4_ = fVar192 * auVar124._16_4_;
      auVar206._20_4_ = fVar193 * auVar124._20_4_;
      auVar206._24_4_ = fVar204 * auVar124._24_4_;
      auVar206._28_4_ = 0;
      auVar104 = vfmsub231ps_fma(auVar206,auVar119,auVar132);
      auVar118 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar110,auVar118);
      auVar115 = vfmadd231ps_avx512vl(auVar118,auVar110,ZEXT1632(auVar109));
      auVar209 = ZEXT3264(auVar115);
      auVar118 = vmaxps_avx(auVar114,auVar115);
      uVar181 = vcmpps_avx512vl(auVar118,auVar110,2);
      bVar97 = bVar97 & (byte)uVar181;
      if (bVar97 != 0) {
        auVar49._4_4_ = auVar117._4_4_ * auVar116._4_4_;
        auVar49._0_4_ = auVar117._0_4_ * auVar116._0_4_;
        auVar49._8_4_ = auVar117._8_4_ * auVar116._8_4_;
        auVar49._12_4_ = auVar117._12_4_ * auVar116._12_4_;
        auVar49._16_4_ = auVar117._16_4_ * auVar116._16_4_;
        auVar49._20_4_ = auVar117._20_4_ * auVar116._20_4_;
        auVar49._24_4_ = auVar117._24_4_ * auVar116._24_4_;
        auVar49._28_4_ = auVar118._28_4_;
        auVar103 = vfmsub231ps_fma(auVar49,auVar119,auVar125);
        auVar50._4_4_ = auVar125._4_4_ * auVar124._4_4_;
        auVar50._0_4_ = auVar125._0_4_ * auVar124._0_4_;
        auVar50._8_4_ = auVar125._8_4_ * auVar124._8_4_;
        auVar50._12_4_ = auVar125._12_4_ * auVar124._12_4_;
        auVar50._16_4_ = auVar125._16_4_ * auVar124._16_4_;
        auVar50._20_4_ = auVar125._20_4_ * auVar124._20_4_;
        auVar50._24_4_ = auVar125._24_4_ * auVar124._24_4_;
        auVar50._28_4_ = auVar125._28_4_;
        auVar105 = vfmsub231ps_fma(auVar50,auVar120,auVar117);
        auVar51._4_4_ = auVar119._4_4_ * auVar120._4_4_;
        auVar51._0_4_ = auVar119._0_4_ * auVar120._0_4_;
        auVar51._8_4_ = auVar119._8_4_ * auVar120._8_4_;
        auVar51._12_4_ = auVar119._12_4_ * auVar120._12_4_;
        auVar51._16_4_ = auVar119._16_4_ * auVar120._16_4_;
        auVar51._20_4_ = auVar119._20_4_ * auVar120._20_4_;
        auVar51._24_4_ = auVar119._24_4_ * auVar120._24_4_;
        auVar51._28_4_ = auVar119._28_4_;
        auVar102 = vfmsub231ps_fma(auVar51,auVar124,auVar116);
        auVar109 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar105),ZEXT1632(auVar102));
        auVar104 = vfmadd231ps_fma(ZEXT1632(auVar109),ZEXT1632(auVar103),
                                   ZEXT1232(ZEXT412(0)) << 0x20);
        auVar118 = vrcp14ps_avx512vl(ZEXT1632(auVar104));
        auVar217 = ZEXT3264(auVar118);
        auVar28._8_4_ = 0x3f800000;
        auVar28._0_8_ = 0x3f8000003f800000;
        auVar28._12_4_ = 0x3f800000;
        auVar28._16_4_ = 0x3f800000;
        auVar28._20_4_ = 0x3f800000;
        auVar28._24_4_ = 0x3f800000;
        auVar28._28_4_ = 0x3f800000;
        auVar116 = vfnmadd213ps_avx512vl(auVar118,ZEXT1632(auVar104),auVar28);
        auVar109 = vfmadd132ps_fma(auVar116,auVar118,auVar118);
        auVar215 = ZEXT1664(auVar109);
        auVar52._4_4_ = auVar102._4_4_ * auVar131._4_4_;
        auVar52._0_4_ = auVar102._0_4_ * auVar131._0_4_;
        auVar52._8_4_ = auVar102._8_4_ * auVar131._8_4_;
        auVar52._12_4_ = auVar102._12_4_ * auVar131._12_4_;
        auVar52._16_4_ = fVar180 * 0.0;
        auVar52._20_4_ = fVar179 * 0.0;
        auVar52._24_4_ = fVar178 * 0.0;
        auVar52._28_4_ = iVar1;
        auVar105 = vfmadd231ps_fma(auVar52,auVar122,ZEXT1632(auVar105));
        auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar123,ZEXT1632(auVar103));
        fVar178 = auVar109._0_4_;
        fVar179 = auVar109._4_4_;
        fVar180 = auVar109._8_4_;
        fVar192 = auVar109._12_4_;
        local_5a0 = ZEXT1632(CONCAT412(auVar105._12_4_ * fVar192,
                                       CONCAT48(auVar105._8_4_ * fVar180,
                                                CONCAT44(auVar105._4_4_ * fVar179,
                                                         auVar105._0_4_ * fVar178))));
        auVar220 = ZEXT3264(local_5a0);
        auVar166._4_4_ = local_760;
        auVar166._0_4_ = local_760;
        auVar166._8_4_ = local_760;
        auVar166._12_4_ = local_760;
        auVar166._16_4_ = local_760;
        auVar166._20_4_ = local_760;
        auVar166._24_4_ = local_760;
        auVar166._28_4_ = local_760;
        uVar181 = vcmpps_avx512vl(auVar166,local_5a0,2);
        uVar161 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar29._4_4_ = uVar161;
        auVar29._0_4_ = uVar161;
        auVar29._8_4_ = uVar161;
        auVar29._12_4_ = uVar161;
        auVar29._16_4_ = uVar161;
        auVar29._20_4_ = uVar161;
        auVar29._24_4_ = uVar161;
        auVar29._28_4_ = uVar161;
        uVar27 = vcmpps_avx512vl(local_5a0,auVar29,2);
        bVar97 = (byte)uVar181 & (byte)uVar27 & bVar97;
        if (bVar97 != 0) {
          uVar98 = vcmpps_avx512vl(ZEXT1632(auVar104),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar98 = bVar97 & uVar98;
          if ((char)uVar98 != '\0') {
            fVar193 = auVar114._0_4_ * fVar178;
            fVar204 = auVar114._4_4_ * fVar179;
            auVar53._4_4_ = fVar204;
            auVar53._0_4_ = fVar193;
            fVar99 = auVar114._8_4_ * fVar180;
            auVar53._8_4_ = fVar99;
            fVar100 = auVar114._12_4_ * fVar192;
            auVar53._12_4_ = fVar100;
            fVar152 = auVar114._16_4_ * 0.0;
            auVar53._16_4_ = fVar152;
            fVar153 = auVar114._20_4_ * 0.0;
            auVar53._20_4_ = fVar153;
            fVar154 = auVar114._24_4_ * 0.0;
            auVar53._24_4_ = fVar154;
            auVar53._28_4_ = auVar114._28_4_;
            auVar167._8_4_ = 0x3f800000;
            auVar167._0_8_ = 0x3f8000003f800000;
            auVar167._12_4_ = 0x3f800000;
            auVar167._16_4_ = 0x3f800000;
            auVar167._20_4_ = 0x3f800000;
            auVar167._24_4_ = 0x3f800000;
            auVar167._28_4_ = 0x3f800000;
            auVar118 = vsubps_avx(auVar167,auVar53);
            local_5e0._0_4_ =
                 (float)((uint)(bVar86 & 1) * (int)fVar193 |
                        (uint)!(bool)(bVar86 & 1) * auVar118._0_4_);
            bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
            local_5e0._4_4_ = (float)((uint)bVar12 * (int)fVar204 | (uint)!bVar12 * auVar118._4_4_);
            bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
            local_5e0._8_4_ = (float)((uint)bVar12 * (int)fVar99 | (uint)!bVar12 * auVar118._8_4_);
            bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
            local_5e0._12_4_ =
                 (float)((uint)bVar12 * (int)fVar100 | (uint)!bVar12 * auVar118._12_4_);
            bVar12 = (bool)((byte)(uVar88 >> 4) & 1);
            local_5e0._16_4_ =
                 (float)((uint)bVar12 * (int)fVar152 | (uint)!bVar12 * auVar118._16_4_);
            bVar12 = (bool)((byte)(uVar88 >> 5) & 1);
            local_5e0._20_4_ =
                 (float)((uint)bVar12 * (int)fVar153 | (uint)!bVar12 * auVar118._20_4_);
            bVar12 = (bool)((byte)(uVar88 >> 6) & 1);
            local_5e0._24_4_ =
                 (float)((uint)bVar12 * (int)fVar154 | (uint)!bVar12 * auVar118._24_4_);
            bVar12 = SUB81(uVar88 >> 7,0);
            local_5e0._28_4_ =
                 (float)((uint)bVar12 * auVar114._28_4_ | (uint)!bVar12 * auVar118._28_4_);
            auVar118 = vsubps_avx(ZEXT1632(auVar195),auVar112);
            auVar109 = vfmadd213ps_fma(auVar118,local_5e0,auVar112);
            uVar161 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
            auVar30._4_4_ = uVar161;
            auVar30._0_4_ = uVar161;
            auVar30._8_4_ = uVar161;
            auVar30._12_4_ = uVar161;
            auVar30._16_4_ = uVar161;
            auVar30._20_4_ = uVar161;
            auVar30._24_4_ = uVar161;
            auVar30._28_4_ = uVar161;
            auVar118 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar109._12_4_ + auVar109._12_4_,
                                                          CONCAT48(auVar109._8_4_ + auVar109._8_4_,
                                                                   CONCAT44(auVar109._4_4_ +
                                                                            auVar109._4_4_,
                                                                            auVar109._0_4_ +
                                                                            auVar109._0_4_)))),
                                       auVar30);
            uVar91 = vcmpps_avx512vl(local_5a0,auVar118,6);
            uVar98 = uVar98 & uVar91;
            bVar97 = (byte)uVar98;
            if (bVar97 != 0) {
              auVar190._0_4_ = auVar115._0_4_ * fVar178;
              auVar190._4_4_ = auVar115._4_4_ * fVar179;
              auVar190._8_4_ = auVar115._8_4_ * fVar180;
              auVar190._12_4_ = auVar115._12_4_ * fVar192;
              auVar190._16_4_ = auVar115._16_4_ * 0.0;
              auVar190._20_4_ = auVar115._20_4_ * 0.0;
              auVar190._24_4_ = auVar115._24_4_ * 0.0;
              auVar190._28_4_ = 0;
              auVar201._8_4_ = 0x3f800000;
              auVar201._0_8_ = 0x3f8000003f800000;
              auVar201._12_4_ = 0x3f800000;
              auVar201._16_4_ = 0x3f800000;
              auVar201._20_4_ = 0x3f800000;
              auVar201._24_4_ = 0x3f800000;
              auVar201._28_4_ = 0x3f800000;
              auVar118 = vsubps_avx(auVar201,auVar190);
              auVar137._0_4_ =
                   (uint)(bVar86 & 1) * (int)auVar190._0_4_ |
                   (uint)!(bool)(bVar86 & 1) * auVar118._0_4_;
              bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
              auVar137._4_4_ = (uint)bVar12 * (int)auVar190._4_4_ | (uint)!bVar12 * auVar118._4_4_;
              bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
              auVar137._8_4_ = (uint)bVar12 * (int)auVar190._8_4_ | (uint)!bVar12 * auVar118._8_4_;
              bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
              auVar137._12_4_ =
                   (uint)bVar12 * (int)auVar190._12_4_ | (uint)!bVar12 * auVar118._12_4_;
              bVar12 = (bool)((byte)(uVar88 >> 4) & 1);
              auVar137._16_4_ =
                   (uint)bVar12 * (int)auVar190._16_4_ | (uint)!bVar12 * auVar118._16_4_;
              bVar12 = (bool)((byte)(uVar88 >> 5) & 1);
              auVar137._20_4_ =
                   (uint)bVar12 * (int)auVar190._20_4_ | (uint)!bVar12 * auVar118._20_4_;
              bVar12 = (bool)((byte)(uVar88 >> 6) & 1);
              auVar137._24_4_ =
                   (uint)bVar12 * (int)auVar190._24_4_ | (uint)!bVar12 * auVar118._24_4_;
              auVar137._28_4_ = (uint)!SUB81(uVar88 >> 7,0) * auVar118._28_4_;
              auVar31._8_4_ = 0x40000000;
              auVar31._0_8_ = 0x4000000040000000;
              auVar31._12_4_ = 0x40000000;
              auVar31._16_4_ = 0x40000000;
              auVar31._20_4_ = 0x40000000;
              auVar31._24_4_ = 0x40000000;
              auVar31._28_4_ = 0x40000000;
              local_5c0 = vfmsub132ps_avx512vl(auVar137,auVar201,auVar31);
              local_580 = 0;
              auVar217 = ZEXT1664(auVar101);
              local_560 = local_850;
              uStack_558 = uStack_848;
              local_550 = local_860;
              uStack_548 = uStack_858;
              local_540 = local_870;
              uStack_538 = uStack_868;
              if ((pGVar93->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                fVar183 = 1.0 / auVar224._0_4_;
                local_520[0] = fVar183 * (local_5e0._0_4_ + 0.0);
                local_520[1] = fVar183 * (local_5e0._4_4_ + 1.0);
                local_520[2] = fVar183 * (local_5e0._8_4_ + 2.0);
                local_520[3] = fVar183 * (local_5e0._12_4_ + 3.0);
                fStack_510 = fVar183 * (local_5e0._16_4_ + 4.0);
                fStack_50c = fVar183 * (local_5e0._20_4_ + 5.0);
                fStack_508 = fVar183 * (local_5e0._24_4_ + 6.0);
                fStack_504 = local_5e0._28_4_ + 7.0;
                local_500 = local_5c0;
                local_4e0 = local_5a0;
                auVar168._8_4_ = 0x7f800000;
                auVar168._0_8_ = 0x7f8000007f800000;
                auVar168._12_4_ = 0x7f800000;
                auVar168._16_4_ = 0x7f800000;
                auVar168._20_4_ = 0x7f800000;
                auVar168._24_4_ = 0x7f800000;
                auVar168._28_4_ = 0x7f800000;
                auVar118 = vblendmps_avx512vl(auVar168,local_5a0);
                auVar138._0_4_ =
                     (uint)(bVar97 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar97 & 1) * 0x7f800000;
                bVar12 = (bool)((byte)(uVar98 >> 1) & 1);
                auVar138._4_4_ = (uint)bVar12 * auVar118._4_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar98 >> 2) & 1);
                auVar138._8_4_ = (uint)bVar12 * auVar118._8_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar98 >> 3) & 1);
                auVar138._12_4_ = (uint)bVar12 * auVar118._12_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar98 >> 4) & 1);
                auVar138._16_4_ = (uint)bVar12 * auVar118._16_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar98 >> 5) & 1);
                auVar138._20_4_ = (uint)bVar12 * auVar118._20_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar98 >> 6) & 1);
                auVar138._24_4_ = (uint)bVar12 * auVar118._24_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = SUB81(uVar98 >> 7,0);
                auVar138._28_4_ = (uint)bVar12 * auVar118._28_4_ | (uint)!bVar12 * 0x7f800000;
                auVar118 = vshufps_avx(auVar138,auVar138,0xb1);
                auVar118 = vminps_avx(auVar138,auVar118);
                auVar116 = vshufpd_avx(auVar118,auVar118,5);
                auVar118 = vminps_avx(auVar118,auVar116);
                auVar116 = vpermpd_avx2(auVar118,0x4e);
                auVar118 = vminps_avx(auVar118,auVar116);
                uVar181 = vcmpps_avx512vl(auVar138,auVar118,0);
                uVar89 = (uint)uVar98;
                if ((bVar97 & (byte)uVar181) != 0) {
                  uVar89 = (uint)(bVar97 & (byte)uVar181);
                }
                uVar90 = 0;
                for (; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x80000000) {
                  uVar90 = uVar90 + 1;
                }
                uVar88 = (ulong)uVar90;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar93->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_780 = *(float *)(ray + k * 4 + 0x200);
                  fStack_77c = 0.0;
                  fStack_778 = 0.0;
                  fStack_774 = 0.0;
                  local_7e0 = auVar111;
                  local_7c0 = local_5a0;
                  local_57c = iVar9;
                  local_570 = auVar101;
                  do {
                    local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_520[uVar88]));
                    local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_500 + uVar88 * 4)));
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar88 * 4);
                    local_840.context = context->user;
                    fVar180 = local_200._0_4_;
                    fVar178 = 1.0 - fVar180;
                    fVar183 = fVar178 * fVar178 * -3.0;
                    auVar109 = vfmadd231ss_fma(ZEXT416((uint)(fVar178 * fVar178)),
                                               ZEXT416((uint)(fVar180 * fVar178)),
                                               ZEXT416(0xc0000000));
                    auVar104 = vfmsub132ss_fma(ZEXT416((uint)(fVar180 * fVar178)),
                                               ZEXT416((uint)(fVar180 * fVar180)),
                                               ZEXT416(0x40000000));
                    fVar178 = auVar109._0_4_ * 3.0;
                    fVar179 = auVar104._0_4_ * 3.0;
                    fVar180 = fVar180 * fVar180 * 3.0;
                    auVar213._0_4_ = fVar180 * fVar160;
                    auVar213._4_4_ = fVar180 * fVar175;
                    auVar213._8_4_ = fVar180 * fVar176;
                    auVar213._12_4_ = fVar180 * fVar177;
                    auVar164._4_4_ = fVar179;
                    auVar164._0_4_ = fVar179;
                    auVar164._8_4_ = fVar179;
                    auVar164._12_4_ = fVar179;
                    auVar109 = vfmadd132ps_fma(auVar164,auVar213,auVar6);
                    auVar199._4_4_ = fVar178;
                    auVar199._0_4_ = fVar178;
                    auVar199._8_4_ = fVar178;
                    auVar199._12_4_ = fVar178;
                    auVar109 = vfmadd132ps_fma(auVar199,auVar109,auVar26);
                    auVar165._4_4_ = fVar183;
                    auVar165._0_4_ = fVar183;
                    auVar165._8_4_ = fVar183;
                    auVar165._12_4_ = fVar183;
                    auVar109 = vfmadd213ps_fma(auVar165,auVar101,auVar109);
                    auVar217 = vbroadcastss_avx512f(auVar109);
                    auVar209 = vbroadcastss_avx512f(ZEXT416(1));
                    auVar209 = vpermps_avx512f(auVar209,ZEXT1664(auVar109));
                    auVar215 = vbroadcastss_avx512f(ZEXT416(2));
                    local_240 = vpermps_avx512f(auVar215,ZEXT1664(auVar109));
                    local_2c0[0] = (RTCHitN)auVar217[0];
                    local_2c0[1] = (RTCHitN)auVar217[1];
                    local_2c0[2] = (RTCHitN)auVar217[2];
                    local_2c0[3] = (RTCHitN)auVar217[3];
                    local_2c0[4] = (RTCHitN)auVar217[4];
                    local_2c0[5] = (RTCHitN)auVar217[5];
                    local_2c0[6] = (RTCHitN)auVar217[6];
                    local_2c0[7] = (RTCHitN)auVar217[7];
                    local_2c0[8] = (RTCHitN)auVar217[8];
                    local_2c0[9] = (RTCHitN)auVar217[9];
                    local_2c0[10] = (RTCHitN)auVar217[10];
                    local_2c0[0xb] = (RTCHitN)auVar217[0xb];
                    local_2c0[0xc] = (RTCHitN)auVar217[0xc];
                    local_2c0[0xd] = (RTCHitN)auVar217[0xd];
                    local_2c0[0xe] = (RTCHitN)auVar217[0xe];
                    local_2c0[0xf] = (RTCHitN)auVar217[0xf];
                    local_2c0[0x10] = (RTCHitN)auVar217[0x10];
                    local_2c0[0x11] = (RTCHitN)auVar217[0x11];
                    local_2c0[0x12] = (RTCHitN)auVar217[0x12];
                    local_2c0[0x13] = (RTCHitN)auVar217[0x13];
                    local_2c0[0x14] = (RTCHitN)auVar217[0x14];
                    local_2c0[0x15] = (RTCHitN)auVar217[0x15];
                    local_2c0[0x16] = (RTCHitN)auVar217[0x16];
                    local_2c0[0x17] = (RTCHitN)auVar217[0x17];
                    local_2c0[0x18] = (RTCHitN)auVar217[0x18];
                    local_2c0[0x19] = (RTCHitN)auVar217[0x19];
                    local_2c0[0x1a] = (RTCHitN)auVar217[0x1a];
                    local_2c0[0x1b] = (RTCHitN)auVar217[0x1b];
                    local_2c0[0x1c] = (RTCHitN)auVar217[0x1c];
                    local_2c0[0x1d] = (RTCHitN)auVar217[0x1d];
                    local_2c0[0x1e] = (RTCHitN)auVar217[0x1e];
                    local_2c0[0x1f] = (RTCHitN)auVar217[0x1f];
                    local_2c0[0x20] = (RTCHitN)auVar217[0x20];
                    local_2c0[0x21] = (RTCHitN)auVar217[0x21];
                    local_2c0[0x22] = (RTCHitN)auVar217[0x22];
                    local_2c0[0x23] = (RTCHitN)auVar217[0x23];
                    local_2c0[0x24] = (RTCHitN)auVar217[0x24];
                    local_2c0[0x25] = (RTCHitN)auVar217[0x25];
                    local_2c0[0x26] = (RTCHitN)auVar217[0x26];
                    local_2c0[0x27] = (RTCHitN)auVar217[0x27];
                    local_2c0[0x28] = (RTCHitN)auVar217[0x28];
                    local_2c0[0x29] = (RTCHitN)auVar217[0x29];
                    local_2c0[0x2a] = (RTCHitN)auVar217[0x2a];
                    local_2c0[0x2b] = (RTCHitN)auVar217[0x2b];
                    local_2c0[0x2c] = (RTCHitN)auVar217[0x2c];
                    local_2c0[0x2d] = (RTCHitN)auVar217[0x2d];
                    local_2c0[0x2e] = (RTCHitN)auVar217[0x2e];
                    local_2c0[0x2f] = (RTCHitN)auVar217[0x2f];
                    local_2c0[0x30] = (RTCHitN)auVar217[0x30];
                    local_2c0[0x31] = (RTCHitN)auVar217[0x31];
                    local_2c0[0x32] = (RTCHitN)auVar217[0x32];
                    local_2c0[0x33] = (RTCHitN)auVar217[0x33];
                    local_2c0[0x34] = (RTCHitN)auVar217[0x34];
                    local_2c0[0x35] = (RTCHitN)auVar217[0x35];
                    local_2c0[0x36] = (RTCHitN)auVar217[0x36];
                    local_2c0[0x37] = (RTCHitN)auVar217[0x37];
                    local_2c0[0x38] = (RTCHitN)auVar217[0x38];
                    local_2c0[0x39] = (RTCHitN)auVar217[0x39];
                    local_2c0[0x3a] = (RTCHitN)auVar217[0x3a];
                    local_2c0[0x3b] = (RTCHitN)auVar217[0x3b];
                    local_2c0[0x3c] = (RTCHitN)auVar217[0x3c];
                    local_2c0[0x3d] = (RTCHitN)auVar217[0x3d];
                    local_2c0[0x3e] = (RTCHitN)auVar217[0x3e];
                    local_2c0[0x3f] = (RTCHitN)auVar217[0x3f];
                    local_280 = auVar209;
                    local_180 = local_340._0_8_;
                    uStack_178 = local_340._8_8_;
                    uStack_170 = local_340._16_8_;
                    uStack_168 = local_340._24_8_;
                    uStack_160 = local_340._32_8_;
                    uStack_158 = local_340._40_8_;
                    uStack_150 = local_340._48_8_;
                    uStack_148 = local_340._56_8_;
                    auVar217 = vmovdqa64_avx512f(local_300);
                    local_140 = vmovdqa64_avx512f(auVar217);
                    auVar118 = vpcmpeqd_avx2(auVar217._0_32_,auVar217._0_32_);
                    local_7f0[3] = auVar118;
                    local_7f0[2] = auVar118;
                    local_7f0[1] = auVar118;
                    *local_7f0 = auVar118;
                    local_100 = vbroadcastss_avx512f(ZEXT416((local_840.context)->instID[0]));
                    local_c0 = vbroadcastss_avx512f(ZEXT416((local_840.context)->instPrimID[0]));
                    auVar217 = vmovdqa64_avx512f(local_380);
                    local_740 = vmovdqa64_avx512f(auVar217);
                    local_840.valid = (int *)local_740;
                    local_840.geometryUserPtr = pGVar93->userPtr;
                    local_840.hit = local_2c0;
                    local_840.N = 0x10;
                    local_840.ray = (RTCRayN *)ray;
                    if (pGVar93->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar209 = ZEXT1664(auVar209._0_16_);
                      auVar215 = ZEXT1664(auVar215._0_16_);
                      (*pGVar93->intersectionFilterN)(&local_840);
                      auVar220 = ZEXT3264(local_7c0);
                      auVar174 = ZEXT3264(local_7e0);
                      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar232 = ZEXT1664(auVar109);
                      auVar118 = vbroadcastss_avx512vl(ZEXT416(2));
                      auVar231 = ZEXT3264(auVar118);
                      auVar118 = vbroadcastss_avx512vl(ZEXT416(1));
                      auVar230 = ZEXT3264(auVar118);
                      auVar217 = vmovdqa64_avx512f(local_740);
                      ray = local_7f8;
                    }
                    uVar181 = vptestmd_avx512f(auVar217,auVar217);
                    if ((short)uVar181 == 0) {
LAB_019bc3ba:
                      *(float *)(ray + k * 4 + 0x200) = local_780;
                    }
                    else {
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar93->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar209 = ZEXT1664(auVar209._0_16_);
                        auVar215 = ZEXT1664(auVar215._0_16_);
                        (*p_Var11)(&local_840);
                        auVar220 = ZEXT3264(local_7c0);
                        auVar174 = ZEXT3264(local_7e0);
                        auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar232 = ZEXT1664(auVar109);
                        auVar118 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar231 = ZEXT3264(auVar118);
                        auVar118 = vbroadcastss_avx512vl(ZEXT416(1));
                        auVar230 = ZEXT3264(auVar118);
                        auVar217 = vmovdqa64_avx512f(local_740);
                        ray = local_7f8;
                      }
                      uVar91 = vptestmd_avx512f(auVar217,auVar217);
                      if ((short)uVar91 == 0) goto LAB_019bc3ba;
                      iVar1 = *(int *)(local_840.hit + 4);
                      iVar2 = *(int *)(local_840.hit + 8);
                      iVar71 = *(int *)(local_840.hit + 0xc);
                      iVar72 = *(int *)(local_840.hit + 0x10);
                      iVar73 = *(int *)(local_840.hit + 0x14);
                      iVar74 = *(int *)(local_840.hit + 0x18);
                      iVar75 = *(int *)(local_840.hit + 0x1c);
                      iVar76 = *(int *)(local_840.hit + 0x20);
                      iVar77 = *(int *)(local_840.hit + 0x24);
                      iVar78 = *(int *)(local_840.hit + 0x28);
                      iVar79 = *(int *)(local_840.hit + 0x2c);
                      iVar80 = *(int *)(local_840.hit + 0x30);
                      iVar81 = *(int *)(local_840.hit + 0x34);
                      iVar82 = *(int *)(local_840.hit + 0x38);
                      iVar83 = *(int *)(local_840.hit + 0x3c);
                      bVar97 = (byte)uVar91;
                      bVar12 = (bool)((byte)(uVar91 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar91 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar91 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar91 >> 6) & 1);
                      bVar18 = (bool)((byte)(uVar91 >> 7) & 1);
                      bVar86 = (byte)(uVar91 >> 8);
                      bVar19 = (bool)((byte)(uVar91 >> 9) & 1);
                      bVar20 = (bool)((byte)(uVar91 >> 10) & 1);
                      bVar21 = (bool)((byte)(uVar91 >> 0xb) & 1);
                      bVar22 = (bool)((byte)(uVar91 >> 0xc) & 1);
                      bVar23 = (bool)((byte)(uVar91 >> 0xd) & 1);
                      bVar24 = (bool)((byte)(uVar91 >> 0xe) & 1);
                      bVar25 = SUB81(uVar91 >> 0xf,0);
                      *(uint *)(local_840.ray + 0x300) =
                           (uint)(bVar97 & 1) * *(int *)local_840.hit |
                           (uint)!(bool)(bVar97 & 1) * *(int *)(local_840.ray + 0x300);
                      *(uint *)(local_840.ray + 0x304) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_840.ray + 0x304);
                      *(uint *)(local_840.ray + 0x308) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_840.ray + 0x308);
                      *(uint *)(local_840.ray + 0x30c) =
                           (uint)bVar14 * iVar71 | (uint)!bVar14 * *(int *)(local_840.ray + 0x30c);
                      *(uint *)(local_840.ray + 0x310) =
                           (uint)bVar15 * iVar72 | (uint)!bVar15 * *(int *)(local_840.ray + 0x310);
                      *(uint *)(local_840.ray + 0x314) =
                           (uint)bVar16 * iVar73 | (uint)!bVar16 * *(int *)(local_840.ray + 0x314);
                      *(uint *)(local_840.ray + 0x318) =
                           (uint)bVar17 * iVar74 | (uint)!bVar17 * *(int *)(local_840.ray + 0x318);
                      *(uint *)(local_840.ray + 0x31c) =
                           (uint)bVar18 * iVar75 | (uint)!bVar18 * *(int *)(local_840.ray + 0x31c);
                      *(uint *)(local_840.ray + 800) =
                           (uint)(bVar86 & 1) * iVar76 |
                           (uint)!(bool)(bVar86 & 1) * *(int *)(local_840.ray + 800);
                      *(uint *)(local_840.ray + 0x324) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_840.ray + 0x324);
                      *(uint *)(local_840.ray + 0x328) =
                           (uint)bVar20 * iVar78 | (uint)!bVar20 * *(int *)(local_840.ray + 0x328);
                      *(uint *)(local_840.ray + 0x32c) =
                           (uint)bVar21 * iVar79 | (uint)!bVar21 * *(int *)(local_840.ray + 0x32c);
                      *(uint *)(local_840.ray + 0x330) =
                           (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_840.ray + 0x330);
                      *(uint *)(local_840.ray + 0x334) =
                           (uint)bVar23 * iVar81 | (uint)!bVar23 * *(int *)(local_840.ray + 0x334);
                      *(uint *)(local_840.ray + 0x338) =
                           (uint)bVar24 * iVar82 | (uint)!bVar24 * *(int *)(local_840.ray + 0x338);
                      *(uint *)(local_840.ray + 0x33c) =
                           (uint)bVar25 * iVar83 | (uint)!bVar25 * *(int *)(local_840.ray + 0x33c);
                      iVar1 = *(int *)(local_840.hit + 0x44);
                      iVar2 = *(int *)(local_840.hit + 0x48);
                      iVar71 = *(int *)(local_840.hit + 0x4c);
                      iVar72 = *(int *)(local_840.hit + 0x50);
                      iVar73 = *(int *)(local_840.hit + 0x54);
                      iVar74 = *(int *)(local_840.hit + 0x58);
                      iVar75 = *(int *)(local_840.hit + 0x5c);
                      iVar76 = *(int *)(local_840.hit + 0x60);
                      iVar77 = *(int *)(local_840.hit + 100);
                      iVar78 = *(int *)(local_840.hit + 0x68);
                      iVar79 = *(int *)(local_840.hit + 0x6c);
                      iVar80 = *(int *)(local_840.hit + 0x70);
                      iVar81 = *(int *)(local_840.hit + 0x74);
                      iVar82 = *(int *)(local_840.hit + 0x78);
                      iVar83 = *(int *)(local_840.hit + 0x7c);
                      bVar12 = (bool)((byte)(uVar91 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar91 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar91 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar91 >> 6) & 1);
                      bVar18 = (bool)((byte)(uVar91 >> 7) & 1);
                      bVar19 = (bool)((byte)(uVar91 >> 9) & 1);
                      bVar20 = (bool)((byte)(uVar91 >> 10) & 1);
                      bVar21 = (bool)((byte)(uVar91 >> 0xb) & 1);
                      bVar22 = (bool)((byte)(uVar91 >> 0xc) & 1);
                      bVar23 = (bool)((byte)(uVar91 >> 0xd) & 1);
                      bVar24 = (bool)((byte)(uVar91 >> 0xe) & 1);
                      bVar25 = SUB81(uVar91 >> 0xf,0);
                      *(uint *)(local_840.ray + 0x340) =
                           (uint)(bVar97 & 1) * *(int *)(local_840.hit + 0x40) |
                           (uint)!(bool)(bVar97 & 1) * *(int *)(local_840.ray + 0x340);
                      *(uint *)(local_840.ray + 0x344) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_840.ray + 0x344);
                      *(uint *)(local_840.ray + 0x348) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_840.ray + 0x348);
                      *(uint *)(local_840.ray + 0x34c) =
                           (uint)bVar14 * iVar71 | (uint)!bVar14 * *(int *)(local_840.ray + 0x34c);
                      *(uint *)(local_840.ray + 0x350) =
                           (uint)bVar15 * iVar72 | (uint)!bVar15 * *(int *)(local_840.ray + 0x350);
                      *(uint *)(local_840.ray + 0x354) =
                           (uint)bVar16 * iVar73 | (uint)!bVar16 * *(int *)(local_840.ray + 0x354);
                      *(uint *)(local_840.ray + 0x358) =
                           (uint)bVar17 * iVar74 | (uint)!bVar17 * *(int *)(local_840.ray + 0x358);
                      *(uint *)(local_840.ray + 0x35c) =
                           (uint)bVar18 * iVar75 | (uint)!bVar18 * *(int *)(local_840.ray + 0x35c);
                      *(uint *)(local_840.ray + 0x360) =
                           (uint)(bVar86 & 1) * iVar76 |
                           (uint)!(bool)(bVar86 & 1) * *(int *)(local_840.ray + 0x360);
                      *(uint *)(local_840.ray + 0x364) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_840.ray + 0x364);
                      *(uint *)(local_840.ray + 0x368) =
                           (uint)bVar20 * iVar78 | (uint)!bVar20 * *(int *)(local_840.ray + 0x368);
                      *(uint *)(local_840.ray + 0x36c) =
                           (uint)bVar21 * iVar79 | (uint)!bVar21 * *(int *)(local_840.ray + 0x36c);
                      *(uint *)(local_840.ray + 0x370) =
                           (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_840.ray + 0x370);
                      *(uint *)(local_840.ray + 0x374) =
                           (uint)bVar23 * iVar81 | (uint)!bVar23 * *(int *)(local_840.ray + 0x374);
                      *(uint *)(local_840.ray + 0x378) =
                           (uint)bVar24 * iVar82 | (uint)!bVar24 * *(int *)(local_840.ray + 0x378);
                      *(uint *)(local_840.ray + 0x37c) =
                           (uint)bVar25 * iVar83 | (uint)!bVar25 * *(int *)(local_840.ray + 0x37c);
                      iVar1 = *(int *)(local_840.hit + 0x84);
                      iVar2 = *(int *)(local_840.hit + 0x88);
                      iVar71 = *(int *)(local_840.hit + 0x8c);
                      iVar72 = *(int *)(local_840.hit + 0x90);
                      iVar73 = *(int *)(local_840.hit + 0x94);
                      iVar74 = *(int *)(local_840.hit + 0x98);
                      iVar75 = *(int *)(local_840.hit + 0x9c);
                      iVar76 = *(int *)(local_840.hit + 0xa0);
                      iVar77 = *(int *)(local_840.hit + 0xa4);
                      iVar78 = *(int *)(local_840.hit + 0xa8);
                      iVar79 = *(int *)(local_840.hit + 0xac);
                      iVar80 = *(int *)(local_840.hit + 0xb0);
                      iVar81 = *(int *)(local_840.hit + 0xb4);
                      iVar82 = *(int *)(local_840.hit + 0xb8);
                      iVar83 = *(int *)(local_840.hit + 0xbc);
                      bVar12 = (bool)((byte)(uVar91 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar91 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar91 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar91 >> 6) & 1);
                      bVar18 = (bool)((byte)(uVar91 >> 7) & 1);
                      bVar19 = (bool)((byte)(uVar91 >> 9) & 1);
                      bVar20 = (bool)((byte)(uVar91 >> 10) & 1);
                      bVar21 = (bool)((byte)(uVar91 >> 0xb) & 1);
                      bVar22 = (bool)((byte)(uVar91 >> 0xc) & 1);
                      bVar23 = (bool)((byte)(uVar91 >> 0xd) & 1);
                      bVar24 = (bool)((byte)(uVar91 >> 0xe) & 1);
                      bVar25 = SUB81(uVar91 >> 0xf,0);
                      *(uint *)(local_840.ray + 0x380) =
                           (uint)(bVar97 & 1) * *(int *)(local_840.hit + 0x80) |
                           (uint)!(bool)(bVar97 & 1) * *(int *)(local_840.ray + 0x380);
                      *(uint *)(local_840.ray + 900) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_840.ray + 900);
                      *(uint *)(local_840.ray + 0x388) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_840.ray + 0x388);
                      *(uint *)(local_840.ray + 0x38c) =
                           (uint)bVar14 * iVar71 | (uint)!bVar14 * *(int *)(local_840.ray + 0x38c);
                      *(uint *)(local_840.ray + 0x390) =
                           (uint)bVar15 * iVar72 | (uint)!bVar15 * *(int *)(local_840.ray + 0x390);
                      *(uint *)(local_840.ray + 0x394) =
                           (uint)bVar16 * iVar73 | (uint)!bVar16 * *(int *)(local_840.ray + 0x394);
                      *(uint *)(local_840.ray + 0x398) =
                           (uint)bVar17 * iVar74 | (uint)!bVar17 * *(int *)(local_840.ray + 0x398);
                      *(uint *)(local_840.ray + 0x39c) =
                           (uint)bVar18 * iVar75 | (uint)!bVar18 * *(int *)(local_840.ray + 0x39c);
                      *(uint *)(local_840.ray + 0x3a0) =
                           (uint)(bVar86 & 1) * iVar76 |
                           (uint)!(bool)(bVar86 & 1) * *(int *)(local_840.ray + 0x3a0);
                      *(uint *)(local_840.ray + 0x3a4) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_840.ray + 0x3a4);
                      *(uint *)(local_840.ray + 0x3a8) =
                           (uint)bVar20 * iVar78 | (uint)!bVar20 * *(int *)(local_840.ray + 0x3a8);
                      *(uint *)(local_840.ray + 0x3ac) =
                           (uint)bVar21 * iVar79 | (uint)!bVar21 * *(int *)(local_840.ray + 0x3ac);
                      *(uint *)(local_840.ray + 0x3b0) =
                           (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_840.ray + 0x3b0);
                      *(uint *)(local_840.ray + 0x3b4) =
                           (uint)bVar23 * iVar81 | (uint)!bVar23 * *(int *)(local_840.ray + 0x3b4);
                      *(uint *)(local_840.ray + 0x3b8) =
                           (uint)bVar24 * iVar82 | (uint)!bVar24 * *(int *)(local_840.ray + 0x3b8);
                      *(uint *)(local_840.ray + 0x3bc) =
                           (uint)bVar25 * iVar83 | (uint)!bVar25 * *(int *)(local_840.ray + 0x3bc);
                      iVar1 = *(int *)(local_840.hit + 0xc4);
                      iVar2 = *(int *)(local_840.hit + 200);
                      iVar71 = *(int *)(local_840.hit + 0xcc);
                      iVar72 = *(int *)(local_840.hit + 0xd0);
                      iVar73 = *(int *)(local_840.hit + 0xd4);
                      iVar74 = *(int *)(local_840.hit + 0xd8);
                      iVar75 = *(int *)(local_840.hit + 0xdc);
                      iVar76 = *(int *)(local_840.hit + 0xe0);
                      iVar77 = *(int *)(local_840.hit + 0xe4);
                      iVar78 = *(int *)(local_840.hit + 0xe8);
                      iVar79 = *(int *)(local_840.hit + 0xec);
                      iVar80 = *(int *)(local_840.hit + 0xf0);
                      iVar81 = *(int *)(local_840.hit + 0xf4);
                      iVar82 = *(int *)(local_840.hit + 0xf8);
                      iVar83 = *(int *)(local_840.hit + 0xfc);
                      bVar12 = (bool)((byte)(uVar91 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar91 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar91 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar91 >> 6) & 1);
                      bVar18 = (bool)((byte)(uVar91 >> 7) & 1);
                      bVar19 = (bool)((byte)(uVar91 >> 9) & 1);
                      bVar20 = (bool)((byte)(uVar91 >> 10) & 1);
                      bVar21 = (bool)((byte)(uVar91 >> 0xb) & 1);
                      bVar22 = (bool)((byte)(uVar91 >> 0xc) & 1);
                      bVar23 = (bool)((byte)(uVar91 >> 0xd) & 1);
                      bVar24 = (bool)((byte)(uVar91 >> 0xe) & 1);
                      bVar25 = SUB81(uVar91 >> 0xf,0);
                      *(uint *)(local_840.ray + 0x3c0) =
                           (uint)(bVar97 & 1) * *(int *)(local_840.hit + 0xc0) |
                           (uint)!(bool)(bVar97 & 1) * *(int *)(local_840.ray + 0x3c0);
                      *(uint *)(local_840.ray + 0x3c4) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_840.ray + 0x3c4);
                      *(uint *)(local_840.ray + 0x3c8) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_840.ray + 0x3c8);
                      *(uint *)(local_840.ray + 0x3cc) =
                           (uint)bVar14 * iVar71 | (uint)!bVar14 * *(int *)(local_840.ray + 0x3cc);
                      *(uint *)(local_840.ray + 0x3d0) =
                           (uint)bVar15 * iVar72 | (uint)!bVar15 * *(int *)(local_840.ray + 0x3d0);
                      *(uint *)(local_840.ray + 0x3d4) =
                           (uint)bVar16 * iVar73 | (uint)!bVar16 * *(int *)(local_840.ray + 0x3d4);
                      *(uint *)(local_840.ray + 0x3d8) =
                           (uint)bVar17 * iVar74 | (uint)!bVar17 * *(int *)(local_840.ray + 0x3d8);
                      *(uint *)(local_840.ray + 0x3dc) =
                           (uint)bVar18 * iVar75 | (uint)!bVar18 * *(int *)(local_840.ray + 0x3dc);
                      *(uint *)(local_840.ray + 0x3e0) =
                           (uint)(bVar86 & 1) * iVar76 |
                           (uint)!(bool)(bVar86 & 1) * *(int *)(local_840.ray + 0x3e0);
                      *(uint *)(local_840.ray + 0x3e4) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_840.ray + 0x3e4);
                      *(uint *)(local_840.ray + 1000) =
                           (uint)bVar20 * iVar78 | (uint)!bVar20 * *(int *)(local_840.ray + 1000);
                      *(uint *)(local_840.ray + 0x3ec) =
                           (uint)bVar21 * iVar79 | (uint)!bVar21 * *(int *)(local_840.ray + 0x3ec);
                      *(uint *)(local_840.ray + 0x3f0) =
                           (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_840.ray + 0x3f0);
                      *(uint *)(local_840.ray + 0x3f4) =
                           (uint)bVar23 * iVar81 | (uint)!bVar23 * *(int *)(local_840.ray + 0x3f4);
                      *(uint *)(local_840.ray + 0x3f8) =
                           (uint)bVar24 * iVar82 | (uint)!bVar24 * *(int *)(local_840.ray + 0x3f8);
                      *(uint *)(local_840.ray + 0x3fc) =
                           (uint)bVar25 * iVar83 | (uint)!bVar25 * *(int *)(local_840.ray + 0x3fc);
                      iVar1 = *(int *)(local_840.hit + 0x104);
                      iVar2 = *(int *)(local_840.hit + 0x108);
                      iVar71 = *(int *)(local_840.hit + 0x10c);
                      iVar72 = *(int *)(local_840.hit + 0x110);
                      iVar73 = *(int *)(local_840.hit + 0x114);
                      iVar74 = *(int *)(local_840.hit + 0x118);
                      iVar75 = *(int *)(local_840.hit + 0x11c);
                      iVar76 = *(int *)(local_840.hit + 0x120);
                      iVar77 = *(int *)(local_840.hit + 0x124);
                      iVar78 = *(int *)(local_840.hit + 0x128);
                      iVar79 = *(int *)(local_840.hit + 300);
                      iVar80 = *(int *)(local_840.hit + 0x130);
                      iVar81 = *(int *)(local_840.hit + 0x134);
                      iVar82 = *(int *)(local_840.hit + 0x138);
                      iVar83 = *(int *)(local_840.hit + 0x13c);
                      bVar12 = (bool)((byte)(uVar91 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar91 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar91 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar91 >> 6) & 1);
                      bVar18 = (bool)((byte)(uVar91 >> 7) & 1);
                      bVar19 = (bool)((byte)(uVar91 >> 9) & 1);
                      bVar20 = (bool)((byte)(uVar91 >> 10) & 1);
                      bVar21 = (bool)((byte)(uVar91 >> 0xb) & 1);
                      bVar22 = (bool)((byte)(uVar91 >> 0xc) & 1);
                      bVar23 = (bool)((byte)(uVar91 >> 0xd) & 1);
                      bVar24 = (bool)((byte)(uVar91 >> 0xe) & 1);
                      bVar25 = SUB81(uVar91 >> 0xf,0);
                      *(uint *)(local_840.ray + 0x400) =
                           (uint)(bVar97 & 1) * *(int *)(local_840.hit + 0x100) |
                           (uint)!(bool)(bVar97 & 1) * *(int *)(local_840.ray + 0x400);
                      *(uint *)(local_840.ray + 0x404) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_840.ray + 0x404);
                      *(uint *)(local_840.ray + 0x408) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_840.ray + 0x408);
                      *(uint *)(local_840.ray + 0x40c) =
                           (uint)bVar14 * iVar71 | (uint)!bVar14 * *(int *)(local_840.ray + 0x40c);
                      *(uint *)(local_840.ray + 0x410) =
                           (uint)bVar15 * iVar72 | (uint)!bVar15 * *(int *)(local_840.ray + 0x410);
                      *(uint *)(local_840.ray + 0x414) =
                           (uint)bVar16 * iVar73 | (uint)!bVar16 * *(int *)(local_840.ray + 0x414);
                      *(uint *)(local_840.ray + 0x418) =
                           (uint)bVar17 * iVar74 | (uint)!bVar17 * *(int *)(local_840.ray + 0x418);
                      *(uint *)(local_840.ray + 0x41c) =
                           (uint)bVar18 * iVar75 | (uint)!bVar18 * *(int *)(local_840.ray + 0x41c);
                      *(uint *)(local_840.ray + 0x420) =
                           (uint)(bVar86 & 1) * iVar76 |
                           (uint)!(bool)(bVar86 & 1) * *(int *)(local_840.ray + 0x420);
                      *(uint *)(local_840.ray + 0x424) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_840.ray + 0x424);
                      *(uint *)(local_840.ray + 0x428) =
                           (uint)bVar20 * iVar78 | (uint)!bVar20 * *(int *)(local_840.ray + 0x428);
                      *(uint *)(local_840.ray + 0x42c) =
                           (uint)bVar21 * iVar79 | (uint)!bVar21 * *(int *)(local_840.ray + 0x42c);
                      *(uint *)(local_840.ray + 0x430) =
                           (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_840.ray + 0x430);
                      *(uint *)(local_840.ray + 0x434) =
                           (uint)bVar23 * iVar81 | (uint)!bVar23 * *(int *)(local_840.ray + 0x434);
                      *(uint *)(local_840.ray + 0x438) =
                           (uint)bVar24 * iVar82 | (uint)!bVar24 * *(int *)(local_840.ray + 0x438);
                      *(uint *)(local_840.ray + 0x43c) =
                           (uint)bVar25 * iVar83 | (uint)!bVar25 * *(int *)(local_840.ray + 0x43c);
                      auVar217 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x140));
                      auVar217 = vmovdqu32_avx512f(auVar217);
                      *(undefined1 (*) [64])(local_840.ray + 0x440) = auVar217;
                      auVar217 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x180));
                      auVar217 = vmovdqu32_avx512f(auVar217);
                      *(undefined1 (*) [64])(local_840.ray + 0x480) = auVar217;
                      auVar217 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x1c0));
                      auVar217 = vmovdqa32_avx512f(auVar217);
                      *(undefined1 (*) [64])(local_840.ray + 0x4c0) = auVar217;
                      auVar217 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x200));
                      auVar217 = vmovdqa32_avx512f(auVar217);
                      *(undefined1 (*) [64])(local_840.ray + 0x500) = auVar217;
                      local_780 = *(float *)(ray + k * 4 + 0x200);
                      fStack_77c = 0.0;
                      fStack_778 = 0.0;
                      fStack_774 = 0.0;
                    }
                    auVar111 = auVar174._0_32_;
                    bVar97 = ~(byte)(1 << ((uint)uVar88 & 0x1f)) & (byte)uVar98;
                    auVar172._4_4_ = local_780;
                    auVar172._0_4_ = local_780;
                    auVar172._8_4_ = local_780;
                    auVar172._12_4_ = local_780;
                    auVar172._16_4_ = local_780;
                    auVar172._20_4_ = local_780;
                    auVar172._24_4_ = local_780;
                    auVar172._28_4_ = local_780;
                    uVar181 = vcmpps_avx512vl(auVar220._0_32_,auVar172,2);
                    if ((bVar97 & (byte)uVar181) == 0) goto LAB_019bb278;
                    bVar97 = bVar97 & (byte)uVar181;
                    uVar98 = (ulong)bVar97;
                    auVar173._8_4_ = 0x7f800000;
                    auVar173._0_8_ = 0x7f8000007f800000;
                    auVar173._12_4_ = 0x7f800000;
                    auVar173._16_4_ = 0x7f800000;
                    auVar173._20_4_ = 0x7f800000;
                    auVar173._24_4_ = 0x7f800000;
                    auVar173._28_4_ = 0x7f800000;
                    auVar118 = vblendmps_avx512vl(auVar173,auVar220._0_32_);
                    auVar151._0_4_ =
                         (uint)(bVar97 & 1) * auVar118._0_4_ |
                         (uint)!(bool)(bVar97 & 1) * 0x7f800000;
                    bVar12 = (bool)(bVar97 >> 1 & 1);
                    auVar151._4_4_ = (uint)bVar12 * auVar118._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar97 >> 2 & 1);
                    auVar151._8_4_ = (uint)bVar12 * auVar118._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar97 >> 3 & 1);
                    auVar151._12_4_ = (uint)bVar12 * auVar118._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar97 >> 4 & 1);
                    auVar151._16_4_ = (uint)bVar12 * auVar118._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar97 >> 5 & 1);
                    auVar151._20_4_ = (uint)bVar12 * auVar118._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar97 >> 6 & 1);
                    auVar151._24_4_ = (uint)bVar12 * auVar118._24_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar151._28_4_ =
                         (uint)(bVar97 >> 7) * auVar118._28_4_ |
                         (uint)!(bool)(bVar97 >> 7) * 0x7f800000;
                    auVar118 = vshufps_avx(auVar151,auVar151,0xb1);
                    auVar118 = vminps_avx(auVar151,auVar118);
                    auVar116 = vshufpd_avx(auVar118,auVar118,5);
                    auVar118 = vminps_avx(auVar118,auVar116);
                    auVar116 = vpermpd_avx2(auVar118,0x4e);
                    auVar118 = vminps_avx(auVar118,auVar116);
                    uVar181 = vcmpps_avx512vl(auVar151,auVar118,0);
                    bVar86 = (byte)uVar181 & bVar97;
                    if (bVar86 != 0) {
                      bVar97 = bVar86;
                    }
                    uVar89 = 0;
                    for (uVar90 = (uint)bVar97; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000
                        ) {
                      uVar89 = uVar89 + 1;
                    }
                    uVar88 = (ulong)uVar89;
                  } while( true );
                }
                fVar183 = local_520[uVar88];
                uVar161 = *(undefined4 *)(local_500 + uVar88 * 4);
                fVar179 = 1.0 - fVar183;
                fVar178 = fVar179 * fVar179 * -3.0;
                auVar209 = ZEXT464((uint)fVar178);
                auVar109 = vfmadd231ss_fma(ZEXT416((uint)(fVar179 * fVar179)),
                                           ZEXT416((uint)(fVar183 * fVar179)),ZEXT416(0xc0000000));
                auVar104 = vfmsub132ss_fma(ZEXT416((uint)(fVar183 * fVar179)),
                                           ZEXT416((uint)(fVar183 * fVar183)),ZEXT416(0x40000000));
                fVar179 = auVar109._0_4_ * 3.0;
                fVar180 = auVar104._0_4_ * 3.0;
                fVar192 = fVar183 * fVar183 * 3.0;
                auVar210._0_4_ = fVar192 * fVar160;
                auVar210._4_4_ = fVar192 * fVar175;
                auVar210._8_4_ = fVar192 * fVar176;
                auVar210._12_4_ = fVar192 * fVar177;
                auVar215 = ZEXT1664(auVar210);
                auVar186._4_4_ = fVar180;
                auVar186._0_4_ = fVar180;
                auVar186._8_4_ = fVar180;
                auVar186._12_4_ = fVar180;
                auVar109 = vfmadd132ps_fma(auVar186,auVar210,auVar6);
                auVar196._4_4_ = fVar179;
                auVar196._0_4_ = fVar179;
                auVar196._8_4_ = fVar179;
                auVar196._12_4_ = fVar179;
                auVar109 = vfmadd132ps_fma(auVar196,auVar109,auVar26);
                auVar187._4_4_ = fVar178;
                auVar187._0_4_ = fVar178;
                auVar187._8_4_ = fVar178;
                auVar187._12_4_ = fVar178;
                auVar109 = vfmadd213ps_fma(auVar187,auVar101,auVar109);
                *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar88 * 4);
                *(int *)(ray + k * 4 + 0x300) = auVar109._0_4_;
                uVar10 = vextractps_avx(auVar109,1);
                *(undefined4 *)(ray + k * 4 + 0x340) = uVar10;
                uVar10 = vextractps_avx(auVar109,2);
                *(undefined4 *)(ray + k * 4 + 0x380) = uVar10;
                *(float *)(ray + k * 4 + 0x3c0) = fVar183;
                *(undefined4 *)(ray + k * 4 + 0x400) = uVar161;
                *(undefined4 *)(ray + k * 4 + 0x440) = uVar3;
                *(uint *)(ray + k * 4 + 0x480) = uVar8;
                *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
LAB_019bb278:
                auVar217 = ZEXT1664(auVar101);
                fVar183 = (float)local_810._0_4_;
              }
            }
          }
        }
      }
    }
    local_810._0_4_ = fVar183;
    if (8 < iVar9) {
      auVar118 = vpbroadcastd_avx512vl();
      auVar174 = ZEXT3264(auVar118);
      local_780 = (float)local_810._0_4_;
      fStack_77c = (float)local_810._0_4_;
      fStack_778 = (float)local_810._0_4_;
      fStack_774 = (float)local_810._0_4_;
      fStack_770 = (float)local_810._0_4_;
      fStack_76c = (float)local_810._0_4_;
      fStack_768 = (float)local_810._0_4_;
      fStack_764 = (float)local_810._0_4_;
      uStack_75c = local_760;
      uStack_758 = local_760;
      uStack_754 = local_760;
      uStack_750 = local_760;
      uStack_74c = local_760;
      uStack_748 = local_760;
      uStack_744 = local_760;
      local_440 = 1.0 / (float)local_7a0._0_4_;
      fStack_43c = local_440;
      fStack_438 = local_440;
      fStack_434 = local_440;
      fStack_430 = local_440;
      fStack_42c = local_440;
      fStack_428 = local_440;
      fStack_424 = local_440;
      lVar96 = 8;
      local_7e0 = auVar111;
LAB_019bb322:
      if (lVar96 < lVar92) {
        auVar118 = vpbroadcastd_avx512vl();
        auVar118 = vpor_avx2(auVar118,_DAT_01fb4ba0);
        uVar27 = vpcmpgtd_avx512vl(auVar174._0_32_,auVar118);
        auVar118 = *(undefined1 (*) [32])(bezier_basis0 + lVar96 * 4 + lVar95);
        auVar116 = *(undefined1 (*) [32])(lVar95 + 0x21fb768 + lVar96 * 4);
        auVar125 = *(undefined1 (*) [32])(lVar95 + 0x21fbbec + lVar96 * 4);
        auVar124 = *(undefined1 (*) [32])(lVar95 + 0x21fc070 + lVar96 * 4);
        auVar220._0_4_ = auVar124._0_4_ * (float)local_6c0._0_4_;
        auVar220._4_4_ = auVar124._4_4_ * (float)local_6c0._4_4_;
        auVar220._8_4_ = auVar124._8_4_ * fStack_6b8;
        auVar220._12_4_ = auVar124._12_4_ * fStack_6b4;
        auVar220._16_4_ = auVar124._16_4_ * fStack_6b0;
        auVar220._20_4_ = auVar124._20_4_ * fStack_6ac;
        auVar220._28_36_ = auVar215._28_36_;
        auVar220._24_4_ = auVar124._24_4_ * fStack_6a8;
        auVar215._0_4_ = auVar124._0_4_ * (float)local_6e0._0_4_;
        auVar215._4_4_ = auVar124._4_4_ * (float)local_6e0._4_4_;
        auVar215._8_4_ = auVar124._8_4_ * fStack_6d8;
        auVar215._12_4_ = auVar124._12_4_ * fStack_6d4;
        auVar215._16_4_ = auVar124._16_4_ * fStack_6d0;
        auVar215._20_4_ = auVar124._20_4_ * fStack_6cc;
        auVar215._28_36_ = auVar209._28_36_;
        auVar215._24_4_ = auVar124._24_4_ * fStack_6c8;
        auVar119 = vmulps_avx512vl(local_420,auVar124);
        auVar117 = vfmadd231ps_avx512vl(auVar220._0_32_,auVar125,local_680);
        auVar123 = vfmadd231ps_avx512vl(auVar215._0_32_,auVar125,local_6a0);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar125,local_400);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar116,local_640);
        auVar123 = vfmadd231ps_avx512vl(auVar123,auVar116,local_660);
        auVar122 = vfmadd231ps_avx512vl(auVar119,auVar116,local_3e0);
        auVar109 = vfmadd231ps_fma(auVar117,auVar118,local_600);
        auVar215 = ZEXT1664(auVar109);
        auVar104 = vfmadd231ps_fma(auVar123,auVar118,local_620);
        auVar209 = ZEXT1664(auVar104);
        auVar119 = *(undefined1 (*) [32])(bezier_basis1 + lVar96 * 4 + lVar95);
        auVar117 = *(undefined1 (*) [32])(lVar95 + 0x21fdb88 + lVar96 * 4);
        auVar115 = vfmadd231ps_avx512vl(auVar122,auVar118,local_3c0);
        auVar123 = *(undefined1 (*) [32])(lVar95 + 0x21fe00c + lVar96 * 4);
        auVar122 = *(undefined1 (*) [32])(lVar95 + 0x21fe490 + lVar96 * 4);
        auVar218._0_4_ = auVar122._0_4_ * (float)local_6c0._0_4_;
        auVar218._4_4_ = auVar122._4_4_ * (float)local_6c0._4_4_;
        auVar218._8_4_ = auVar122._8_4_ * fStack_6b8;
        auVar218._12_4_ = auVar122._12_4_ * fStack_6b4;
        auVar218._16_4_ = auVar122._16_4_ * fStack_6b0;
        auVar218._20_4_ = auVar122._20_4_ * fStack_6ac;
        auVar218._28_36_ = auVar217._28_36_;
        auVar218._24_4_ = auVar122._24_4_ * fStack_6a8;
        auVar54._4_4_ = auVar122._4_4_ * (float)local_6e0._4_4_;
        auVar54._0_4_ = auVar122._0_4_ * (float)local_6e0._0_4_;
        auVar54._8_4_ = auVar122._8_4_ * fStack_6d8;
        auVar54._12_4_ = auVar122._12_4_ * fStack_6d4;
        auVar54._16_4_ = auVar122._16_4_ * fStack_6d0;
        auVar54._20_4_ = auVar122._20_4_ * fStack_6cc;
        auVar54._24_4_ = auVar122._24_4_ * fStack_6c8;
        auVar54._28_4_ = uStack_6c4;
        auVar120 = vmulps_avx512vl(local_420,auVar122);
        auVar114 = vfmadd231ps_avx512vl(auVar218._0_32_,auVar123,local_680);
        auVar110 = vfmadd231ps_avx512vl(auVar54,auVar123,local_6a0);
        auVar120 = vfmadd231ps_avx512vl(auVar120,auVar123,local_400);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar117,local_640);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar117,local_660);
        auVar120 = vfmadd231ps_avx512vl(auVar120,auVar117,local_3e0);
        auVar105 = vfmadd231ps_fma(auVar114,auVar119,local_600);
        auVar217 = ZEXT1664(auVar105);
        auVar103 = vfmadd231ps_fma(auVar110,auVar119,local_620);
        auVar110 = vfmadd231ps_avx512vl(auVar120,auVar119,local_3c0);
        auVar111 = vmaxps_avx512vl(auVar115,auVar110);
        auVar120 = vsubps_avx(ZEXT1632(auVar105),ZEXT1632(auVar109));
        auVar114 = vsubps_avx(ZEXT1632(auVar103),ZEXT1632(auVar104));
        auVar112 = vmulps_avx512vl(ZEXT1632(auVar104),auVar120);
        auVar113 = vmulps_avx512vl(ZEXT1632(auVar109),auVar114);
        auVar112 = vsubps_avx512vl(auVar112,auVar113);
        auVar113 = vmulps_avx512vl(auVar114,auVar114);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar120,auVar120);
        auVar111 = vmulps_avx512vl(auVar111,auVar111);
        auVar111 = vmulps_avx512vl(auVar111,auVar113);
        auVar112 = vmulps_avx512vl(auVar112,auVar112);
        uVar181 = vcmpps_avx512vl(auVar112,auVar111,2);
        bVar97 = (byte)uVar27 & (byte)uVar181;
        if (bVar97 != 0) {
          auVar122 = vmulps_avx512vl(local_4c0,auVar122);
          auVar123 = vfmadd213ps_avx512vl(auVar123,local_4a0,auVar122);
          auVar117 = vfmadd213ps_avx512vl(auVar117,local_480,auVar123);
          auVar119 = vfmadd213ps_avx512vl(auVar119,local_7e0,auVar117);
          auVar124 = vmulps_avx512vl(local_4c0,auVar124);
          auVar125 = vfmadd213ps_avx512vl(auVar125,local_4a0,auVar124);
          auVar116 = vfmadd213ps_avx512vl(auVar116,local_480,auVar125);
          auVar117 = vfmadd213ps_avx512vl(auVar118,local_7e0,auVar116);
          auVar118 = *(undefined1 (*) [32])(lVar95 + 0x21fc4f4 + lVar96 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar95 + 0x21fc978 + lVar96 * 4);
          auVar125 = *(undefined1 (*) [32])(lVar95 + 0x21fcdfc + lVar96 * 4);
          auVar124 = *(undefined1 (*) [32])(lVar95 + 0x21fd280 + lVar96 * 4);
          auVar123 = vmulps_avx512vl(_local_6c0,auVar124);
          auVar122 = vmulps_avx512vl(_local_6e0,auVar124);
          auVar124 = vmulps_avx512vl(local_4c0,auVar124);
          auVar123 = vfmadd231ps_avx512vl(auVar123,auVar125,local_680);
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar125,local_6a0);
          auVar125 = vfmadd231ps_avx512vl(auVar124,local_4a0,auVar125);
          auVar124 = vfmadd231ps_avx512vl(auVar123,auVar116,local_640);
          auVar123 = vfmadd231ps_avx512vl(auVar122,auVar116,local_660);
          auVar116 = vfmadd231ps_avx512vl(auVar125,local_480,auVar116);
          auVar124 = vfmadd231ps_avx512vl(auVar124,auVar118,local_600);
          auVar123 = vfmadd231ps_avx512vl(auVar123,auVar118,local_620);
          auVar102 = vfmadd231ps_fma(auVar116,auVar118,local_7e0);
          auVar118 = *(undefined1 (*) [32])(lVar95 + 0x21fe914 + lVar96 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar95 + 0x21ff21c + lVar96 * 4);
          auVar125 = *(undefined1 (*) [32])(lVar95 + 0x21ff6a0 + lVar96 * 4);
          auVar122 = vmulps_avx512vl(_local_6c0,auVar125);
          auVar111 = vmulps_avx512vl(_local_6e0,auVar125);
          auVar125 = vmulps_avx512vl(local_4c0,auVar125);
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar116,local_680);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar116,local_6a0);
          auVar125 = vfmadd231ps_avx512vl(auVar125,local_4a0,auVar116);
          auVar116 = *(undefined1 (*) [32])(lVar95 + 0x21fed98 + lVar96 * 4);
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar116,local_640);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar116,local_660);
          auVar116 = vfmadd231ps_avx512vl(auVar125,local_480,auVar116);
          auVar125 = vfmadd231ps_avx512vl(auVar122,auVar118,local_600);
          auVar122 = vfmadd231ps_avx512vl(auVar111,auVar118,local_620);
          auVar116 = vfmadd231ps_avx512vl(auVar116,local_7e0,auVar118);
          auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar124,auVar111);
          vandps_avx512vl(auVar123,auVar111);
          auVar118 = vmaxps_avx(auVar111,auVar111);
          vandps_avx512vl(ZEXT1632(auVar102),auVar111);
          auVar118 = vmaxps_avx(auVar118,auVar111);
          auVar84._4_4_ = fStack_77c;
          auVar84._0_4_ = local_780;
          auVar84._8_4_ = fStack_778;
          auVar84._12_4_ = fStack_774;
          auVar84._16_4_ = fStack_770;
          auVar84._20_4_ = fStack_76c;
          auVar84._24_4_ = fStack_768;
          auVar84._28_4_ = fStack_764;
          uVar88 = vcmpps_avx512vl(auVar118,auVar84,1);
          bVar12 = (bool)((byte)uVar88 & 1);
          auVar139._0_4_ = (float)((uint)bVar12 * auVar120._0_4_ | (uint)!bVar12 * auVar124._0_4_);
          bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
          auVar139._4_4_ = (float)((uint)bVar12 * auVar120._4_4_ | (uint)!bVar12 * auVar124._4_4_);
          bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
          auVar139._8_4_ = (float)((uint)bVar12 * auVar120._8_4_ | (uint)!bVar12 * auVar124._8_4_);
          bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
          auVar139._12_4_ =
               (float)((uint)bVar12 * auVar120._12_4_ | (uint)!bVar12 * auVar124._12_4_);
          bVar12 = (bool)((byte)(uVar88 >> 4) & 1);
          auVar139._16_4_ =
               (float)((uint)bVar12 * auVar120._16_4_ | (uint)!bVar12 * auVar124._16_4_);
          bVar12 = (bool)((byte)(uVar88 >> 5) & 1);
          auVar139._20_4_ =
               (float)((uint)bVar12 * auVar120._20_4_ | (uint)!bVar12 * auVar124._20_4_);
          bVar12 = (bool)((byte)(uVar88 >> 6) & 1);
          auVar139._24_4_ =
               (float)((uint)bVar12 * auVar120._24_4_ | (uint)!bVar12 * auVar124._24_4_);
          bVar12 = SUB81(uVar88 >> 7,0);
          auVar139._28_4_ = (uint)bVar12 * auVar120._28_4_ | (uint)!bVar12 * auVar124._28_4_;
          bVar12 = (bool)((byte)uVar88 & 1);
          auVar140._0_4_ = (float)((uint)bVar12 * auVar114._0_4_ | (uint)!bVar12 * auVar123._0_4_);
          bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
          auVar140._4_4_ = (float)((uint)bVar12 * auVar114._4_4_ | (uint)!bVar12 * auVar123._4_4_);
          bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
          auVar140._8_4_ = (float)((uint)bVar12 * auVar114._8_4_ | (uint)!bVar12 * auVar123._8_4_);
          bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
          auVar140._12_4_ =
               (float)((uint)bVar12 * auVar114._12_4_ | (uint)!bVar12 * auVar123._12_4_);
          bVar12 = (bool)((byte)(uVar88 >> 4) & 1);
          auVar140._16_4_ =
               (float)((uint)bVar12 * auVar114._16_4_ | (uint)!bVar12 * auVar123._16_4_);
          bVar12 = (bool)((byte)(uVar88 >> 5) & 1);
          auVar140._20_4_ =
               (float)((uint)bVar12 * auVar114._20_4_ | (uint)!bVar12 * auVar123._20_4_);
          bVar12 = (bool)((byte)(uVar88 >> 6) & 1);
          auVar140._24_4_ =
               (float)((uint)bVar12 * auVar114._24_4_ | (uint)!bVar12 * auVar123._24_4_);
          bVar12 = SUB81(uVar88 >> 7,0);
          auVar140._28_4_ = (uint)bVar12 * auVar114._28_4_ | (uint)!bVar12 * auVar123._28_4_;
          vandps_avx512vl(auVar125,auVar111);
          vandps_avx512vl(auVar122,auVar111);
          auVar118 = vmaxps_avx(auVar140,auVar140);
          vandps_avx512vl(auVar116,auVar111);
          auVar118 = vmaxps_avx(auVar118,auVar140);
          uVar88 = vcmpps_avx512vl(auVar118,auVar84,1);
          bVar12 = (bool)((byte)uVar88 & 1);
          auVar141._0_4_ = (uint)bVar12 * auVar120._0_4_ | (uint)!bVar12 * auVar125._0_4_;
          bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
          auVar141._4_4_ = (uint)bVar12 * auVar120._4_4_ | (uint)!bVar12 * auVar125._4_4_;
          bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
          auVar141._8_4_ = (uint)bVar12 * auVar120._8_4_ | (uint)!bVar12 * auVar125._8_4_;
          bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
          auVar141._12_4_ = (uint)bVar12 * auVar120._12_4_ | (uint)!bVar12 * auVar125._12_4_;
          bVar12 = (bool)((byte)(uVar88 >> 4) & 1);
          auVar141._16_4_ = (uint)bVar12 * auVar120._16_4_ | (uint)!bVar12 * auVar125._16_4_;
          bVar12 = (bool)((byte)(uVar88 >> 5) & 1);
          auVar141._20_4_ = (uint)bVar12 * auVar120._20_4_ | (uint)!bVar12 * auVar125._20_4_;
          bVar12 = (bool)((byte)(uVar88 >> 6) & 1);
          auVar141._24_4_ = (uint)bVar12 * auVar120._24_4_ | (uint)!bVar12 * auVar125._24_4_;
          bVar12 = SUB81(uVar88 >> 7,0);
          auVar141._28_4_ = (uint)bVar12 * auVar120._28_4_ | (uint)!bVar12 * auVar125._28_4_;
          bVar12 = (bool)((byte)uVar88 & 1);
          auVar142._0_4_ = (float)((uint)bVar12 * auVar114._0_4_ | (uint)!bVar12 * auVar122._0_4_);
          bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
          auVar142._4_4_ = (float)((uint)bVar12 * auVar114._4_4_ | (uint)!bVar12 * auVar122._4_4_);
          bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
          auVar142._8_4_ = (float)((uint)bVar12 * auVar114._8_4_ | (uint)!bVar12 * auVar122._8_4_);
          bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
          auVar142._12_4_ =
               (float)((uint)bVar12 * auVar114._12_4_ | (uint)!bVar12 * auVar122._12_4_);
          bVar12 = (bool)((byte)(uVar88 >> 4) & 1);
          auVar142._16_4_ =
               (float)((uint)bVar12 * auVar114._16_4_ | (uint)!bVar12 * auVar122._16_4_);
          bVar12 = (bool)((byte)(uVar88 >> 5) & 1);
          auVar142._20_4_ =
               (float)((uint)bVar12 * auVar114._20_4_ | (uint)!bVar12 * auVar122._20_4_);
          bVar12 = (bool)((byte)(uVar88 >> 6) & 1);
          auVar142._24_4_ =
               (float)((uint)bVar12 * auVar114._24_4_ | (uint)!bVar12 * auVar122._24_4_);
          bVar12 = SUB81(uVar88 >> 7,0);
          auVar142._28_4_ = (uint)bVar12 * auVar114._28_4_ | (uint)!bVar12 * auVar122._28_4_;
          auVar223._8_4_ = 0x80000000;
          auVar223._0_8_ = 0x8000000080000000;
          auVar223._12_4_ = 0x80000000;
          auVar223._16_4_ = 0x80000000;
          auVar223._20_4_ = 0x80000000;
          auVar223._24_4_ = 0x80000000;
          auVar223._28_4_ = 0x80000000;
          auVar118 = vxorps_avx512vl(auVar141,auVar223);
          auVar108 = vxorps_avx512vl(auVar111._0_16_,auVar111._0_16_);
          auVar116 = vfmadd213ps_avx512vl(auVar139,auVar139,ZEXT1632(auVar108));
          auVar102 = vfmadd231ps_fma(auVar116,auVar140,auVar140);
          auVar116 = vrsqrt14ps_avx512vl(ZEXT1632(auVar102));
          auVar229._8_4_ = 0xbf000000;
          auVar229._0_8_ = 0xbf000000bf000000;
          auVar229._12_4_ = 0xbf000000;
          auVar229._16_4_ = 0xbf000000;
          auVar229._20_4_ = 0xbf000000;
          auVar229._24_4_ = 0xbf000000;
          auVar229._28_4_ = 0xbf000000;
          fVar183 = auVar116._0_4_;
          fVar178 = auVar116._4_4_;
          fVar179 = auVar116._8_4_;
          fVar180 = auVar116._12_4_;
          fVar192 = auVar116._16_4_;
          fVar193 = auVar116._20_4_;
          fVar204 = auVar116._24_4_;
          auVar55._4_4_ = fVar178 * fVar178 * fVar178 * auVar102._4_4_ * -0.5;
          auVar55._0_4_ = fVar183 * fVar183 * fVar183 * auVar102._0_4_ * -0.5;
          auVar55._8_4_ = fVar179 * fVar179 * fVar179 * auVar102._8_4_ * -0.5;
          auVar55._12_4_ = fVar180 * fVar180 * fVar180 * auVar102._12_4_ * -0.5;
          auVar55._16_4_ = fVar192 * fVar192 * fVar192 * -0.0;
          auVar55._20_4_ = fVar193 * fVar193 * fVar193 * -0.0;
          auVar55._24_4_ = fVar204 * fVar204 * fVar204 * -0.0;
          auVar55._28_4_ = auVar140._28_4_;
          auVar125 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar116 = vfmadd231ps_avx512vl(auVar55,auVar125,auVar116);
          auVar56._4_4_ = auVar140._4_4_ * auVar116._4_4_;
          auVar56._0_4_ = auVar140._0_4_ * auVar116._0_4_;
          auVar56._8_4_ = auVar140._8_4_ * auVar116._8_4_;
          auVar56._12_4_ = auVar140._12_4_ * auVar116._12_4_;
          auVar56._16_4_ = auVar140._16_4_ * auVar116._16_4_;
          auVar56._20_4_ = auVar140._20_4_ * auVar116._20_4_;
          auVar56._24_4_ = auVar140._24_4_ * auVar116._24_4_;
          auVar56._28_4_ = 0;
          auVar57._4_4_ = auVar116._4_4_ * -auVar139._4_4_;
          auVar57._0_4_ = auVar116._0_4_ * -auVar139._0_4_;
          auVar57._8_4_ = auVar116._8_4_ * -auVar139._8_4_;
          auVar57._12_4_ = auVar116._12_4_ * -auVar139._12_4_;
          auVar57._16_4_ = auVar116._16_4_ * -auVar139._16_4_;
          auVar57._20_4_ = auVar116._20_4_ * -auVar139._20_4_;
          auVar57._24_4_ = auVar116._24_4_ * -auVar139._24_4_;
          auVar57._28_4_ = auVar140._28_4_;
          auVar124 = vmulps_avx512vl(auVar116,ZEXT1632(auVar108));
          auVar122 = ZEXT1632(auVar108);
          auVar116 = vfmadd213ps_avx512vl(auVar141,auVar141,auVar122);
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar142,auVar142);
          auVar123 = vrsqrt14ps_avx512vl(auVar116);
          auVar116 = vmulps_avx512vl(auVar116,auVar229);
          fVar183 = auVar123._0_4_;
          fVar178 = auVar123._4_4_;
          fVar179 = auVar123._8_4_;
          fVar180 = auVar123._12_4_;
          fVar192 = auVar123._16_4_;
          fVar193 = auVar123._20_4_;
          fVar204 = auVar123._24_4_;
          auVar58._4_4_ = fVar178 * fVar178 * fVar178 * auVar116._4_4_;
          auVar58._0_4_ = fVar183 * fVar183 * fVar183 * auVar116._0_4_;
          auVar58._8_4_ = fVar179 * fVar179 * fVar179 * auVar116._8_4_;
          auVar58._12_4_ = fVar180 * fVar180 * fVar180 * auVar116._12_4_;
          auVar58._16_4_ = fVar192 * fVar192 * fVar192 * auVar116._16_4_;
          auVar58._20_4_ = fVar193 * fVar193 * fVar193 * auVar116._20_4_;
          auVar58._24_4_ = fVar204 * fVar204 * fVar204 * auVar116._24_4_;
          auVar58._28_4_ = auVar116._28_4_;
          auVar116 = vfmadd231ps_avx512vl(auVar58,auVar125,auVar123);
          auVar59._4_4_ = auVar142._4_4_ * auVar116._4_4_;
          auVar59._0_4_ = auVar142._0_4_ * auVar116._0_4_;
          auVar59._8_4_ = auVar142._8_4_ * auVar116._8_4_;
          auVar59._12_4_ = auVar142._12_4_ * auVar116._12_4_;
          auVar59._16_4_ = auVar142._16_4_ * auVar116._16_4_;
          auVar59._20_4_ = auVar142._20_4_ * auVar116._20_4_;
          auVar59._24_4_ = auVar142._24_4_ * auVar116._24_4_;
          auVar59._28_4_ = auVar123._28_4_;
          auVar60._4_4_ = auVar116._4_4_ * auVar118._4_4_;
          auVar60._0_4_ = auVar116._0_4_ * auVar118._0_4_;
          auVar60._8_4_ = auVar116._8_4_ * auVar118._8_4_;
          auVar60._12_4_ = auVar116._12_4_ * auVar118._12_4_;
          auVar60._16_4_ = auVar116._16_4_ * auVar118._16_4_;
          auVar60._20_4_ = auVar116._20_4_ * auVar118._20_4_;
          auVar60._24_4_ = auVar116._24_4_ * auVar118._24_4_;
          auVar60._28_4_ = auVar118._28_4_;
          auVar118 = vmulps_avx512vl(auVar116,auVar122);
          auVar102 = vfmadd213ps_fma(auVar56,auVar115,ZEXT1632(auVar109));
          auVar7 = vfmadd213ps_fma(auVar57,auVar115,ZEXT1632(auVar104));
          auVar125 = vfmadd213ps_avx512vl(auVar124,auVar115,auVar117);
          auVar123 = vfmadd213ps_avx512vl(auVar59,auVar110,ZEXT1632(auVar105));
          auVar185 = vfnmadd213ps_fma(auVar56,auVar115,ZEXT1632(auVar109));
          auVar109 = vfmadd213ps_fma(auVar60,auVar110,ZEXT1632(auVar103));
          auVar194 = vfnmadd213ps_fma(auVar57,auVar115,ZEXT1632(auVar104));
          auVar104 = vfmadd213ps_fma(auVar118,auVar110,auVar119);
          auVar221 = vfnmadd231ps_fma(auVar117,auVar115,auVar124);
          auVar195 = vfnmadd213ps_fma(auVar59,auVar110,ZEXT1632(auVar105));
          auVar106 = vfnmadd213ps_fma(auVar60,auVar110,ZEXT1632(auVar103));
          auVar107 = vfnmadd231ps_fma(auVar119,auVar110,auVar118);
          auVar119 = vsubps_avx512vl(auVar123,ZEXT1632(auVar185));
          auVar118 = vsubps_avx(ZEXT1632(auVar109),ZEXT1632(auVar194));
          auVar116 = vsubps_avx(ZEXT1632(auVar104),ZEXT1632(auVar221));
          auVar61._4_4_ = auVar118._4_4_ * auVar221._4_4_;
          auVar61._0_4_ = auVar118._0_4_ * auVar221._0_4_;
          auVar61._8_4_ = auVar118._8_4_ * auVar221._8_4_;
          auVar61._12_4_ = auVar118._12_4_ * auVar221._12_4_;
          auVar61._16_4_ = auVar118._16_4_ * 0.0;
          auVar61._20_4_ = auVar118._20_4_ * 0.0;
          auVar61._24_4_ = auVar118._24_4_ * 0.0;
          auVar61._28_4_ = auVar124._28_4_;
          auVar105 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar194),auVar116);
          auVar62._4_4_ = auVar116._4_4_ * auVar185._4_4_;
          auVar62._0_4_ = auVar116._0_4_ * auVar185._0_4_;
          auVar62._8_4_ = auVar116._8_4_ * auVar185._8_4_;
          auVar62._12_4_ = auVar116._12_4_ * auVar185._12_4_;
          auVar62._16_4_ = auVar116._16_4_ * 0.0;
          auVar62._20_4_ = auVar116._20_4_ * 0.0;
          auVar62._24_4_ = auVar116._24_4_ * 0.0;
          auVar62._28_4_ = auVar116._28_4_;
          auVar103 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar221),auVar119);
          auVar63._4_4_ = auVar194._4_4_ * auVar119._4_4_;
          auVar63._0_4_ = auVar194._0_4_ * auVar119._0_4_;
          auVar63._8_4_ = auVar194._8_4_ * auVar119._8_4_;
          auVar63._12_4_ = auVar194._12_4_ * auVar119._12_4_;
          auVar63._16_4_ = auVar119._16_4_ * 0.0;
          auVar63._20_4_ = auVar119._20_4_ * 0.0;
          auVar63._24_4_ = auVar119._24_4_ * 0.0;
          auVar63._28_4_ = auVar119._28_4_;
          auVar184 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar185),auVar118);
          auVar118 = vfmadd231ps_avx512vl(ZEXT1632(auVar184),auVar122,ZEXT1632(auVar103));
          auVar118 = vfmadd231ps_avx512vl(auVar118,auVar122,ZEXT1632(auVar105));
          auVar112 = ZEXT1632(auVar108);
          uVar88 = vcmpps_avx512vl(auVar118,auVar112,2);
          bVar86 = (byte)uVar88;
          fVar152 = (float)((uint)(bVar86 & 1) * auVar102._0_4_ |
                           (uint)!(bool)(bVar86 & 1) * auVar195._0_4_);
          bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
          fVar154 = (float)((uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * auVar195._4_4_);
          bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
          fVar156 = (float)((uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * auVar195._8_4_);
          bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
          fVar158 = (float)((uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * auVar195._12_4_);
          auVar122 = ZEXT1632(CONCAT412(fVar158,CONCAT48(fVar156,CONCAT44(fVar154,fVar152))));
          fVar153 = (float)((uint)(bVar86 & 1) * auVar7._0_4_ |
                           (uint)!(bool)(bVar86 & 1) * auVar106._0_4_);
          bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
          fVar155 = (float)((uint)bVar12 * auVar7._4_4_ | (uint)!bVar12 * auVar106._4_4_);
          bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
          fVar157 = (float)((uint)bVar12 * auVar7._8_4_ | (uint)!bVar12 * auVar106._8_4_);
          bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
          fVar159 = (float)((uint)bVar12 * auVar7._12_4_ | (uint)!bVar12 * auVar106._12_4_);
          auVar120 = ZEXT1632(CONCAT412(fVar159,CONCAT48(fVar157,CONCAT44(fVar155,fVar153))));
          auVar143._0_4_ =
               (float)((uint)(bVar86 & 1) * auVar125._0_4_ |
                      (uint)!(bool)(bVar86 & 1) * auVar107._0_4_);
          bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
          auVar143._4_4_ = (float)((uint)bVar12 * auVar125._4_4_ | (uint)!bVar12 * auVar107._4_4_);
          bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
          auVar143._8_4_ = (float)((uint)bVar12 * auVar125._8_4_ | (uint)!bVar12 * auVar107._8_4_);
          bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
          auVar143._12_4_ =
               (float)((uint)bVar12 * auVar125._12_4_ | (uint)!bVar12 * auVar107._12_4_);
          fVar183 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar125._16_4_);
          auVar143._16_4_ = fVar183;
          fVar178 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar125._20_4_);
          auVar143._20_4_ = fVar178;
          fVar179 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar125._24_4_);
          auVar143._24_4_ = fVar179;
          iVar1 = (uint)(byte)(uVar88 >> 7) * auVar125._28_4_;
          auVar143._28_4_ = iVar1;
          auVar118 = vblendmps_avx512vl(ZEXT1632(auVar185),auVar123);
          auVar144._0_4_ =
               (uint)(bVar86 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar86 & 1) * auVar105._0_4_;
          bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
          auVar144._4_4_ = (uint)bVar12 * auVar118._4_4_ | (uint)!bVar12 * auVar105._4_4_;
          bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
          auVar144._8_4_ = (uint)bVar12 * auVar118._8_4_ | (uint)!bVar12 * auVar105._8_4_;
          bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
          auVar144._12_4_ = (uint)bVar12 * auVar118._12_4_ | (uint)!bVar12 * auVar105._12_4_;
          auVar144._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * auVar118._16_4_;
          auVar144._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * auVar118._20_4_;
          auVar144._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * auVar118._24_4_;
          auVar144._28_4_ = (uint)(byte)(uVar88 >> 7) * auVar118._28_4_;
          auVar118 = vblendmps_avx512vl(ZEXT1632(auVar194),ZEXT1632(auVar109));
          auVar145._0_4_ =
               (float)((uint)(bVar86 & 1) * auVar118._0_4_ |
                      (uint)!(bool)(bVar86 & 1) * auVar102._0_4_);
          bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
          auVar145._4_4_ = (float)((uint)bVar12 * auVar118._4_4_ | (uint)!bVar12 * auVar102._4_4_);
          bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
          auVar145._8_4_ = (float)((uint)bVar12 * auVar118._8_4_ | (uint)!bVar12 * auVar102._8_4_);
          bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
          auVar145._12_4_ =
               (float)((uint)bVar12 * auVar118._12_4_ | (uint)!bVar12 * auVar102._12_4_);
          fVar180 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar118._16_4_);
          auVar145._16_4_ = fVar180;
          fVar192 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar118._20_4_);
          auVar145._20_4_ = fVar192;
          fVar193 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar118._24_4_);
          auVar145._24_4_ = fVar193;
          auVar145._28_4_ = (uint)(byte)(uVar88 >> 7) * auVar118._28_4_;
          auVar118 = vblendmps_avx512vl(ZEXT1632(auVar221),ZEXT1632(auVar104));
          auVar146._0_4_ =
               (float)((uint)(bVar86 & 1) * auVar118._0_4_ |
                      (uint)!(bool)(bVar86 & 1) * auVar7._0_4_);
          bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
          auVar146._4_4_ = (float)((uint)bVar12 * auVar118._4_4_ | (uint)!bVar12 * auVar7._4_4_);
          bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
          auVar146._8_4_ = (float)((uint)bVar12 * auVar118._8_4_ | (uint)!bVar12 * auVar7._8_4_);
          bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
          auVar146._12_4_ = (float)((uint)bVar12 * auVar118._12_4_ | (uint)!bVar12 * auVar7._12_4_);
          fVar204 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar118._16_4_);
          auVar146._16_4_ = fVar204;
          fVar100 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar118._20_4_);
          auVar146._20_4_ = fVar100;
          fVar99 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar118._24_4_);
          auVar146._24_4_ = fVar99;
          iVar2 = (uint)(byte)(uVar88 >> 7) * auVar118._28_4_;
          auVar146._28_4_ = iVar2;
          auVar147._0_4_ =
               (uint)(bVar86 & 1) * (int)auVar185._0_4_ | (uint)!(bool)(bVar86 & 1) * auVar123._0_4_
          ;
          bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
          auVar147._4_4_ = (uint)bVar12 * (int)auVar185._4_4_ | (uint)!bVar12 * auVar123._4_4_;
          bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
          auVar147._8_4_ = (uint)bVar12 * (int)auVar185._8_4_ | (uint)!bVar12 * auVar123._8_4_;
          bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
          auVar147._12_4_ = (uint)bVar12 * (int)auVar185._12_4_ | (uint)!bVar12 * auVar123._12_4_;
          auVar147._16_4_ = (uint)!(bool)((byte)(uVar88 >> 4) & 1) * auVar123._16_4_;
          auVar147._20_4_ = (uint)!(bool)((byte)(uVar88 >> 5) & 1) * auVar123._20_4_;
          auVar147._24_4_ = (uint)!(bool)((byte)(uVar88 >> 6) & 1) * auVar123._24_4_;
          auVar147._28_4_ = (uint)!SUB81(uVar88 >> 7,0) * auVar123._28_4_;
          bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar88 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar88 >> 3) & 1);
          auVar123 = vsubps_avx512vl(auVar147,auVar122);
          auVar116 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar194._12_4_ |
                                                   (uint)!bVar16 * auVar109._12_4_,
                                                   CONCAT48((uint)bVar14 * (int)auVar194._8_4_ |
                                                            (uint)!bVar14 * auVar109._8_4_,
                                                            CONCAT44((uint)bVar12 *
                                                                     (int)auVar194._4_4_ |
                                                                     (uint)!bVar12 * auVar109._4_4_,
                                                                     (uint)(bVar86 & 1) *
                                                                     (int)auVar194._0_4_ |
                                                                     (uint)!(bool)(bVar86 & 1) *
                                                                     auVar109._0_4_)))),auVar120);
          auVar215 = ZEXT3264(auVar116);
          auVar125 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar221._12_4_ |
                                                   (uint)!bVar17 * auVar104._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar221._8_4_ |
                                                            (uint)!bVar15 * auVar104._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar221._4_4_ |
                                                                     (uint)!bVar13 * auVar104._4_4_,
                                                                     (uint)(bVar86 & 1) *
                                                                     (int)auVar221._0_4_ |
                                                                     (uint)!(bool)(bVar86 & 1) *
                                                                     auVar104._0_4_)))),auVar143);
          auVar124 = vsubps_avx(auVar122,auVar144);
          auVar217 = ZEXT3264(auVar124);
          auVar119 = vsubps_avx(auVar120,auVar145);
          auVar117 = vsubps_avx(auVar143,auVar146);
          auVar64._4_4_ = auVar125._4_4_ * fVar154;
          auVar64._0_4_ = auVar125._0_4_ * fVar152;
          auVar64._8_4_ = auVar125._8_4_ * fVar156;
          auVar64._12_4_ = auVar125._12_4_ * fVar158;
          auVar64._16_4_ = auVar125._16_4_ * 0.0;
          auVar64._20_4_ = auVar125._20_4_ * 0.0;
          auVar64._24_4_ = auVar125._24_4_ * 0.0;
          auVar64._28_4_ = 0;
          auVar109 = vfmsub231ps_fma(auVar64,auVar143,auVar123);
          auVar202._0_4_ = fVar153 * auVar123._0_4_;
          auVar202._4_4_ = fVar155 * auVar123._4_4_;
          auVar202._8_4_ = fVar157 * auVar123._8_4_;
          auVar202._12_4_ = fVar159 * auVar123._12_4_;
          auVar202._16_4_ = auVar123._16_4_ * 0.0;
          auVar202._20_4_ = auVar123._20_4_ * 0.0;
          auVar202._24_4_ = auVar123._24_4_ * 0.0;
          auVar202._28_4_ = 0;
          auVar104 = vfmsub231ps_fma(auVar202,auVar122,auVar116);
          auVar118 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar112,ZEXT1632(auVar109));
          auVar207._0_4_ = auVar116._0_4_ * auVar143._0_4_;
          auVar207._4_4_ = auVar116._4_4_ * auVar143._4_4_;
          auVar207._8_4_ = auVar116._8_4_ * auVar143._8_4_;
          auVar207._12_4_ = auVar116._12_4_ * auVar143._12_4_;
          auVar207._16_4_ = auVar116._16_4_ * fVar183;
          auVar207._20_4_ = auVar116._20_4_ * fVar178;
          auVar207._24_4_ = auVar116._24_4_ * fVar179;
          auVar207._28_4_ = 0;
          auVar109 = vfmsub231ps_fma(auVar207,auVar120,auVar125);
          auVar114 = vfmadd231ps_avx512vl(auVar118,auVar112,ZEXT1632(auVar109));
          auVar118 = vmulps_avx512vl(auVar117,auVar144);
          auVar118 = vfmsub231ps_avx512vl(auVar118,auVar124,auVar146);
          auVar65._4_4_ = auVar119._4_4_ * auVar146._4_4_;
          auVar65._0_4_ = auVar119._0_4_ * auVar146._0_4_;
          auVar65._8_4_ = auVar119._8_4_ * auVar146._8_4_;
          auVar65._12_4_ = auVar119._12_4_ * auVar146._12_4_;
          auVar65._16_4_ = auVar119._16_4_ * fVar204;
          auVar65._20_4_ = auVar119._20_4_ * fVar100;
          auVar65._24_4_ = auVar119._24_4_ * fVar99;
          auVar65._28_4_ = iVar2;
          auVar109 = vfmsub231ps_fma(auVar65,auVar145,auVar117);
          auVar208._0_4_ = auVar145._0_4_ * auVar124._0_4_;
          auVar208._4_4_ = auVar145._4_4_ * auVar124._4_4_;
          auVar208._8_4_ = auVar145._8_4_ * auVar124._8_4_;
          auVar208._12_4_ = auVar145._12_4_ * auVar124._12_4_;
          auVar208._16_4_ = fVar180 * auVar124._16_4_;
          auVar208._20_4_ = fVar192 * auVar124._20_4_;
          auVar208._24_4_ = fVar193 * auVar124._24_4_;
          auVar208._28_4_ = 0;
          auVar104 = vfmsub231ps_fma(auVar208,auVar119,auVar144);
          auVar118 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar112,auVar118);
          auVar111 = vfmadd231ps_avx512vl(auVar118,auVar112,ZEXT1632(auVar109));
          auVar209 = ZEXT3264(auVar111);
          auVar118 = vmaxps_avx(auVar114,auVar111);
          uVar181 = vcmpps_avx512vl(auVar118,auVar112,2);
          bVar97 = bVar97 & (byte)uVar181;
          if (bVar97 != 0) {
            auVar66._4_4_ = auVar117._4_4_ * auVar116._4_4_;
            auVar66._0_4_ = auVar117._0_4_ * auVar116._0_4_;
            auVar66._8_4_ = auVar117._8_4_ * auVar116._8_4_;
            auVar66._12_4_ = auVar117._12_4_ * auVar116._12_4_;
            auVar66._16_4_ = auVar117._16_4_ * auVar116._16_4_;
            auVar66._20_4_ = auVar117._20_4_ * auVar116._20_4_;
            auVar66._24_4_ = auVar117._24_4_ * auVar116._24_4_;
            auVar66._28_4_ = auVar118._28_4_;
            auVar103 = vfmsub231ps_fma(auVar66,auVar119,auVar125);
            auVar67._4_4_ = auVar125._4_4_ * auVar124._4_4_;
            auVar67._0_4_ = auVar125._0_4_ * auVar124._0_4_;
            auVar67._8_4_ = auVar125._8_4_ * auVar124._8_4_;
            auVar67._12_4_ = auVar125._12_4_ * auVar124._12_4_;
            auVar67._16_4_ = auVar125._16_4_ * auVar124._16_4_;
            auVar67._20_4_ = auVar125._20_4_ * auVar124._20_4_;
            auVar67._24_4_ = auVar125._24_4_ * auVar124._24_4_;
            auVar67._28_4_ = auVar125._28_4_;
            auVar105 = vfmsub231ps_fma(auVar67,auVar123,auVar117);
            auVar68._4_4_ = auVar119._4_4_ * auVar123._4_4_;
            auVar68._0_4_ = auVar119._0_4_ * auVar123._0_4_;
            auVar68._8_4_ = auVar119._8_4_ * auVar123._8_4_;
            auVar68._12_4_ = auVar119._12_4_ * auVar123._12_4_;
            auVar68._16_4_ = auVar119._16_4_ * auVar123._16_4_;
            auVar68._20_4_ = auVar119._20_4_ * auVar123._20_4_;
            auVar68._24_4_ = auVar119._24_4_ * auVar123._24_4_;
            auVar68._28_4_ = auVar119._28_4_;
            auVar102 = vfmsub231ps_fma(auVar68,auVar124,auVar116);
            auVar109 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar105),ZEXT1632(auVar102));
            auVar104 = vfmadd231ps_fma(ZEXT1632(auVar109),ZEXT1632(auVar103),
                                       ZEXT1232(ZEXT412(0)) << 0x20);
            auVar118 = vrcp14ps_avx512vl(ZEXT1632(auVar104));
            auVar217 = ZEXT3264(auVar118);
            auVar33._8_4_ = 0x3f800000;
            auVar33._0_8_ = 0x3f8000003f800000;
            auVar33._12_4_ = 0x3f800000;
            auVar33._16_4_ = 0x3f800000;
            auVar33._20_4_ = 0x3f800000;
            auVar33._24_4_ = 0x3f800000;
            auVar33._28_4_ = 0x3f800000;
            auVar116 = vfnmadd213ps_avx512vl(auVar118,ZEXT1632(auVar104),auVar33);
            auVar109 = vfmadd132ps_fma(auVar116,auVar118,auVar118);
            auVar215 = ZEXT1664(auVar109);
            auVar69._4_4_ = auVar102._4_4_ * auVar143._4_4_;
            auVar69._0_4_ = auVar102._0_4_ * auVar143._0_4_;
            auVar69._8_4_ = auVar102._8_4_ * auVar143._8_4_;
            auVar69._12_4_ = auVar102._12_4_ * auVar143._12_4_;
            auVar69._16_4_ = fVar183 * 0.0;
            auVar69._20_4_ = fVar178 * 0.0;
            auVar69._24_4_ = fVar179 * 0.0;
            auVar69._28_4_ = iVar1;
            auVar105 = vfmadd231ps_fma(auVar69,auVar120,ZEXT1632(auVar105));
            auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar122,ZEXT1632(auVar103));
            fVar183 = auVar109._0_4_;
            fVar178 = auVar109._4_4_;
            fVar179 = auVar109._8_4_;
            fVar180 = auVar109._12_4_;
            local_5a0 = ZEXT1632(CONCAT412(auVar105._12_4_ * fVar180,
                                           CONCAT48(auVar105._8_4_ * fVar179,
                                                    CONCAT44(auVar105._4_4_ * fVar178,
                                                             auVar105._0_4_ * fVar183))));
            auVar220 = ZEXT3264(local_5a0);
            auVar85._4_4_ = uStack_75c;
            auVar85._0_4_ = local_760;
            auVar85._8_4_ = uStack_758;
            auVar85._12_4_ = uStack_754;
            auVar85._16_4_ = uStack_750;
            auVar85._20_4_ = uStack_74c;
            auVar85._24_4_ = uStack_748;
            auVar85._28_4_ = uStack_744;
            uVar181 = vcmpps_avx512vl(local_5a0,auVar85,0xd);
            uVar161 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar34._4_4_ = uVar161;
            auVar34._0_4_ = uVar161;
            auVar34._8_4_ = uVar161;
            auVar34._12_4_ = uVar161;
            auVar34._16_4_ = uVar161;
            auVar34._20_4_ = uVar161;
            auVar34._24_4_ = uVar161;
            auVar34._28_4_ = uVar161;
            uVar27 = vcmpps_avx512vl(local_5a0,auVar34,2);
            bVar97 = (byte)uVar181 & (byte)uVar27 & bVar97;
            if (bVar97 != 0) {
              uVar98 = vcmpps_avx512vl(ZEXT1632(auVar104),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar98 = bVar97 & uVar98;
              if ((char)uVar98 != '\0') {
                fVar192 = auVar114._0_4_ * fVar183;
                fVar193 = auVar114._4_4_ * fVar178;
                auVar70._4_4_ = fVar193;
                auVar70._0_4_ = fVar192;
                fVar204 = auVar114._8_4_ * fVar179;
                auVar70._8_4_ = fVar204;
                fVar99 = auVar114._12_4_ * fVar180;
                auVar70._12_4_ = fVar99;
                fVar100 = auVar114._16_4_ * 0.0;
                auVar70._16_4_ = fVar100;
                fVar152 = auVar114._20_4_ * 0.0;
                auVar70._20_4_ = fVar152;
                fVar153 = auVar114._24_4_ * 0.0;
                auVar70._24_4_ = fVar153;
                auVar70._28_4_ = auVar114._28_4_;
                auVar191._8_4_ = 0x3f800000;
                auVar191._0_8_ = 0x3f8000003f800000;
                auVar191._12_4_ = 0x3f800000;
                auVar191._16_4_ = 0x3f800000;
                auVar191._20_4_ = 0x3f800000;
                auVar191._24_4_ = 0x3f800000;
                auVar191._28_4_ = 0x3f800000;
                auVar118 = vsubps_avx(auVar191,auVar70);
                local_5e0._0_4_ =
                     (float)((uint)(bVar86 & 1) * (int)fVar192 |
                            (uint)!(bool)(bVar86 & 1) * auVar118._0_4_);
                bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
                local_5e0._4_4_ =
                     (float)((uint)bVar12 * (int)fVar193 | (uint)!bVar12 * auVar118._4_4_);
                bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
                local_5e0._8_4_ =
                     (float)((uint)bVar12 * (int)fVar204 | (uint)!bVar12 * auVar118._8_4_);
                bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
                local_5e0._12_4_ =
                     (float)((uint)bVar12 * (int)fVar99 | (uint)!bVar12 * auVar118._12_4_);
                bVar12 = (bool)((byte)(uVar88 >> 4) & 1);
                local_5e0._16_4_ =
                     (float)((uint)bVar12 * (int)fVar100 | (uint)!bVar12 * auVar118._16_4_);
                bVar12 = (bool)((byte)(uVar88 >> 5) & 1);
                local_5e0._20_4_ =
                     (float)((uint)bVar12 * (int)fVar152 | (uint)!bVar12 * auVar118._20_4_);
                bVar12 = (bool)((byte)(uVar88 >> 6) & 1);
                local_5e0._24_4_ =
                     (float)((uint)bVar12 * (int)fVar153 | (uint)!bVar12 * auVar118._24_4_);
                bVar12 = SUB81(uVar88 >> 7,0);
                local_5e0._28_4_ =
                     (float)((uint)bVar12 * auVar114._28_4_ | (uint)!bVar12 * auVar118._28_4_);
                auVar118 = vsubps_avx(auVar110,auVar115);
                auVar109 = vfmadd213ps_fma(auVar118,local_5e0,auVar115);
                uVar161 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
                auVar35._4_4_ = uVar161;
                auVar35._0_4_ = uVar161;
                auVar35._8_4_ = uVar161;
                auVar35._12_4_ = uVar161;
                auVar35._16_4_ = uVar161;
                auVar35._20_4_ = uVar161;
                auVar35._24_4_ = uVar161;
                auVar35._28_4_ = uVar161;
                auVar118 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar109._12_4_ + auVar109._12_4_,
                                                              CONCAT48(auVar109._8_4_ +
                                                                       auVar109._8_4_,
                                                                       CONCAT44(auVar109._4_4_ +
                                                                                auVar109._4_4_,
                                                                                auVar109._0_4_ +
                                                                                auVar109._0_4_)))),
                                           auVar35);
                uVar91 = vcmpps_avx512vl(local_5a0,auVar118,6);
                uVar98 = uVar98 & uVar91;
                bVar97 = (byte)uVar98;
                if (bVar97 != 0) {
                  auVar182._0_4_ = auVar111._0_4_ * fVar183;
                  auVar182._4_4_ = auVar111._4_4_ * fVar178;
                  auVar182._8_4_ = auVar111._8_4_ * fVar179;
                  auVar182._12_4_ = auVar111._12_4_ * fVar180;
                  auVar182._16_4_ = auVar111._16_4_ * 0.0;
                  auVar182._20_4_ = auVar111._20_4_ * 0.0;
                  auVar182._24_4_ = auVar111._24_4_ * 0.0;
                  auVar182._28_4_ = 0;
                  auVar203._8_4_ = 0x3f800000;
                  auVar203._0_8_ = 0x3f8000003f800000;
                  auVar203._12_4_ = 0x3f800000;
                  auVar203._16_4_ = 0x3f800000;
                  auVar203._20_4_ = 0x3f800000;
                  auVar203._24_4_ = 0x3f800000;
                  auVar203._28_4_ = 0x3f800000;
                  auVar118 = vsubps_avx(auVar203,auVar182);
                  auVar148._0_4_ =
                       (uint)(bVar86 & 1) * (int)auVar182._0_4_ |
                       (uint)!(bool)(bVar86 & 1) * auVar118._0_4_;
                  bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
                  auVar148._4_4_ =
                       (uint)bVar12 * (int)auVar182._4_4_ | (uint)!bVar12 * auVar118._4_4_;
                  bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
                  auVar148._8_4_ =
                       (uint)bVar12 * (int)auVar182._8_4_ | (uint)!bVar12 * auVar118._8_4_;
                  bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
                  auVar148._12_4_ =
                       (uint)bVar12 * (int)auVar182._12_4_ | (uint)!bVar12 * auVar118._12_4_;
                  bVar12 = (bool)((byte)(uVar88 >> 4) & 1);
                  auVar148._16_4_ =
                       (uint)bVar12 * (int)auVar182._16_4_ | (uint)!bVar12 * auVar118._16_4_;
                  bVar12 = (bool)((byte)(uVar88 >> 5) & 1);
                  auVar148._20_4_ =
                       (uint)bVar12 * (int)auVar182._20_4_ | (uint)!bVar12 * auVar118._20_4_;
                  bVar12 = (bool)((byte)(uVar88 >> 6) & 1);
                  auVar148._24_4_ =
                       (uint)bVar12 * (int)auVar182._24_4_ | (uint)!bVar12 * auVar118._24_4_;
                  auVar148._28_4_ = (uint)!SUB81(uVar88 >> 7,0) * auVar118._28_4_;
                  auVar36._8_4_ = 0x40000000;
                  auVar36._0_8_ = 0x4000000040000000;
                  auVar36._12_4_ = 0x40000000;
                  auVar36._16_4_ = 0x40000000;
                  auVar36._20_4_ = 0x40000000;
                  auVar36._24_4_ = 0x40000000;
                  auVar36._28_4_ = 0x40000000;
                  local_5c0 = vfmsub132ps_avx512vl(auVar148,auVar203,auVar36);
                  local_580 = (undefined4)lVar96;
                  auVar217 = ZEXT1664(auVar101);
                  local_560 = local_850;
                  uStack_558 = uStack_848;
                  local_550 = local_860;
                  uStack_548 = uStack_858;
                  local_540 = local_870;
                  uStack_538 = uStack_868;
                  pGVar93 = (context->scene->geometries).items[uVar8].ptr;
                  if ((pGVar93->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                    auVar109 = vcvtsi2ss_avx512f(auVar108,local_580);
                    fVar183 = auVar109._0_4_;
                    local_520[0] = (fVar183 + local_5e0._0_4_ + 0.0) * local_440;
                    local_520[1] = (fVar183 + local_5e0._4_4_ + 1.0) * fStack_43c;
                    local_520[2] = (fVar183 + local_5e0._8_4_ + 2.0) * fStack_438;
                    local_520[3] = (fVar183 + local_5e0._12_4_ + 3.0) * fStack_434;
                    fStack_510 = (fVar183 + local_5e0._16_4_ + 4.0) * fStack_430;
                    fStack_50c = (fVar183 + local_5e0._20_4_ + 5.0) * fStack_42c;
                    fStack_508 = (fVar183 + local_5e0._24_4_ + 6.0) * fStack_428;
                    fStack_504 = fVar183 + local_5e0._28_4_ + 7.0;
                    local_500 = local_5c0;
                    local_4e0 = local_5a0;
                    auVar169._8_4_ = 0x7f800000;
                    auVar169._0_8_ = 0x7f8000007f800000;
                    auVar169._12_4_ = 0x7f800000;
                    auVar169._16_4_ = 0x7f800000;
                    auVar169._20_4_ = 0x7f800000;
                    auVar169._24_4_ = 0x7f800000;
                    auVar169._28_4_ = 0x7f800000;
                    auVar118 = vblendmps_avx512vl(auVar169,local_5a0);
                    auVar149._0_4_ =
                         (uint)(bVar97 & 1) * auVar118._0_4_ |
                         (uint)!(bool)(bVar97 & 1) * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar98 >> 1) & 1);
                    auVar149._4_4_ = (uint)bVar12 * auVar118._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar98 >> 2) & 1);
                    auVar149._8_4_ = (uint)bVar12 * auVar118._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar98 >> 3) & 1);
                    auVar149._12_4_ = (uint)bVar12 * auVar118._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar98 >> 4) & 1);
                    auVar149._16_4_ = (uint)bVar12 * auVar118._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar98 >> 5) & 1);
                    auVar149._20_4_ = (uint)bVar12 * auVar118._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar98 >> 6) & 1);
                    auVar149._24_4_ = (uint)bVar12 * auVar118._24_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = SUB81(uVar98 >> 7,0);
                    auVar149._28_4_ = (uint)bVar12 * auVar118._28_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar118 = vshufps_avx(auVar149,auVar149,0xb1);
                    auVar118 = vminps_avx(auVar149,auVar118);
                    auVar116 = vshufpd_avx(auVar118,auVar118,5);
                    auVar118 = vminps_avx(auVar118,auVar116);
                    auVar116 = vpermpd_avx2(auVar118,0x4e);
                    auVar118 = vminps_avx(auVar118,auVar116);
                    uVar181 = vcmpps_avx512vl(auVar149,auVar118,0);
                    uVar89 = (uint)uVar98;
                    if ((bVar97 & (byte)uVar181) != 0) {
                      uVar89 = (uint)(bVar97 & (byte)uVar181);
                    }
                    uVar90 = 0;
                    for (; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x80000000) {
                      uVar90 = uVar90 + 1;
                    }
                    uVar88 = (ulong)uVar90;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar93->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_460 = vmovdqa64_avx512vl(auVar174._0_32_);
                      local_810 = ZEXT416(*(uint *)(ray + k * 4 + 0x200));
                      local_7c0._0_8_ = pGVar93;
                      local_7e8 = lVar92;
                      local_7a0 = local_5a0;
                      local_57c = iVar9;
                      local_570 = auVar101;
                      do {
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_520[uVar88]));
                        local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_500 + uVar88 * 4)))
                        ;
                        *(undefined4 *)(ray + k * 4 + 0x200) =
                             *(undefined4 *)(local_4e0 + uVar88 * 4);
                        local_840.context = context->user;
                        fVar180 = local_200._0_4_;
                        fVar178 = 1.0 - fVar180;
                        fVar183 = fVar178 * fVar178 * -3.0;
                        auVar109 = vfmadd231ss_fma(ZEXT416((uint)(fVar178 * fVar178)),
                                                   ZEXT416((uint)(fVar180 * fVar178)),
                                                   ZEXT416(0xc0000000));
                        auVar104 = vfmsub132ss_fma(ZEXT416((uint)(fVar180 * fVar178)),
                                                   ZEXT416((uint)(fVar180 * fVar180)),
                                                   ZEXT416(0x40000000));
                        fVar178 = auVar109._0_4_ * 3.0;
                        fVar179 = auVar104._0_4_ * 3.0;
                        fVar180 = fVar180 * fVar180 * 3.0;
                        auVar212._0_4_ = fVar180 * fVar160;
                        auVar212._4_4_ = fVar180 * fVar175;
                        auVar212._8_4_ = fVar180 * fVar176;
                        auVar212._12_4_ = fVar180 * fVar177;
                        auVar162._4_4_ = fVar179;
                        auVar162._0_4_ = fVar179;
                        auVar162._8_4_ = fVar179;
                        auVar162._12_4_ = fVar179;
                        auVar109 = vfmadd132ps_fma(auVar162,auVar212,auVar6);
                        auVar198._4_4_ = fVar178;
                        auVar198._0_4_ = fVar178;
                        auVar198._8_4_ = fVar178;
                        auVar198._12_4_ = fVar178;
                        auVar109 = vfmadd132ps_fma(auVar198,auVar109,auVar26);
                        auVar163._4_4_ = fVar183;
                        auVar163._0_4_ = fVar183;
                        auVar163._8_4_ = fVar183;
                        auVar163._12_4_ = fVar183;
                        auVar109 = vfmadd213ps_fma(auVar163,auVar101,auVar109);
                        auVar174 = vbroadcastss_avx512f(auVar109);
                        auVar230 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar209 = vpermps_avx512f(auVar230,ZEXT1664(auVar109));
                        auVar215 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar215,ZEXT1664(auVar109));
                        local_2c0[0] = (RTCHitN)auVar174[0];
                        local_2c0[1] = (RTCHitN)auVar174[1];
                        local_2c0[2] = (RTCHitN)auVar174[2];
                        local_2c0[3] = (RTCHitN)auVar174[3];
                        local_2c0[4] = (RTCHitN)auVar174[4];
                        local_2c0[5] = (RTCHitN)auVar174[5];
                        local_2c0[6] = (RTCHitN)auVar174[6];
                        local_2c0[7] = (RTCHitN)auVar174[7];
                        local_2c0[8] = (RTCHitN)auVar174[8];
                        local_2c0[9] = (RTCHitN)auVar174[9];
                        local_2c0[10] = (RTCHitN)auVar174[10];
                        local_2c0[0xb] = (RTCHitN)auVar174[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar174[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar174[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar174[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar174[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar174[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar174[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar174[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar174[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar174[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar174[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar174[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar174[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar174[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar174[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar174[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar174[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar174[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar174[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar174[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar174[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar174[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar174[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar174[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar174[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar174[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar174[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar174[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar174[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar174[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar174[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar174[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar174[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar174[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar174[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar174[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar174[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar174[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar174[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar174[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar174[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar174[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar174[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar174[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar174[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar174[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar174[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar174[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar174[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar174[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar174[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar174[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar174[0x3f];
                        local_280 = auVar209;
                        local_180 = local_340._0_8_;
                        uStack_178 = local_340._8_8_;
                        uStack_170 = local_340._16_8_;
                        uStack_168 = local_340._24_8_;
                        uStack_160 = local_340._32_8_;
                        uStack_158 = local_340._40_8_;
                        uStack_150 = local_340._48_8_;
                        uStack_148 = local_340._56_8_;
                        auVar174 = vmovdqa64_avx512f(local_300);
                        local_140 = vmovdqa64_avx512f(auVar174);
                        auVar118 = vpcmpeqd_avx2(auVar174._0_32_,auVar174._0_32_);
                        local_7f0[3] = auVar118;
                        local_7f0[2] = auVar118;
                        local_7f0[1] = auVar118;
                        *local_7f0 = auVar118;
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_840.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_840.context)->instPrimID[0]))
                        ;
                        auVar174 = vmovdqa64_avx512f(local_380);
                        local_740 = vmovdqa64_avx512f(auVar174);
                        local_840.valid = (int *)local_740;
                        local_840.geometryUserPtr = pGVar93->userPtr;
                        local_840.hit = local_2c0;
                        local_840.N = 0x10;
                        local_840.ray = (RTCRayN *)ray;
                        if (pGVar93->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar209 = ZEXT1664(auVar209._0_16_);
                          auVar215 = ZEXT1664(auVar215._0_16_);
                          (*pGVar93->intersectionFilterN)(&local_840);
                          auVar220 = ZEXT3264(local_7a0);
                          auVar174 = vmovdqa64_avx512f(local_740);
                          pGVar93 = (Geometry *)local_7c0._0_8_;
                        }
                        uVar181 = vptestmd_avx512f(auVar174,auVar174);
                        if ((short)uVar181 == 0) {
LAB_019bbf58:
                          *(undefined4 *)(ray + k * 4 + 0x200) = local_810._0_4_;
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar93->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar209 = ZEXT1664(auVar209._0_16_);
                            auVar215 = ZEXT1664(auVar215._0_16_);
                            (*p_Var11)(&local_840);
                            auVar220 = ZEXT3264(local_7a0);
                            auVar174 = vmovdqa64_avx512f(local_740);
                            pGVar93 = (Geometry *)local_7c0._0_8_;
                          }
                          uVar91 = vptestmd_avx512f(auVar174,auVar174);
                          if ((short)uVar91 == 0) goto LAB_019bbf58;
                          iVar1 = *(int *)(local_840.hit + 4);
                          iVar2 = *(int *)(local_840.hit + 8);
                          iVar71 = *(int *)(local_840.hit + 0xc);
                          iVar72 = *(int *)(local_840.hit + 0x10);
                          iVar73 = *(int *)(local_840.hit + 0x14);
                          iVar74 = *(int *)(local_840.hit + 0x18);
                          iVar75 = *(int *)(local_840.hit + 0x1c);
                          iVar76 = *(int *)(local_840.hit + 0x20);
                          iVar77 = *(int *)(local_840.hit + 0x24);
                          iVar78 = *(int *)(local_840.hit + 0x28);
                          iVar79 = *(int *)(local_840.hit + 0x2c);
                          iVar80 = *(int *)(local_840.hit + 0x30);
                          iVar81 = *(int *)(local_840.hit + 0x34);
                          iVar82 = *(int *)(local_840.hit + 0x38);
                          iVar83 = *(int *)(local_840.hit + 0x3c);
                          bVar97 = (byte)uVar91;
                          bVar12 = (bool)((byte)(uVar91 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar91 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar91 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar91 >> 6) & 1);
                          bVar18 = (bool)((byte)(uVar91 >> 7) & 1);
                          bVar86 = (byte)(uVar91 >> 8);
                          bVar19 = (bool)((byte)(uVar91 >> 9) & 1);
                          bVar20 = (bool)((byte)(uVar91 >> 10) & 1);
                          bVar21 = (bool)((byte)(uVar91 >> 0xb) & 1);
                          bVar22 = (bool)((byte)(uVar91 >> 0xc) & 1);
                          bVar23 = (bool)((byte)(uVar91 >> 0xd) & 1);
                          bVar24 = (bool)((byte)(uVar91 >> 0xe) & 1);
                          bVar25 = SUB81(uVar91 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x300) =
                               (uint)(bVar97 & 1) * *(int *)local_840.hit |
                               (uint)!(bool)(bVar97 & 1) * *(int *)(local_840.ray + 0x300);
                          *(uint *)(local_840.ray + 0x304) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_840.ray + 0x304);
                          *(uint *)(local_840.ray + 0x308) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_840.ray + 0x308);
                          *(uint *)(local_840.ray + 0x30c) =
                               (uint)bVar14 * iVar71 |
                               (uint)!bVar14 * *(int *)(local_840.ray + 0x30c);
                          *(uint *)(local_840.ray + 0x310) =
                               (uint)bVar15 * iVar72 |
                               (uint)!bVar15 * *(int *)(local_840.ray + 0x310);
                          *(uint *)(local_840.ray + 0x314) =
                               (uint)bVar16 * iVar73 |
                               (uint)!bVar16 * *(int *)(local_840.ray + 0x314);
                          *(uint *)(local_840.ray + 0x318) =
                               (uint)bVar17 * iVar74 |
                               (uint)!bVar17 * *(int *)(local_840.ray + 0x318);
                          *(uint *)(local_840.ray + 0x31c) =
                               (uint)bVar18 * iVar75 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x31c);
                          *(uint *)(local_840.ray + 800) =
                               (uint)(bVar86 & 1) * iVar76 |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_840.ray + 800);
                          *(uint *)(local_840.ray + 0x324) =
                               (uint)bVar19 * iVar77 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x324);
                          *(uint *)(local_840.ray + 0x328) =
                               (uint)bVar20 * iVar78 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x328);
                          *(uint *)(local_840.ray + 0x32c) =
                               (uint)bVar21 * iVar79 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x32c);
                          *(uint *)(local_840.ray + 0x330) =
                               (uint)bVar22 * iVar80 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x330);
                          *(uint *)(local_840.ray + 0x334) =
                               (uint)bVar23 * iVar81 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x334);
                          *(uint *)(local_840.ray + 0x338) =
                               (uint)bVar24 * iVar82 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x338);
                          *(uint *)(local_840.ray + 0x33c) =
                               (uint)bVar25 * iVar83 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x33c);
                          iVar1 = *(int *)(local_840.hit + 0x44);
                          iVar2 = *(int *)(local_840.hit + 0x48);
                          iVar71 = *(int *)(local_840.hit + 0x4c);
                          iVar72 = *(int *)(local_840.hit + 0x50);
                          iVar73 = *(int *)(local_840.hit + 0x54);
                          iVar74 = *(int *)(local_840.hit + 0x58);
                          iVar75 = *(int *)(local_840.hit + 0x5c);
                          iVar76 = *(int *)(local_840.hit + 0x60);
                          iVar77 = *(int *)(local_840.hit + 100);
                          iVar78 = *(int *)(local_840.hit + 0x68);
                          iVar79 = *(int *)(local_840.hit + 0x6c);
                          iVar80 = *(int *)(local_840.hit + 0x70);
                          iVar81 = *(int *)(local_840.hit + 0x74);
                          iVar82 = *(int *)(local_840.hit + 0x78);
                          iVar83 = *(int *)(local_840.hit + 0x7c);
                          bVar12 = (bool)((byte)(uVar91 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar91 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar91 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar91 >> 6) & 1);
                          bVar18 = (bool)((byte)(uVar91 >> 7) & 1);
                          bVar19 = (bool)((byte)(uVar91 >> 9) & 1);
                          bVar20 = (bool)((byte)(uVar91 >> 10) & 1);
                          bVar21 = (bool)((byte)(uVar91 >> 0xb) & 1);
                          bVar22 = (bool)((byte)(uVar91 >> 0xc) & 1);
                          bVar23 = (bool)((byte)(uVar91 >> 0xd) & 1);
                          bVar24 = (bool)((byte)(uVar91 >> 0xe) & 1);
                          bVar25 = SUB81(uVar91 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x340) =
                               (uint)(bVar97 & 1) * *(int *)(local_840.hit + 0x40) |
                               (uint)!(bool)(bVar97 & 1) * *(int *)(local_840.ray + 0x340);
                          *(uint *)(local_840.ray + 0x344) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_840.ray + 0x344);
                          *(uint *)(local_840.ray + 0x348) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_840.ray + 0x348);
                          *(uint *)(local_840.ray + 0x34c) =
                               (uint)bVar14 * iVar71 |
                               (uint)!bVar14 * *(int *)(local_840.ray + 0x34c);
                          *(uint *)(local_840.ray + 0x350) =
                               (uint)bVar15 * iVar72 |
                               (uint)!bVar15 * *(int *)(local_840.ray + 0x350);
                          *(uint *)(local_840.ray + 0x354) =
                               (uint)bVar16 * iVar73 |
                               (uint)!bVar16 * *(int *)(local_840.ray + 0x354);
                          *(uint *)(local_840.ray + 0x358) =
                               (uint)bVar17 * iVar74 |
                               (uint)!bVar17 * *(int *)(local_840.ray + 0x358);
                          *(uint *)(local_840.ray + 0x35c) =
                               (uint)bVar18 * iVar75 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x35c);
                          *(uint *)(local_840.ray + 0x360) =
                               (uint)(bVar86 & 1) * iVar76 |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_840.ray + 0x360);
                          *(uint *)(local_840.ray + 0x364) =
                               (uint)bVar19 * iVar77 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x364);
                          *(uint *)(local_840.ray + 0x368) =
                               (uint)bVar20 * iVar78 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x368);
                          *(uint *)(local_840.ray + 0x36c) =
                               (uint)bVar21 * iVar79 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x36c);
                          *(uint *)(local_840.ray + 0x370) =
                               (uint)bVar22 * iVar80 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x370);
                          *(uint *)(local_840.ray + 0x374) =
                               (uint)bVar23 * iVar81 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x374);
                          *(uint *)(local_840.ray + 0x378) =
                               (uint)bVar24 * iVar82 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x378);
                          *(uint *)(local_840.ray + 0x37c) =
                               (uint)bVar25 * iVar83 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x37c);
                          iVar1 = *(int *)(local_840.hit + 0x84);
                          iVar2 = *(int *)(local_840.hit + 0x88);
                          iVar71 = *(int *)(local_840.hit + 0x8c);
                          iVar72 = *(int *)(local_840.hit + 0x90);
                          iVar73 = *(int *)(local_840.hit + 0x94);
                          iVar74 = *(int *)(local_840.hit + 0x98);
                          iVar75 = *(int *)(local_840.hit + 0x9c);
                          iVar76 = *(int *)(local_840.hit + 0xa0);
                          iVar77 = *(int *)(local_840.hit + 0xa4);
                          iVar78 = *(int *)(local_840.hit + 0xa8);
                          iVar79 = *(int *)(local_840.hit + 0xac);
                          iVar80 = *(int *)(local_840.hit + 0xb0);
                          iVar81 = *(int *)(local_840.hit + 0xb4);
                          iVar82 = *(int *)(local_840.hit + 0xb8);
                          iVar83 = *(int *)(local_840.hit + 0xbc);
                          bVar12 = (bool)((byte)(uVar91 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar91 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar91 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar91 >> 6) & 1);
                          bVar18 = (bool)((byte)(uVar91 >> 7) & 1);
                          bVar19 = (bool)((byte)(uVar91 >> 9) & 1);
                          bVar20 = (bool)((byte)(uVar91 >> 10) & 1);
                          bVar21 = (bool)((byte)(uVar91 >> 0xb) & 1);
                          bVar22 = (bool)((byte)(uVar91 >> 0xc) & 1);
                          bVar23 = (bool)((byte)(uVar91 >> 0xd) & 1);
                          bVar24 = (bool)((byte)(uVar91 >> 0xe) & 1);
                          bVar25 = SUB81(uVar91 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x380) =
                               (uint)(bVar97 & 1) * *(int *)(local_840.hit + 0x80) |
                               (uint)!(bool)(bVar97 & 1) * *(int *)(local_840.ray + 0x380);
                          *(uint *)(local_840.ray + 900) =
                               (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_840.ray + 900);
                          *(uint *)(local_840.ray + 0x388) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_840.ray + 0x388);
                          *(uint *)(local_840.ray + 0x38c) =
                               (uint)bVar14 * iVar71 |
                               (uint)!bVar14 * *(int *)(local_840.ray + 0x38c);
                          *(uint *)(local_840.ray + 0x390) =
                               (uint)bVar15 * iVar72 |
                               (uint)!bVar15 * *(int *)(local_840.ray + 0x390);
                          *(uint *)(local_840.ray + 0x394) =
                               (uint)bVar16 * iVar73 |
                               (uint)!bVar16 * *(int *)(local_840.ray + 0x394);
                          *(uint *)(local_840.ray + 0x398) =
                               (uint)bVar17 * iVar74 |
                               (uint)!bVar17 * *(int *)(local_840.ray + 0x398);
                          *(uint *)(local_840.ray + 0x39c) =
                               (uint)bVar18 * iVar75 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x39c);
                          *(uint *)(local_840.ray + 0x3a0) =
                               (uint)(bVar86 & 1) * iVar76 |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_840.ray + 0x3a0);
                          *(uint *)(local_840.ray + 0x3a4) =
                               (uint)bVar19 * iVar77 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x3a4);
                          *(uint *)(local_840.ray + 0x3a8) =
                               (uint)bVar20 * iVar78 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x3a8);
                          *(uint *)(local_840.ray + 0x3ac) =
                               (uint)bVar21 * iVar79 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x3ac);
                          *(uint *)(local_840.ray + 0x3b0) =
                               (uint)bVar22 * iVar80 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x3b0);
                          *(uint *)(local_840.ray + 0x3b4) =
                               (uint)bVar23 * iVar81 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x3b4);
                          *(uint *)(local_840.ray + 0x3b8) =
                               (uint)bVar24 * iVar82 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x3b8);
                          *(uint *)(local_840.ray + 0x3bc) =
                               (uint)bVar25 * iVar83 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x3bc);
                          iVar1 = *(int *)(local_840.hit + 0xc4);
                          iVar2 = *(int *)(local_840.hit + 200);
                          iVar71 = *(int *)(local_840.hit + 0xcc);
                          iVar72 = *(int *)(local_840.hit + 0xd0);
                          iVar73 = *(int *)(local_840.hit + 0xd4);
                          iVar74 = *(int *)(local_840.hit + 0xd8);
                          iVar75 = *(int *)(local_840.hit + 0xdc);
                          iVar76 = *(int *)(local_840.hit + 0xe0);
                          iVar77 = *(int *)(local_840.hit + 0xe4);
                          iVar78 = *(int *)(local_840.hit + 0xe8);
                          iVar79 = *(int *)(local_840.hit + 0xec);
                          iVar80 = *(int *)(local_840.hit + 0xf0);
                          iVar81 = *(int *)(local_840.hit + 0xf4);
                          iVar82 = *(int *)(local_840.hit + 0xf8);
                          iVar83 = *(int *)(local_840.hit + 0xfc);
                          bVar12 = (bool)((byte)(uVar91 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar91 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar91 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar91 >> 6) & 1);
                          bVar18 = (bool)((byte)(uVar91 >> 7) & 1);
                          bVar19 = (bool)((byte)(uVar91 >> 9) & 1);
                          bVar20 = (bool)((byte)(uVar91 >> 10) & 1);
                          bVar21 = (bool)((byte)(uVar91 >> 0xb) & 1);
                          bVar22 = (bool)((byte)(uVar91 >> 0xc) & 1);
                          bVar23 = (bool)((byte)(uVar91 >> 0xd) & 1);
                          bVar24 = (bool)((byte)(uVar91 >> 0xe) & 1);
                          bVar25 = SUB81(uVar91 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x3c0) =
                               (uint)(bVar97 & 1) * *(int *)(local_840.hit + 0xc0) |
                               (uint)!(bool)(bVar97 & 1) * *(int *)(local_840.ray + 0x3c0);
                          *(uint *)(local_840.ray + 0x3c4) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_840.ray + 0x3c4);
                          *(uint *)(local_840.ray + 0x3c8) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_840.ray + 0x3c8);
                          *(uint *)(local_840.ray + 0x3cc) =
                               (uint)bVar14 * iVar71 |
                               (uint)!bVar14 * *(int *)(local_840.ray + 0x3cc);
                          *(uint *)(local_840.ray + 0x3d0) =
                               (uint)bVar15 * iVar72 |
                               (uint)!bVar15 * *(int *)(local_840.ray + 0x3d0);
                          *(uint *)(local_840.ray + 0x3d4) =
                               (uint)bVar16 * iVar73 |
                               (uint)!bVar16 * *(int *)(local_840.ray + 0x3d4);
                          *(uint *)(local_840.ray + 0x3d8) =
                               (uint)bVar17 * iVar74 |
                               (uint)!bVar17 * *(int *)(local_840.ray + 0x3d8);
                          *(uint *)(local_840.ray + 0x3dc) =
                               (uint)bVar18 * iVar75 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x3dc);
                          *(uint *)(local_840.ray + 0x3e0) =
                               (uint)(bVar86 & 1) * iVar76 |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_840.ray + 0x3e0);
                          *(uint *)(local_840.ray + 0x3e4) =
                               (uint)bVar19 * iVar77 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x3e4);
                          *(uint *)(local_840.ray + 1000) =
                               (uint)bVar20 * iVar78 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 1000);
                          *(uint *)(local_840.ray + 0x3ec) =
                               (uint)bVar21 * iVar79 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x3ec);
                          *(uint *)(local_840.ray + 0x3f0) =
                               (uint)bVar22 * iVar80 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x3f0);
                          *(uint *)(local_840.ray + 0x3f4) =
                               (uint)bVar23 * iVar81 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x3f4);
                          *(uint *)(local_840.ray + 0x3f8) =
                               (uint)bVar24 * iVar82 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x3f8);
                          *(uint *)(local_840.ray + 0x3fc) =
                               (uint)bVar25 * iVar83 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x3fc);
                          iVar1 = *(int *)(local_840.hit + 0x104);
                          iVar2 = *(int *)(local_840.hit + 0x108);
                          iVar71 = *(int *)(local_840.hit + 0x10c);
                          iVar72 = *(int *)(local_840.hit + 0x110);
                          iVar73 = *(int *)(local_840.hit + 0x114);
                          iVar74 = *(int *)(local_840.hit + 0x118);
                          iVar75 = *(int *)(local_840.hit + 0x11c);
                          iVar76 = *(int *)(local_840.hit + 0x120);
                          iVar77 = *(int *)(local_840.hit + 0x124);
                          iVar78 = *(int *)(local_840.hit + 0x128);
                          iVar79 = *(int *)(local_840.hit + 300);
                          iVar80 = *(int *)(local_840.hit + 0x130);
                          iVar81 = *(int *)(local_840.hit + 0x134);
                          iVar82 = *(int *)(local_840.hit + 0x138);
                          iVar83 = *(int *)(local_840.hit + 0x13c);
                          bVar12 = (bool)((byte)(uVar91 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar91 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar91 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar91 >> 6) & 1);
                          bVar18 = (bool)((byte)(uVar91 >> 7) & 1);
                          bVar19 = (bool)((byte)(uVar91 >> 9) & 1);
                          bVar20 = (bool)((byte)(uVar91 >> 10) & 1);
                          bVar21 = (bool)((byte)(uVar91 >> 0xb) & 1);
                          bVar22 = (bool)((byte)(uVar91 >> 0xc) & 1);
                          bVar23 = (bool)((byte)(uVar91 >> 0xd) & 1);
                          bVar24 = (bool)((byte)(uVar91 >> 0xe) & 1);
                          bVar25 = SUB81(uVar91 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x400) =
                               (uint)(bVar97 & 1) * *(int *)(local_840.hit + 0x100) |
                               (uint)!(bool)(bVar97 & 1) * *(int *)(local_840.ray + 0x400);
                          *(uint *)(local_840.ray + 0x404) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_840.ray + 0x404);
                          *(uint *)(local_840.ray + 0x408) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_840.ray + 0x408);
                          *(uint *)(local_840.ray + 0x40c) =
                               (uint)bVar14 * iVar71 |
                               (uint)!bVar14 * *(int *)(local_840.ray + 0x40c);
                          *(uint *)(local_840.ray + 0x410) =
                               (uint)bVar15 * iVar72 |
                               (uint)!bVar15 * *(int *)(local_840.ray + 0x410);
                          *(uint *)(local_840.ray + 0x414) =
                               (uint)bVar16 * iVar73 |
                               (uint)!bVar16 * *(int *)(local_840.ray + 0x414);
                          *(uint *)(local_840.ray + 0x418) =
                               (uint)bVar17 * iVar74 |
                               (uint)!bVar17 * *(int *)(local_840.ray + 0x418);
                          *(uint *)(local_840.ray + 0x41c) =
                               (uint)bVar18 * iVar75 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x41c);
                          *(uint *)(local_840.ray + 0x420) =
                               (uint)(bVar86 & 1) * iVar76 |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_840.ray + 0x420);
                          *(uint *)(local_840.ray + 0x424) =
                               (uint)bVar19 * iVar77 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x424);
                          *(uint *)(local_840.ray + 0x428) =
                               (uint)bVar20 * iVar78 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x428);
                          *(uint *)(local_840.ray + 0x42c) =
                               (uint)bVar21 * iVar79 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x42c);
                          *(uint *)(local_840.ray + 0x430) =
                               (uint)bVar22 * iVar80 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x430);
                          *(uint *)(local_840.ray + 0x434) =
                               (uint)bVar23 * iVar81 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x434);
                          *(uint *)(local_840.ray + 0x438) =
                               (uint)bVar24 * iVar82 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x438);
                          *(uint *)(local_840.ray + 0x43c) =
                               (uint)bVar25 * iVar83 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x43c);
                          auVar174 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x140)
                                                      );
                          auVar174 = vmovdqu32_avx512f(auVar174);
                          *(undefined1 (*) [64])(local_840.ray + 0x440) = auVar174;
                          auVar174 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x180)
                                                      );
                          auVar174 = vmovdqu32_avx512f(auVar174);
                          *(undefined1 (*) [64])(local_840.ray + 0x480) = auVar174;
                          auVar174 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x1c0)
                                                      );
                          auVar174 = vmovdqa32_avx512f(auVar174);
                          *(undefined1 (*) [64])(local_840.ray + 0x4c0) = auVar174;
                          auVar174 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x200)
                                                      );
                          auVar174 = vmovdqa32_avx512f(auVar174);
                          *(undefined1 (*) [64])(local_840.ray + 0x500) = auVar174;
                          local_810._0_4_ = *(undefined4 *)(ray + k * 4 + 0x200);
                          local_810._4_4_ = 0;
                          local_810._8_4_ = 0;
                          local_810._12_4_ = 0;
                        }
                        auVar217 = ZEXT1664(auVar101);
                        bVar97 = ~(byte)(1 << ((uint)uVar88 & 0x1f)) & (byte)uVar98;
                        auVar170._4_4_ = local_810._0_4_;
                        auVar170._0_4_ = local_810._0_4_;
                        auVar170._8_4_ = local_810._0_4_;
                        auVar170._12_4_ = local_810._0_4_;
                        auVar170._16_4_ = local_810._0_4_;
                        auVar170._20_4_ = local_810._0_4_;
                        auVar170._24_4_ = local_810._0_4_;
                        auVar170._28_4_ = local_810._0_4_;
                        uVar181 = vcmpps_avx512vl(auVar220._0_32_,auVar170,2);
                        if ((bVar97 & (byte)uVar181) == 0) goto LAB_019bbff5;
                        bVar97 = bVar97 & (byte)uVar181;
                        uVar98 = (ulong)bVar97;
                        auVar171._8_4_ = 0x7f800000;
                        auVar171._0_8_ = 0x7f8000007f800000;
                        auVar171._12_4_ = 0x7f800000;
                        auVar171._16_4_ = 0x7f800000;
                        auVar171._20_4_ = 0x7f800000;
                        auVar171._24_4_ = 0x7f800000;
                        auVar171._28_4_ = 0x7f800000;
                        auVar118 = vblendmps_avx512vl(auVar171,auVar220._0_32_);
                        auVar150._0_4_ =
                             (uint)(bVar97 & 1) * auVar118._0_4_ |
                             (uint)!(bool)(bVar97 & 1) * 0x7f800000;
                        bVar12 = (bool)(bVar97 >> 1 & 1);
                        auVar150._4_4_ = (uint)bVar12 * auVar118._4_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar97 >> 2 & 1);
                        auVar150._8_4_ = (uint)bVar12 * auVar118._8_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar97 >> 3 & 1);
                        auVar150._12_4_ =
                             (uint)bVar12 * auVar118._12_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar97 >> 4 & 1);
                        auVar150._16_4_ =
                             (uint)bVar12 * auVar118._16_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar97 >> 5 & 1);
                        auVar150._20_4_ =
                             (uint)bVar12 * auVar118._20_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar97 >> 6 & 1);
                        auVar150._24_4_ =
                             (uint)bVar12 * auVar118._24_4_ | (uint)!bVar12 * 0x7f800000;
                        auVar150._28_4_ =
                             (uint)(bVar97 >> 7) * auVar118._28_4_ |
                             (uint)!(bool)(bVar97 >> 7) * 0x7f800000;
                        auVar118 = vshufps_avx(auVar150,auVar150,0xb1);
                        auVar118 = vminps_avx(auVar150,auVar118);
                        auVar116 = vshufpd_avx(auVar118,auVar118,5);
                        auVar118 = vminps_avx(auVar118,auVar116);
                        auVar116 = vpermpd_avx2(auVar118,0x4e);
                        auVar118 = vminps_avx(auVar118,auVar116);
                        uVar181 = vcmpps_avx512vl(auVar150,auVar118,0);
                        bVar86 = (byte)uVar181 & bVar97;
                        if (bVar86 != 0) {
                          bVar97 = bVar86;
                        }
                        uVar89 = 0;
                        for (uVar90 = (uint)bVar97; (uVar90 & 1) == 0;
                            uVar90 = uVar90 >> 1 | 0x80000000) {
                          uVar89 = uVar89 + 1;
                        }
                        uVar88 = (ulong)uVar89;
                      } while( true );
                    }
                    fVar183 = local_520[uVar88];
                    uVar161 = *(undefined4 *)(local_500 + uVar88 * 4);
                    fVar179 = 1.0 - fVar183;
                    fVar178 = fVar179 * fVar179 * -3.0;
                    auVar209 = ZEXT464((uint)fVar178);
                    auVar109 = vfmadd231ss_fma(ZEXT416((uint)(fVar179 * fVar179)),
                                               ZEXT416((uint)(fVar183 * fVar179)),
                                               ZEXT416(0xc0000000));
                    auVar104 = vfmsub132ss_fma(ZEXT416((uint)(fVar183 * fVar179)),
                                               ZEXT416((uint)(fVar183 * fVar183)),
                                               ZEXT416(0x40000000));
                    fVar179 = auVar109._0_4_ * 3.0;
                    fVar180 = auVar104._0_4_ * 3.0;
                    fVar192 = fVar183 * fVar183 * 3.0;
                    auVar211._0_4_ = fVar192 * fVar160;
                    auVar211._4_4_ = fVar192 * fVar175;
                    auVar211._8_4_ = fVar192 * fVar176;
                    auVar211._12_4_ = fVar192 * fVar177;
                    auVar215 = ZEXT1664(auVar211);
                    auVar188._4_4_ = fVar180;
                    auVar188._0_4_ = fVar180;
                    auVar188._8_4_ = fVar180;
                    auVar188._12_4_ = fVar180;
                    auVar109 = vfmadd132ps_fma(auVar188,auVar211,auVar6);
                    auVar197._4_4_ = fVar179;
                    auVar197._0_4_ = fVar179;
                    auVar197._8_4_ = fVar179;
                    auVar197._12_4_ = fVar179;
                    auVar109 = vfmadd132ps_fma(auVar197,auVar109,auVar26);
                    auVar189._4_4_ = fVar178;
                    auVar189._0_4_ = fVar178;
                    auVar189._8_4_ = fVar178;
                    auVar189._12_4_ = fVar178;
                    auVar109 = vfmadd213ps_fma(auVar189,auVar101,auVar109);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar88 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar109._0_4_;
                    uVar10 = vextractps_avx(auVar109,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar10;
                    uVar10 = vextractps_avx(auVar109,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar10;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar183;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar161;
                    *(undefined4 *)(ray + k * 4 + 0x440) = uVar3;
                    *(uint *)(ray + k * 4 + 0x480) = uVar8;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_019bbc1f;
      }
    }
    uVar3 = *(undefined4 *)(ray + k * 4 + 0x200);
    auVar32._4_4_ = uVar3;
    auVar32._0_4_ = uVar3;
    auVar32._8_4_ = uVar3;
    auVar32._12_4_ = uVar3;
    auVar32._16_4_ = uVar3;
    auVar32._20_4_ = uVar3;
    auVar32._24_4_ = uVar3;
    auVar32._28_4_ = uVar3;
    uVar181 = vcmpps_avx512vl(local_3a0,auVar32,2);
    uVar94 = (ulong)((uint)uVar94 & (uint)uVar181);
  } while( true );
LAB_019bbff5:
  auVar118 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar230 = ZEXT3264(auVar118);
  auVar118 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar231 = ZEXT3264(auVar118);
  auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar232 = ZEXT1664(auVar109);
  auVar118 = vmovdqa64_avx512vl(local_460);
  auVar174 = ZEXT3264(auVar118);
  lVar92 = local_7e8;
LAB_019bbc1f:
  lVar96 = lVar96 + 8;
  goto LAB_019bb322;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }